

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx::forward_inplace(Mish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [24];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [24];
  undefined1 (*pauVar173) [32];
  undefined1 (*pauVar174) [16];
  long in_RSI;
  float fVar175;
  float fVar177;
  double dVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z_1;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_7;
  __m256 tmp_7;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 z_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_6;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 z_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_8;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  imm_xmm_union u_21;
  imm_xmm_union u_20;
  __m256i ret_8;
  __m128i x2_8;
  __m128i x1_8;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_24;
  imm_xmm_union u_23;
  imm_xmm_union u_22;
  __m256i ret_9;
  __m128i y2_4;
  __m128i y1_4;
  __m128i x2_9;
  __m128i x1_9;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_12;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_27;
  imm_xmm_union u_26;
  imm_xmm_union u_25;
  __m256i ret_10;
  __m128i y2_5;
  __m128i y1_5;
  __m128i x2_10;
  __m128i x1_10;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  __m256i ret_5;
  __m128i x2_5;
  __m128i x1_5;
  imm_xmm_union u_29;
  imm_xmm_union u_28;
  __m256i ret_11;
  __m128i x2_11;
  __m128i x1_11;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_4;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_10;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf z_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_9;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf z_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_11;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf z_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  undefined8 in_stack_ffffffffffff9128;
  undefined1 in_stack_ffffffffffff9130 [16];
  ulong uStack_6e78;
  ulong uStack_6db8;
  undefined8 local_6d70;
  undefined8 uStack_6d68;
  undefined8 local_6d60;
  undefined8 uStack_6d58;
  undefined8 uStack_6d50;
  undefined8 uStack_6d48;
  int local_6d2c;
  Mat local_6d28;
  undefined1 (*local_6ce0) [32];
  int local_6cd4;
  undefined8 local_6cd0;
  undefined8 uStack_6cc8;
  int local_6cbc;
  Mat local_6cb8;
  undefined1 (*local_6c70) [16];
  int local_6c64;
  undefined8 local_6c60;
  undefined8 uStack_6c58;
  undefined8 uStack_6c50;
  undefined8 uStack_6c48;
  int local_6c28;
  Mat local_6c18;
  undefined1 (*local_6bd0) [32];
  int local_6bc8;
  int local_6bc4;
  int local_6bc0;
  int local_6bbc;
  int local_6bb8;
  int local_6bb4;
  undefined1 (*local_6b90) [32];
  undefined1 (*local_6b88) [32];
  undefined8 local_6b80;
  undefined8 uStack_6b78;
  undefined8 uStack_6b70;
  undefined8 uStack_6b68;
  undefined8 local_6b60;
  undefined8 uStack_6b58;
  undefined8 uStack_6b50;
  undefined8 uStack_6b48;
  undefined8 local_6b40;
  undefined8 uStack_6b38;
  undefined8 uStack_6b30;
  undefined8 uStack_6b28;
  undefined1 (*local_6b08) [32];
  undefined8 local_6b00;
  undefined8 uStack_6af8;
  undefined8 uStack_6af0;
  undefined8 uStack_6ae8;
  undefined1 (*local_6ad8) [32];
  undefined1 (*local_6ad0) [32];
  undefined1 (*local_6ac8) [16];
  undefined8 local_6ac0;
  undefined8 uStack_6ab8;
  undefined8 local_6ab0;
  undefined8 uStack_6aa8;
  undefined8 local_6aa0;
  undefined8 uStack_6a98;
  undefined1 (*local_6a88) [32];
  undefined8 local_6a80;
  undefined8 uStack_6a78;
  undefined1 (*local_6a68) [16];
  undefined1 local_6a60 [8];
  float fStack_6a58;
  float fStack_6a54;
  float fStack_6a50;
  float fStack_6a4c;
  float fStack_6a48;
  undefined8 local_6a40;
  undefined8 uStack_6a38;
  undefined8 uStack_6a30;
  undefined8 uStack_6a28;
  undefined1 local_6a20 [8];
  float fStack_6a18;
  float fStack_6a14;
  float fStack_6a10;
  float fStack_6a0c;
  float fStack_6a08;
  undefined8 local_6a00;
  undefined8 uStack_69f8;
  undefined8 uStack_69f0;
  undefined8 uStack_69e8;
  undefined8 local_69e0;
  undefined8 uStack_69d8;
  undefined8 uStack_69d0;
  undefined8 uStack_69c8;
  undefined8 local_69c0;
  undefined8 uStack_69b8;
  undefined8 uStack_69b0;
  undefined8 uStack_69a8;
  undefined8 local_69a0;
  undefined8 uStack_6998;
  undefined8 uStack_6990;
  undefined8 uStack_6988;
  undefined8 local_6980;
  undefined8 uStack_6978;
  undefined8 uStack_6970;
  undefined8 uStack_6968;
  undefined1 local_6960 [8];
  float fStack_6958;
  float fStack_6954;
  float fStack_6950;
  float fStack_694c;
  float fStack_6948;
  undefined8 local_6940;
  undefined8 uStack_6938;
  undefined8 uStack_6930;
  undefined8 uStack_6928;
  undefined8 local_6920;
  undefined8 uStack_6918;
  undefined8 uStack_6910;
  undefined8 uStack_6908;
  undefined8 local_6900;
  undefined8 uStack_68f8;
  undefined8 uStack_68f0;
  undefined8 uStack_68e8;
  undefined8 local_68e0;
  undefined8 uStack_68d8;
  undefined8 uStack_68d0;
  undefined8 uStack_68c8;
  undefined8 local_68c0;
  undefined8 uStack_68b8;
  undefined8 uStack_68b0;
  undefined8 uStack_68a8;
  undefined8 local_68a0;
  undefined8 uStack_6898;
  undefined8 uStack_6890;
  undefined8 uStack_6888;
  undefined1 local_6880 [8];
  float fStack_6878;
  float fStack_6874;
  float fStack_6870;
  float fStack_686c;
  float fStack_6868;
  undefined8 local_6860;
  undefined8 uStack_6858;
  undefined8 uStack_6850;
  undefined8 uStack_6848;
  undefined8 local_6840;
  undefined8 uStack_6838;
  undefined8 uStack_6830;
  undefined8 uStack_6828;
  undefined1 local_6820 [8];
  undefined8 uStack_6818;
  undefined8 uStack_6810;
  undefined8 uStack_6808;
  float local_6800;
  float fStack_67fc;
  float fStack_67f8;
  float fStack_67f4;
  float fStack_67f0;
  float fStack_67ec;
  float fStack_67e8;
  float fStack_67e4;
  undefined1 local_67e0 [8];
  undefined8 uStack_67d8;
  undefined8 uStack_67d0;
  undefined8 uStack_67c8;
  undefined1 local_67c0 [32];
  undefined1 local_67a0 [8];
  undefined8 uStack_6798;
  undefined8 uStack_6790;
  undefined8 uStack_6788;
  undefined1 local_6780 [32];
  undefined8 local_6760;
  undefined8 uStack_6758;
  undefined8 uStack_6750;
  undefined8 uStack_6748;
  undefined8 local_6740;
  undefined8 uStack_6738;
  undefined8 uStack_6730;
  undefined8 uStack_6728;
  undefined1 local_6720 [8];
  undefined8 uStack_6718;
  undefined8 uStack_6710;
  undefined8 uStack_6708;
  undefined8 local_6700;
  undefined8 uStack_66f8;
  undefined8 uStack_66f0;
  undefined8 uStack_66e8;
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 uStack_66d0;
  undefined8 uStack_66c8;
  undefined8 local_66c0;
  undefined8 uStack_66b8;
  undefined8 uStack_66b0;
  undefined8 uStack_66a8;
  undefined8 local_66a0;
  undefined8 uStack_6698;
  undefined8 uStack_6690;
  undefined8 uStack_6688;
  undefined8 local_6680;
  undefined8 uStack_6678;
  undefined8 uStack_6670;
  undefined8 uStack_6668;
  undefined8 local_6660;
  undefined8 uStack_6658;
  undefined8 uStack_6650;
  undefined8 uStack_6648;
  undefined8 local_6640;
  undefined8 uStack_6638;
  undefined8 uStack_6630;
  undefined8 uStack_6628;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  undefined8 local_6600;
  undefined8 uStack_65f8;
  undefined8 uStack_65f0;
  undefined8 uStack_65e8;
  undefined8 local_65e0;
  undefined8 uStack_65d8;
  undefined8 uStack_65d0;
  undefined8 uStack_65c8;
  undefined8 local_65c0;
  undefined8 uStack_65b8;
  undefined8 uStack_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  undefined8 local_6580;
  undefined8 uStack_6578;
  undefined8 uStack_6570;
  undefined8 uStack_6568;
  undefined8 local_6560;
  undefined8 uStack_6558;
  undefined8 uStack_6550;
  undefined8 uStack_6548;
  undefined8 local_6540;
  undefined8 uStack_6538;
  undefined8 uStack_6530;
  undefined8 uStack_6528;
  undefined8 local_6520;
  undefined8 uStack_6518;
  undefined8 uStack_6510;
  undefined8 uStack_6508;
  undefined8 local_6500;
  undefined8 uStack_64f8;
  undefined8 uStack_64f0;
  undefined8 uStack_64e8;
  undefined8 local_64e0;
  undefined8 uStack_64d8;
  undefined8 uStack_64d0;
  undefined8 uStack_64c8;
  undefined8 local_64c0;
  undefined8 uStack_64b8;
  undefined8 uStack_64b0;
  undefined8 uStack_64a8;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  undefined8 local_6480;
  undefined8 uStack_6478;
  undefined8 uStack_6470;
  undefined8 uStack_6468;
  undefined8 local_6460;
  undefined8 uStack_6458;
  undefined8 uStack_6450;
  undefined8 uStack_6448;
  undefined8 local_6440;
  undefined8 uStack_6438;
  undefined8 uStack_6430;
  undefined8 uStack_6428;
  undefined8 local_6420;
  undefined8 uStack_6418;
  undefined8 uStack_6410;
  undefined8 uStack_6408;
  undefined8 local_6400;
  undefined8 uStack_63f8;
  undefined8 uStack_63f0;
  undefined8 uStack_63e8;
  undefined8 local_63e0;
  undefined8 uStack_63d8;
  undefined8 uStack_63d0;
  undefined8 uStack_63c8;
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined1 local_6380 [8];
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  float local_6360;
  float fStack_635c;
  float fStack_6358;
  float fStack_6354;
  float fStack_6350;
  float fStack_634c;
  float fStack_6348;
  float fStack_6344;
  undefined1 local_6340 [8];
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined1 local_6320 [32];
  undefined1 local_6300 [8];
  undefined8 uStack_62f8;
  undefined8 uStack_62f0;
  undefined8 uStack_62e8;
  undefined1 local_62e0 [32];
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined8 uStack_62b0;
  undefined8 uStack_62a8;
  undefined8 local_62a0;
  undefined8 uStack_6298;
  undefined8 uStack_6290;
  undefined8 uStack_6288;
  undefined1 local_6280 [8];
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined8 local_6260;
  undefined8 uStack_6258;
  undefined8 uStack_6250;
  undefined8 uStack_6248;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined8 local_60e0;
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  undefined8 local_60c0;
  undefined8 uStack_60b8;
  undefined8 uStack_60b0;
  undefined8 uStack_60a8;
  undefined8 local_60a0;
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined8 local_6080;
  undefined8 uStack_6078;
  undefined8 uStack_6070;
  undefined8 uStack_6068;
  undefined8 local_6060;
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined8 local_6040;
  undefined8 uStack_6038;
  undefined8 uStack_6030;
  undefined8 uStack_6028;
  undefined8 local_6020;
  undefined8 uStack_6018;
  undefined8 uStack_6010;
  undefined8 uStack_6008;
  undefined8 local_6000;
  undefined8 uStack_5ff8;
  undefined8 uStack_5ff0;
  undefined8 uStack_5fe8;
  undefined8 local_5fe0;
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined8 local_5fc0;
  undefined8 uStack_5fb8;
  undefined8 uStack_5fb0;
  undefined8 uStack_5fa8;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined8 local_5f80;
  undefined8 uStack_5f78;
  undefined8 uStack_5f70;
  undefined8 uStack_5f68;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined8 local_5f40;
  undefined8 uStack_5f38;
  undefined8 uStack_5f30;
  undefined8 uStack_5f28;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined8 local_5c40;
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  undefined8 local_5c20;
  undefined8 uStack_5c18;
  undefined8 uStack_5c10;
  undefined8 uStack_5c08;
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined8 local_5b40;
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined8 local_5b20;
  undefined8 uStack_5b18;
  undefined8 uStack_5b10;
  undefined8 uStack_5b08;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  float local_57a0;
  float fStack_579c;
  float fStack_5798;
  float fStack_5794;
  float fStack_5790;
  float fStack_578c;
  float fStack_5788;
  float fStack_5784;
  undefined1 local_5780 [32];
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined1 local_5720 [8];
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined1 local_5700 [8];
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined1 local_56e0 [32];
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined8 local_56a0;
  undefined8 uStack_5698;
  undefined8 uStack_5690;
  undefined8 uStack_5688;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined8 local_5660;
  undefined8 uStack_5658;
  undefined8 uStack_5650;
  undefined8 uStack_5648;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined8 local_5620;
  undefined8 uStack_5618;
  undefined8 uStack_5610;
  undefined8 uStack_5608;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined8 local_55e0;
  undefined8 uStack_55d8;
  undefined8 uStack_55d0;
  undefined8 uStack_55c8;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined8 local_55a0;
  undefined8 uStack_5598;
  undefined8 uStack_5590;
  undefined8 uStack_5588;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined8 local_5560;
  undefined8 uStack_5558;
  undefined8 uStack_5550;
  undefined8 uStack_5548;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined8 local_5520;
  undefined8 uStack_5518;
  undefined8 uStack_5510;
  undefined8 uStack_5508;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined8 local_53a0;
  undefined8 uStack_5398;
  undefined8 uStack_5390;
  undefined8 uStack_5388;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined8 local_5360;
  undefined8 uStack_5358;
  undefined8 uStack_5350;
  undefined8 uStack_5348;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined8 local_5320;
  undefined8 uStack_5318;
  undefined8 uStack_5310;
  undefined8 uStack_5308;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined8 local_52e0;
  undefined8 uStack_52d8;
  undefined8 uStack_52d0;
  undefined8 uStack_52c8;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined8 local_52a0;
  undefined8 uStack_5298;
  undefined8 uStack_5290;
  undefined8 uStack_5288;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined8 local_5260;
  undefined8 uStack_5258;
  undefined8 uStack_5250;
  undefined8 uStack_5248;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined8 local_5220;
  undefined8 uStack_5218;
  undefined8 uStack_5210;
  undefined8 uStack_5208;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined8 local_51e0;
  undefined8 uStack_51d8;
  undefined8 uStack_51d0;
  undefined8 uStack_51c8;
  float local_51c0;
  float fStack_51bc;
  float fStack_51b8;
  float fStack_51b4;
  float fStack_51b0;
  float fStack_51ac;
  float fStack_51a8;
  float fStack_51a4;
  undefined1 local_51a0 [32];
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined1 local_5140 [8];
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined1 local_5120 [8];
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined1 local_5100 [32];
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined4 local_4c18;
  undefined4 local_4c14;
  undefined4 local_4c10;
  undefined4 local_4c0c;
  undefined4 local_4c08;
  undefined4 local_4c04;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined1 local_4a40 [32];
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined1 local_4980 [32];
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined1 local_48e0 [32];
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  float local_48a0;
  float fStack_489c;
  float fStack_4898;
  float fStack_4894;
  float fStack_4890;
  float fStack_488c;
  float fStack_4888;
  undefined4 uStack_4884;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  float local_4860;
  float fStack_485c;
  float fStack_4858;
  float fStack_4854;
  float fStack_4850;
  float fStack_484c;
  float fStack_4848;
  undefined4 uStack_4844;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined1 local_4820 [8];
  float fStack_4818;
  float fStack_4814;
  float fStack_4810;
  float fStack_480c;
  float fStack_4808;
  float fStack_4804;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  float local_47e0;
  float fStack_47dc;
  float fStack_47d8;
  float fStack_47d4;
  float fStack_47d0;
  float fStack_47cc;
  float fStack_47c8;
  float fStack_47c4;
  float local_47c0;
  float fStack_47bc;
  float fStack_47b8;
  float fStack_47b4;
  float fStack_47b0;
  float fStack_47ac;
  float fStack_47a8;
  float fStack_47a4;
  undefined1 local_47a0 [32];
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined1 local_4740 [8];
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined1 local_4720 [8];
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined1 local_4700 [32];
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined1 local_46c0 [32];
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined4 local_4204;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  ulong uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  float local_40e0;
  float fStack_40dc;
  float fStack_40d8;
  float fStack_40d4;
  float fStack_40d0;
  float fStack_40cc;
  float fStack_40c8;
  undefined4 uStack_40c4;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  float local_4040;
  float fStack_403c;
  float fStack_4038;
  float fStack_4034;
  float fStack_4030;
  float fStack_402c;
  float fStack_4028;
  float fStack_4024;
  undefined1 local_4020 [32];
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined1 local_3fc0 [8];
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined1 local_3fa0 [8];
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined1 local_3f80 [32];
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined4 local_3a84;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  ulong uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  float local_3980;
  float fStack_397c;
  float fStack_3978;
  float fStack_3974;
  float fStack_3970;
  float fStack_396c;
  float fStack_3968;
  float fStack_3964;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  float local_3940;
  float fStack_393c;
  float fStack_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  float fStack_3928;
  float fStack_3924;
  undefined1 local_3920 [32];
  undefined8 local_3900;
  ulong uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  ulong uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  ulong uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  ulong uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined1 local_3880 [32];
  undefined1 local_3860 [32];
  undefined8 local_3840;
  ulong uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  ulong uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined1 local_3610 [16];
  undefined1 local_3600 [16];
  undefined4 local_35e4;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined1 local_3550 [16];
  undefined1 local_3540 [16];
  undefined4 local_3524;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 local_30b0;
  undefined8 uStack_30a8;
  undefined1 local_30a0 [16];
  undefined1 local_3090 [16];
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 local_2fb0;
  undefined8 uStack_2fa8;
  undefined1 local_2fa0 [16];
  undefined1 local_2f90 [16];
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined4 local_2ef4;
  undefined8 local_2ef0;
  undefined8 uStack_2ee8;
  undefined4 local_2ed4;
  undefined8 local_2ed0;
  undefined8 uStack_2ec8;
  undefined4 local_2eb4;
  undefined8 local_2eb0;
  undefined8 uStack_2ea8;
  undefined4 local_2e94;
  undefined8 local_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 local_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 local_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 local_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 local_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 local_2bf0;
  undefined8 uStack_2be8;
  undefined1 local_2be0 [16];
  undefined1 local_2bd0 [16];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 local_2af0;
  undefined8 uStack_2ae8;
  undefined1 local_2ae0 [16];
  undefined1 local_2ad0 [16];
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 local_29f0;
  undefined8 uStack_29e8;
  undefined1 local_29e0 [16];
  undefined1 local_29d0 [16];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 local_28f0;
  undefined8 uStack_28e8;
  undefined1 local_28e0 [16];
  undefined1 local_28d0 [16];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined4 local_27e4;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined4 local_2724;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined1 local_2690 [16];
  undefined1 local_2680 [16];
  undefined4 local_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined4 local_25a4;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 local_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 local_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 local_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 local_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 local_2410;
  undefined8 uStack_2408;
  undefined4 local_23f4;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  undefined4 local_23d4;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  undefined4 local_23b4;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined4 local_2394;
  undefined8 local_2390;
  undefined8 uStack_2388;
  undefined4 local_2374;
  undefined8 local_2370;
  undefined8 uStack_2368;
  undefined4 local_2354;
  undefined8 local_2350;
  undefined8 uStack_2348;
  undefined4 local_2334;
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined4 local_2314;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [16];
  undefined1 auStack_22f0 [16];
  undefined4 local_22e0;
  undefined4 local_22dc;
  undefined4 local_22d8;
  undefined4 local_22d4;
  undefined4 local_22d0;
  undefined4 local_22cc;
  undefined4 local_22c8;
  undefined4 local_22c4;
  undefined1 local_22c0 [16];
  undefined1 auStack_22b0 [16];
  undefined4 local_22a0;
  undefined4 local_229c;
  undefined4 local_2298;
  undefined4 local_2294;
  undefined4 local_2290;
  undefined4 local_228c;
  undefined4 local_2288;
  undefined4 local_2284;
  undefined1 local_2280 [16];
  undefined1 auStack_2270 [16];
  undefined4 local_2260;
  undefined4 local_225c;
  undefined4 local_2258;
  undefined4 local_2254;
  undefined4 local_2250;
  undefined4 local_224c;
  undefined4 local_2248;
  undefined4 local_2244;
  undefined1 local_2240 [16];
  undefined1 auStack_2230 [16];
  undefined4 local_2220;
  undefined4 local_221c;
  undefined4 local_2218;
  undefined4 local_2214;
  undefined4 local_2210;
  undefined4 local_220c;
  undefined4 local_2208;
  undefined4 local_2204;
  undefined1 local_2200 [16];
  undefined1 auStack_21f0 [16];
  undefined4 local_21e0;
  undefined4 local_21dc;
  undefined4 local_21d8;
  undefined4 local_21d4;
  undefined4 local_21d0;
  undefined4 local_21cc;
  undefined4 local_21c8;
  undefined4 local_21c4;
  undefined1 local_21c0 [16];
  undefined1 auStack_21b0 [16];
  undefined4 local_21a0;
  undefined4 local_219c;
  undefined4 local_2198;
  undefined4 local_2194;
  undefined4 local_2190;
  undefined4 local_218c;
  undefined4 local_2188;
  undefined4 local_2184;
  undefined1 local_2180 [16];
  undefined1 auStack_2170 [16];
  undefined4 local_2160;
  undefined4 local_215c;
  undefined4 local_2158;
  undefined4 local_2154;
  undefined4 local_2150;
  undefined4 local_214c;
  undefined4 local_2148;
  undefined4 local_2144;
  undefined1 local_2140 [16];
  undefined1 auStack_2130 [16];
  undefined4 local_2110;
  undefined4 local_210c;
  undefined4 local_2108;
  undefined4 local_2104;
  undefined4 local_2100;
  undefined4 local_20fc;
  undefined4 local_20f8;
  undefined4 local_20f4;
  undefined1 local_20f0 [8];
  float fStack_20e8;
  float fStack_20e4;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined1 local_20d0 [8];
  float fStack_20c8;
  float fStack_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined1 local_2070 [8];
  float fStack_2068;
  float fStack_2064;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 local_2010;
  undefined8 uStack_2008;
  undefined1 local_2000 [8];
  float fStack_1ff8;
  float fStack_1ff4;
  undefined8 local_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined1 local_1fd0 [8];
  undefined8 uStack_1fc8;
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined1 local_1fa0 [16];
  undefined1 local_1f90 [8];
  undefined8 uStack_1f88;
  undefined1 local_1f80 [16];
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined1 local_1f60 [16];
  undefined1 local_1f50 [8];
  undefined8 uStack_1f48;
  undefined4 local_1f34;
  undefined8 local_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 local_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 local_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 local_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 local_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 local_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 local_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 local_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 local_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 local_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 local_1d50;
  undefined8 uStack_1d48;
  undefined1 local_1d40 [8];
  undefined8 uStack_1d38;
  float local_1d30;
  float fStack_1d2c;
  float fStack_1d28;
  float fStack_1d24;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined1 local_1d10 [16];
  undefined1 local_1d00 [8];
  undefined8 uStack_1cf8;
  undefined1 local_1cf0 [16];
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined1 local_1cd0 [16];
  undefined1 local_1cc0 [8];
  undefined8 uStack_1cb8;
  undefined4 local_1ca4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 local_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 local_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 local_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 local_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 local_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 local_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 local_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 local_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 local_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 local_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 local_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 local_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 local_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 local_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 local_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 local_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 local_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 local_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 local_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 local_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 local_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 local_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 local_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 local_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  float local_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 local_1700 [16];
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined1 local_16e0 [16];
  undefined1 local_16d0 [8];
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined1 local_16b0 [16];
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  undefined4 local_1674;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 local_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 local_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  undefined1 local_13d0 [16];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined1 local_13b0 [16];
  undefined1 local_13a0 [8];
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined1 local_1380 [16];
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined4 local_1344;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 local_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 local_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 local_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined4 local_10d0;
  undefined4 uStack_10cc;
  undefined4 uStack_10c8;
  undefined4 uStack_10c4;
  undefined4 local_10b4;
  undefined4 local_10b0;
  undefined4 uStack_10ac;
  undefined4 uStack_10a8;
  undefined4 uStack_10a4;
  undefined4 local_1094;
  undefined4 local_1090;
  undefined4 uStack_108c;
  undefined4 uStack_1088;
  undefined4 uStack_1084;
  undefined4 local_1074;
  undefined4 local_1070;
  undefined4 uStack_106c;
  undefined4 uStack_1068;
  undefined4 uStack_1064;
  undefined4 local_1054;
  undefined4 local_1050;
  undefined4 uStack_104c;
  undefined4 uStack_1048;
  undefined4 uStack_1044;
  undefined4 local_1034;
  undefined4 local_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined4 local_1014;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 local_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 local_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined1 local_f30 [16];
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined1 local_ed0 [16];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined1 local_e80 [16];
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined1 local_e60 [16];
  undefined8 local_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined1 local_e20 [16];
  undefined8 local_e10;
  undefined8 uStack_e08;
  float local_e00;
  float fStack_dfc;
  float fStack_df8;
  float fStack_df4;
  float local_df0;
  float fStack_dec;
  float fStack_de8;
  float fStack_de4;
  undefined1 local_de0 [16];
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined1 local_dc0 [16];
  undefined1 local_db0 [8];
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined1 local_d90 [16];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined4 local_d54;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined1 local_d30 [16];
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 local_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined4 local_ae0;
  undefined4 uStack_adc;
  undefined4 uStack_ad8;
  undefined4 uStack_ad4;
  undefined4 local_ac4;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  ulong uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined1 local_a10 [16];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  float local_9e0;
  float fStack_9dc;
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [16];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [8];
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined4 local_944;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined4 local_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6b4;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  ulong uStack_638;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [16];
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined8 local_5f0;
  ulong uStack_5e8;
  undefined1 local_5e0 [16];
  undefined8 local_5d0;
  ulong uStack_5c8;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined8 local_570;
  ulong uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  ulong uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_6bb4 = *(int *)(in_RSI + 0x2c);
  local_6bb8 = *(int *)(in_RSI + 0x30);
  local_6bbc = *(int *)(in_RSI + 0x38);
  local_6bc0 = local_6bb4 * local_6bb8;
  local_6bc4 = *(int *)(in_RSI + 0x18);
  if (local_6bc4 == 8) {
    local_6bc4 = 8;
    for (local_6bc8 = 0; local_6bc8 < local_6bbc; local_6bc8 = local_6bc8 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffff9130._0_8_,
                         (int)((ulong)in_stack_ffffffffffff9128 >> 0x20));
      pauVar173 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_6c18);
      ncnn::Mat::~Mat((Mat *)0x8f52cd);
      local_6bd0 = pauVar173;
      for (local_6c28 = 0; local_6c28 < local_6bc0; local_6c28 = local_6c28 + 1) {
        local_6b88 = local_6bd0;
        local_6b60 = *(undefined8 *)*local_6bd0;
        uStack_6b58 = *(undefined8 *)(*local_6bd0 + 8);
        uStack_6b50 = *(undefined8 *)(*local_6bd0 + 0x10);
        auVar167 = *(undefined1 (*) [24])*local_6bd0;
        uStack_6b48 = *(undefined8 *)(*local_6bd0 + 0x18);
        local_3860 = ZEXT832(0) << 0x20;
        local_6760 = 0x3f8000003f800000;
        uStack_6758 = 0x3f8000003f800000;
        uStack_6750 = 0x3f8000003f800000;
        uStack_6748 = 0x3f8000003f800000;
        local_56e0._0_8_ = auVar167._0_8_;
        local_2d20 = local_56e0._0_8_;
        local_56e0._8_8_ = auVar167._8_8_;
        uStack_2d18 = local_56e0._8_8_;
        local_56e0._16_8_ = auVar167._16_8_;
        uStack_2d10 = local_56e0._16_8_;
        local_2e00 = 0x42b0c0a542b0c0a5;
        uStack_2df8 = 0x42b0c0a542b0c0a5;
        uStack_2df0 = 0x42b0c0a542b0c0a5;
        uStack_2de8 = 0x42b0c0a542b0c0a5;
        auVar83._8_8_ = 0x42b0c0a542b0c0a5;
        auVar83._0_8_ = 0x42b0c0a542b0c0a5;
        auVar83._16_8_ = 0x42b0c0a542b0c0a5;
        auVar83._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(*local_6bd0,auVar83);
        local_56e0._0_8_ = auVar5._0_8_;
        local_3720 = local_56e0._0_8_;
        local_56e0._8_8_ = auVar5._8_8_;
        uStack_3718 = local_56e0._8_8_;
        local_56e0._16_8_ = auVar5._16_8_;
        uStack_3710 = local_56e0._16_8_;
        local_56e0._24_8_ = auVar5._24_8_;
        uStack_3708 = local_56e0._24_8_;
        local_3800 = 0xc2b0c0a5c2b0c0a5;
        uStack_37f8 = 0xc2b0c0a5c2b0c0a5;
        uStack_37f0 = 0xc2b0c0a5c2b0c0a5;
        uStack_37e8 = 0xc2b0c0a5c2b0c0a5;
        auVar59._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar59._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar59._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar59);
        local_56e0._0_8_ = auVar4._0_8_;
        uVar7 = local_56e0._0_8_;
        local_56e0._8_8_ = auVar4._8_8_;
        uVar8 = local_56e0._8_8_;
        local_56e0._16_8_ = auVar4._16_8_;
        uVar9 = local_56e0._16_8_;
        local_56e0._24_8_ = auVar4._24_8_;
        uVar10 = local_56e0._24_8_;
        local_5440 = 0x3fb8aa3b3fb8aa3b;
        uStack_5438 = 0x3fb8aa3b3fb8aa3b;
        uStack_5430 = 0x3fb8aa3b3fb8aa3b;
        uStack_5428 = 0x3fb8aa3b3fb8aa3b;
        local_5420._0_4_ = auVar4._0_4_;
        local_5420._4_4_ = auVar4._4_4_;
        uStack_5418._0_4_ = auVar4._8_4_;
        uStack_5418._4_4_ = auVar4._12_4_;
        uStack_5410._0_4_ = auVar4._16_4_;
        uStack_5410._4_4_ = auVar4._20_4_;
        uStack_5408._0_4_ = auVar4._24_4_;
        uStack_5408._4_4_ = auVar4._28_4_;
        local_5720._4_4_ = local_5420._4_4_ * 1.442695;
        local_5720._0_4_ = (float)local_5420 * 1.442695;
        uStack_5718._0_4_ = (float)uStack_5418 * 1.442695;
        uStack_5718._4_4_ = uStack_5418._4_4_ * 1.442695;
        uStack_5710._0_4_ = (float)uStack_5410 * 1.442695;
        uStack_5710._4_4_ = uStack_5410._4_4_ * 1.442695;
        auVar167 = _local_5720;
        uStack_5708._0_4_ = (float)uStack_5408 * 1.442695;
        uStack_5708._4_4_ = uStack_5408._4_4_;
        auVar5 = _local_5720;
        local_5220 = local_5720;
        uStack_5218 = uStack_5718;
        uStack_5710 = auVar167._16_8_;
        uStack_5210 = uStack_5710;
        uStack_5708 = auVar5._24_8_;
        uStack_5208 = uStack_5708;
        local_66c0 = 0x3f0000003f000000;
        uStack_66b8 = 0x3f0000003f000000;
        uStack_66b0 = 0x3f0000003f000000;
        uStack_66a8 = 0x3f0000003f000000;
        local_5720._4_4_ = local_5420._4_4_ * 1.442695 + 0.5;
        local_5720._0_4_ = (float)local_5420 * 1.442695 + 0.5;
        uStack_5718._0_4_ = (float)uStack_5418 * 1.442695 + 0.5;
        uStack_5718._4_4_ = uStack_5418._4_4_ * 1.442695 + 0.5;
        uStack_5710._0_4_ = (float)uStack_5410 * 1.442695 + 0.5;
        uStack_5710._4_4_ = uStack_5410._4_4_ * 1.442695 + 0.5;
        uStack_5708._0_4_ = (float)uStack_5408 * 1.442695 + 0.5;
        uStack_5708._4_4_ = uStack_5408._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_5720,1);
        auVar5 = vcmpps_avx(_local_5720,auVar6,1);
        local_5780._0_8_ = auVar5._0_8_;
        local_33e0 = local_5780._0_8_;
        local_5780._8_8_ = auVar5._8_8_;
        uStack_33d8 = local_5780._8_8_;
        local_5780._16_8_ = auVar5._16_8_;
        uStack_33d0 = local_5780._16_8_;
        local_5780._24_8_ = auVar5._24_8_;
        uStack_33c8 = local_5780._24_8_;
        local_3400 = 0x3f8000003f800000;
        uStack_33f8 = 0x3f8000003f800000;
        uStack_33f0 = 0x3f8000003f800000;
        uStack_33e8 = 0x3f8000003f800000;
        auVar67._8_8_ = 0x3f8000003f800000;
        auVar67._0_8_ = 0x3f8000003f800000;
        auVar67._16_8_ = 0x3f8000003f800000;
        auVar67._24_8_ = 0x3f8000003f800000;
        local_5780 = vandps_avx(auVar5,auVar67);
        local_5700 = auVar6._0_8_;
        local_4aa0 = local_5700;
        uStack_56f8 = auVar6._8_8_;
        uStack_4a98 = uStack_56f8;
        uStack_56f0 = auVar6._16_8_;
        uStack_4a90 = uStack_56f0;
        uStack_56e8 = auVar6._24_8_;
        uStack_4a88 = uStack_56e8;
        local_4ac0 = local_5780._0_8_;
        uStack_4ab8 = local_5780._8_8_;
        uStack_4ab0 = local_5780._16_8_;
        uStack_4aa8 = local_5780._24_8_;
        _local_5720 = vsubps_avx(auVar6,local_5780);
        local_6700 = 0x3f3180003f318000;
        uStack_66f8 = 0x3f3180003f318000;
        uStack_66f0 = 0x3f3180003f318000;
        uStack_66e8 = 0x3f3180003f318000;
        local_5460._0_4_ = local_5720._0_4_;
        local_5460._4_4_ = local_5720._4_4_;
        uStack_5458._0_4_ = local_5720._8_4_;
        uStack_5458._4_4_ = local_5720._12_4_;
        uStack_5450._0_4_ = local_5720._16_4_;
        uStack_5450._4_4_ = local_5720._20_4_;
        uStack_5448._0_4_ = local_5720._24_4_;
        uStack_5448._4_4_ = local_5720._28_4_;
        local_5700._4_4_ = local_5460._4_4_ * 0.6933594;
        local_5700._0_4_ = (float)local_5460 * 0.6933594;
        uStack_56f8._0_4_ = (float)uStack_5458 * 0.6933594;
        uStack_56f8._4_4_ = uStack_5458._4_4_ * 0.6933594;
        uStack_56f0._0_4_ = (float)uStack_5450 * 0.6933594;
        uStack_56f0._4_4_ = uStack_5450._4_4_ * 0.6933594;
        auVar167 = _local_5700;
        uStack_56e8._0_4_ = (float)uStack_5448 * 0.6933594;
        uStack_56e8._4_4_ = uStack_5448._4_4_;
        auVar38 = _local_5700;
        local_54a0 = local_5720;
        uStack_5498 = uStack_5718;
        uStack_5490 = uStack_5710;
        uStack_5488 = uStack_5708;
        local_6680 = 0xb95e8083b95e8083;
        uStack_6678 = 0xb95e8083b95e8083;
        uStack_6670 = 0xb95e8083b95e8083;
        uStack_6668 = 0xb95e8083b95e8083;
        local_4ae0 = local_56e0._0_8_;
        uStack_4ad8 = local_56e0._8_8_;
        uStack_4ad0 = local_56e0._16_8_;
        uStack_4ac8 = local_56e0._24_8_;
        local_4b00 = local_5700;
        uStack_4af8 = uStack_56f8;
        uStack_56f0 = auVar167._16_8_;
        uStack_4af0 = uStack_56f0;
        uStack_56e8 = auVar38._24_8_;
        uStack_4ae8 = uStack_56e8;
        auVar35._16_8_ = uStack_56f0;
        auVar35._0_16_ = _local_5700;
        auVar35._24_8_ = uStack_56e8;
        auVar5 = vsubps_avx(auVar4,auVar35);
        local_56e0._0_8_ = auVar5._0_8_;
        local_4b20 = local_56e0._0_8_;
        local_56e0._8_8_ = auVar5._8_8_;
        uStack_4b18 = local_56e0._8_8_;
        local_56e0._16_8_ = auVar5._16_8_;
        uStack_4b10 = local_56e0._16_8_;
        local_56e0._24_8_ = auVar5._24_8_;
        uStack_4b08 = local_56e0._24_8_;
        local_4b40 = CONCAT44(local_5460._4_4_ * -0.00021219444,(float)local_5460 * -0.00021219444);
        uStack_4b38 = CONCAT44(uStack_5458._4_4_ * -0.00021219444,
                               (float)uStack_5458 * -0.00021219444);
        uStack_4b30 = CONCAT44(uStack_5450._4_4_ * -0.00021219444,
                               (float)uStack_5450 * -0.00021219444);
        uStack_4b28 = CONCAT44(uStack_5448._4_4_,(float)uStack_5448 * -0.00021219444);
        auVar34._8_8_ = uStack_4b38;
        auVar34._0_8_ = local_4b40;
        auVar34._16_8_ = uStack_4b30;
        auVar34._24_8_ = uStack_4b28;
        local_56e0 = vsubps_avx(auVar5,auVar34);
        local_5500 = local_56e0._0_8_;
        uStack_54f8 = local_56e0._8_8_;
        uStack_54f0 = local_56e0._16_8_;
        uStack_54e8 = local_56e0._24_8_;
        local_54e0._0_4_ = local_56e0._0_4_;
        local_54e0._4_4_ = local_56e0._4_4_;
        uStack_54d8._0_4_ = local_56e0._8_4_;
        uStack_54d8._4_4_ = local_56e0._12_4_;
        uStack_54d0._0_4_ = local_56e0._16_4_;
        uStack_54d0._4_4_ = local_56e0._20_4_;
        uStack_54c8._0_4_ = local_56e0._24_4_;
        uStack_54c8._4_4_ = local_56e0._28_4_;
        fStack_5784 = uStack_54c8._4_4_;
        local_57a0 = (float)local_54e0 * (float)local_54e0;
        fStack_579c = local_54e0._4_4_ * local_54e0._4_4_;
        fStack_5798 = (float)uStack_54d8 * (float)uStack_54d8;
        fStack_5794 = uStack_54d8._4_4_ * uStack_54d8._4_4_;
        fStack_5790 = (float)uStack_54d0 * (float)uStack_54d0;
        fStack_578c = uStack_54d0._4_4_ * uStack_54d0._4_4_;
        fStack_5788 = (float)uStack_54c8 * (float)uStack_54c8;
        local_5520 = 0x3950696739506967;
        uStack_5518 = 0x3950696739506967;
        uStack_5510 = 0x3950696739506967;
        uStack_5508 = 0x3950696739506967;
        local_5540 = local_56e0._0_8_;
        uStack_5538 = local_56e0._8_8_;
        uStack_5530 = local_56e0._16_8_;
        uStack_5528 = local_56e0._24_8_;
        local_57c0 = CONCAT44(local_54e0._4_4_ * 0.00019875691,(float)local_54e0 * 0.00019875691);
        uStack_57b8 = CONCAT44(uStack_54d8._4_4_ * 0.00019875691,(float)uStack_54d8 * 0.00019875691)
        ;
        uStack_57b0 = CONCAT44(uStack_54d0._4_4_ * 0.00019875691,(float)uStack_54d0 * 0.00019875691)
        ;
        uStack_57a8 = CONCAT44(0x39506967,(float)uStack_54c8 * 0.00019875691);
        local_5260 = local_57c0;
        uStack_5258 = uStack_57b8;
        uStack_5250 = uStack_57b0;
        uStack_5248 = uStack_57a8;
        local_5280 = 0x3ab743ce3ab743ce;
        uStack_5278 = 0x3ab743ce3ab743ce;
        uStack_5270 = 0x3ab743ce3ab743ce;
        uStack_5268 = 0x3ab743ce3ab743ce;
        fVar175 = (float)local_54e0 * 0.00019875691 + 0.0013981999;
        fVar177 = local_54e0._4_4_ * 0.00019875691 + 0.0013981999;
        fVar178 = (float)uStack_54d8 * 0.00019875691 + 0.0013981999;
        fVar179 = uStack_54d8._4_4_ * 0.00019875691 + 0.0013981999;
        fVar180 = (float)uStack_54d0 * 0.00019875691 + 0.0013981999;
        fVar181 = uStack_54d0._4_4_ * 0.00019875691 + 0.0013981999;
        fVar182 = (float)uStack_54c8 * 0.00019875691 + 0.0013981999;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3ad150fb,fVar182);
        local_5560 = local_57c0;
        uStack_5558 = uStack_57b8;
        uStack_5550 = uStack_57b0;
        uStack_5548 = uStack_57a8;
        local_5580 = local_56e0._0_8_;
        uStack_5578 = local_56e0._8_8_;
        uStack_5570 = local_56e0._16_8_;
        uStack_5568 = local_56e0._24_8_;
        fVar175 = fVar175 * (float)local_54e0;
        fVar177 = fVar177 * local_54e0._4_4_;
        fVar178 = fVar178 * (float)uStack_54d8;
        fVar179 = fVar179 * uStack_54d8._4_4_;
        fVar180 = fVar180 * (float)uStack_54d0;
        fVar181 = fVar181 * uStack_54d0._4_4_;
        fVar182 = fVar182 * (float)uStack_54c8;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3ad150fb,fVar182);
        local_52a0 = local_57c0;
        uStack_5298 = uStack_57b8;
        uStack_5290 = uStack_57b0;
        uStack_5288 = uStack_57a8;
        local_52c0 = 0x3c0889083c088908;
        uStack_52b8 = 0x3c0889083c088908;
        uStack_52b0 = 0x3c0889083c088908;
        uStack_52a8 = 0x3c0889083c088908;
        fVar175 = fVar175 + 0.008333452;
        fVar177 = fVar177 + 0.008333452;
        fVar178 = fVar178 + 0.008333452;
        fVar179 = fVar179 + 0.008333452;
        fVar180 = fVar180 + 0.008333452;
        fVar181 = fVar181 + 0.008333452;
        fVar182 = fVar182 + 0.008333452;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3c22b327,fVar182);
        local_55a0 = local_57c0;
        uStack_5598 = uStack_57b8;
        uStack_5590 = uStack_57b0;
        uStack_5588 = uStack_57a8;
        local_55c0 = local_56e0._0_8_;
        uStack_55b8 = local_56e0._8_8_;
        uStack_55b0 = local_56e0._16_8_;
        uStack_55a8 = local_56e0._24_8_;
        fVar175 = fVar175 * (float)local_54e0;
        fVar177 = fVar177 * local_54e0._4_4_;
        fVar178 = fVar178 * (float)uStack_54d8;
        fVar179 = fVar179 * uStack_54d8._4_4_;
        fVar180 = fVar180 * (float)uStack_54d0;
        fVar181 = fVar181 * uStack_54d0._4_4_;
        fVar182 = fVar182 * (float)uStack_54c8;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3c22b327,fVar182);
        local_52e0 = local_57c0;
        uStack_52d8 = uStack_57b8;
        uStack_52d0 = uStack_57b0;
        uStack_52c8 = uStack_57a8;
        local_5300 = 0x3d2aa9c13d2aa9c1;
        uStack_52f8 = 0x3d2aa9c13d2aa9c1;
        uStack_52f0 = 0x3d2aa9c13d2aa9c1;
        uStack_52e8 = 0x3d2aa9c13d2aa9c1;
        fVar175 = fVar175 + 0.041665796;
        fVar177 = fVar177 + 0.041665796;
        fVar178 = fVar178 + 0.041665796;
        fVar179 = fVar179 + 0.041665796;
        fVar180 = fVar180 + 0.041665796;
        fVar181 = fVar181 + 0.041665796;
        fVar182 = fVar182 + 0.041665796;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3d53568b,fVar182);
        local_55e0 = local_57c0;
        uStack_55d8 = uStack_57b8;
        uStack_55d0 = uStack_57b0;
        uStack_55c8 = uStack_57a8;
        local_5600 = local_56e0._0_8_;
        uStack_55f8 = local_56e0._8_8_;
        uStack_55f0 = local_56e0._16_8_;
        uStack_55e8 = local_56e0._24_8_;
        fVar175 = fVar175 * (float)local_54e0;
        fVar177 = fVar177 * local_54e0._4_4_;
        fVar178 = fVar178 * (float)uStack_54d8;
        fVar179 = fVar179 * uStack_54d8._4_4_;
        fVar180 = fVar180 * (float)uStack_54d0;
        fVar181 = fVar181 * uStack_54d0._4_4_;
        fVar182 = fVar182 * (float)uStack_54c8;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3d53568b,fVar182);
        local_5320 = local_57c0;
        uStack_5318 = uStack_57b8;
        uStack_5310 = uStack_57b0;
        uStack_5308 = uStack_57a8;
        local_5340 = 0x3e2aaaaa3e2aaaaa;
        uStack_5338 = 0x3e2aaaaa3e2aaaaa;
        uStack_5330 = 0x3e2aaaaa3e2aaaaa;
        uStack_5328 = 0x3e2aaaaa3e2aaaaa;
        fVar175 = fVar175 + 0.16666666;
        fVar177 = fVar177 + 0.16666666;
        fVar178 = fVar178 + 0.16666666;
        fVar179 = fVar179 + 0.16666666;
        fVar180 = fVar180 + 0.16666666;
        fVar181 = fVar181 + 0.16666666;
        fVar182 = fVar182 + 0.16666666;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3e5f804d,fVar182);
        local_5620 = local_57c0;
        uStack_5618 = uStack_57b8;
        uStack_5610 = uStack_57b0;
        uStack_5608 = uStack_57a8;
        local_5640 = local_56e0._0_8_;
        uStack_5638 = local_56e0._8_8_;
        uStack_5630 = local_56e0._16_8_;
        uStack_5628 = local_56e0._24_8_;
        fVar175 = fVar175 * (float)local_54e0;
        fVar177 = fVar177 * local_54e0._4_4_;
        fVar178 = fVar178 * (float)uStack_54d8;
        fVar179 = fVar179 * uStack_54d8._4_4_;
        fVar180 = fVar180 * (float)uStack_54d0;
        fVar181 = fVar181 * uStack_54d0._4_4_;
        fVar182 = fVar182 * (float)uStack_54c8;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3e5f804d,fVar182);
        local_5360 = local_57c0;
        uStack_5358 = uStack_57b8;
        uStack_5350 = uStack_57b0;
        uStack_5348 = uStack_57a8;
        fVar175 = fVar175 + 0.5;
        fVar177 = fVar177 + 0.5;
        fVar178 = fVar178 + 0.5;
        fVar179 = fVar179 + 0.5;
        fVar180 = fVar180 + 0.5;
        fVar181 = fVar181 + 0.5;
        fVar182 = fVar182 + 0.5;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3f37e013,fVar182);
        local_5660 = local_57c0;
        uStack_5658 = uStack_57b8;
        uStack_5650 = uStack_57b0;
        uStack_5648 = uStack_57a8;
        local_5680 = CONCAT44(fStack_579c,local_57a0);
        uStack_5678 = CONCAT44(fStack_5794,fStack_5798);
        uStack_5670 = CONCAT44(fStack_578c,fStack_5790);
        uStack_5668 = CONCAT44(uStack_54c8._4_4_,fStack_5788);
        fVar175 = fVar175 * local_57a0;
        fVar177 = fVar177 * fStack_579c;
        fVar178 = fVar178 * fStack_5798;
        fVar179 = fVar179 * fStack_5794;
        fVar180 = fVar180 * fStack_5790;
        fVar181 = fVar181 * fStack_578c;
        fVar182 = fVar182 * fStack_5788;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(0x3f37e013,fVar182);
        local_53a0 = local_57c0;
        uStack_5398 = uStack_57b8;
        uStack_5390 = uStack_57b0;
        uStack_5388 = uStack_57a8;
        local_53c0 = local_56e0._0_8_;
        uStack_53b8 = local_56e0._8_8_;
        uStack_53b0 = local_56e0._16_8_;
        uStack_53a8 = local_56e0._24_8_;
        fVar175 = fVar175 + (float)local_54e0;
        fVar177 = fVar177 + local_54e0._4_4_;
        fVar178 = fVar178 + (float)uStack_54d8;
        fVar179 = fVar179 + uStack_54d8._4_4_;
        fVar180 = fVar180 + (float)uStack_54d0;
        fVar181 = fVar181 + uStack_54d0._4_4_;
        fVar182 = fVar182 + (float)uStack_54c8;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(uStack_54c8._4_4_ + 0.71826285,fVar182);
        local_53e0 = local_57c0;
        uStack_53d8 = uStack_57b8;
        uStack_53d0 = uStack_57b0;
        uStack_53c8 = uStack_57a8;
        local_5400 = 0x3f8000003f800000;
        uStack_53f8 = 0x3f8000003f800000;
        uStack_53f0 = 0x3f8000003f800000;
        uStack_53e8 = 0x3f8000003f800000;
        fVar175 = fVar175 + 1.0;
        fVar177 = fVar177 + 1.0;
        fVar178 = fVar178 + 1.0;
        fVar179 = fVar179 + 1.0;
        fVar180 = fVar180 + 1.0;
        fVar181 = fVar181 + 1.0;
        fVar182 = fVar182 + 1.0;
        fVar183 = uStack_54c8._4_4_ + 0.71826285 + 1.0;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(fVar183,fVar182);
        local_2ca0 = local_5720;
        uStack_2c98 = uStack_5718;
        uStack_2c90 = uStack_5710;
        uStack_2c88 = uStack_5708;
        local_5740 = CONCAT44((int)local_5460._4_4_,(int)(float)local_5460);
        uStack_5738 = CONCAT44((int)uStack_5458._4_4_,(int)(float)uStack_5458);
        uStack_5730 = CONCAT44((int)uStack_5450._4_4_,(int)(float)uStack_5450);
        uStack_5728 = CONCAT44((int)uStack_5448._4_4_,(int)(float)uStack_5448);
        local_28a0 = local_5740;
        uStack_2898 = uStack_5738;
        uStack_2890 = uStack_5730;
        uStack_2888 = uStack_5728;
        local_28c0 = 0x7f0000007f;
        uStack_28b8 = 0x7f0000007f;
        uStack_28b0 = 0x7f0000007f;
        uStack_28a8 = 0x7f0000007f;
        local_2940 = local_5740;
        uStack_2938 = uStack_5738;
        uStack_2930 = uStack_5730;
        uStack_2928 = uStack_5728;
        local_2960 = 0x7f0000007f;
        uStack_2958 = 0x7f0000007f;
        uStack_2950 = 0x7f0000007f;
        uStack_2948 = 0x7f0000007f;
        local_28f0 = 0x7f0000007f;
        uStack_28e8 = 0x7f0000007f;
        local_2900 = 0x7f0000007f;
        uStack_28f8 = 0x7f0000007f;
        local_24d0 = local_5740;
        uStack_24c8 = uStack_5738;
        local_24e0 = 0x7f0000007f;
        uStack_24d8 = 0x7f0000007f;
        auVar87._8_8_ = uStack_5738;
        auVar87._0_8_ = local_5740;
        auVar86._8_8_ = 0x7f0000007f;
        auVar86._0_8_ = 0x7f0000007f;
        local_28d0 = vpaddd_avx(auVar87,auVar86);
        local_24f0 = uStack_5730;
        uStack_24e8 = uStack_5728;
        local_2500 = 0x7f0000007f;
        uStack_24f8 = 0x7f0000007f;
        auVar85._8_8_ = uStack_5728;
        auVar85._0_8_ = uStack_5730;
        auVar84._8_8_ = 0x7f0000007f;
        auVar84._0_8_ = 0x7f0000007f;
        local_28e0 = vpaddd_avx(auVar85,auVar84);
        local_2980 = local_28d0._0_8_;
        uStack_2978 = local_28d0._8_8_;
        uStack_2970 = local_28e0._0_8_;
        uStack_2968 = local_28e0._8_8_;
        local_2920 = local_28d0._0_8_;
        uStack_2918 = local_28d0._8_8_;
        uStack_2910 = local_28e0._0_8_;
        uStack_2908 = local_28e0._8_8_;
        local_25a0 = local_28d0._0_8_;
        uStack_2598 = local_28d0._8_8_;
        uStack_2590 = local_28e0._0_8_;
        uStack_2588 = local_28e0._8_8_;
        local_25a4 = 0x17;
        local_2620 = local_28d0._0_8_;
        uStack_2618 = local_28d0._8_8_;
        uStack_2610 = local_28e0._0_8_;
        uStack_2608 = local_28e0._8_8_;
        local_23d0 = local_28d0._0_8_;
        uStack_23c8 = local_28d0._8_8_;
        local_23d4 = 0x17;
        local_25c0 = vpslld_avx(local_28d0,ZEXT416(0x17));
        local_23f0 = local_28e0._0_8_;
        uStack_23e8 = local_28e0._8_8_;
        local_23f4 = 0x17;
        local_25d0 = vpslld_avx(local_28e0,ZEXT416(0x17));
        local_2640 = local_25c0._0_8_;
        uStack_2638 = local_25c0._8_8_;
        uStack_2630 = local_25d0._0_8_;
        uStack_2628 = local_25d0._8_8_;
        local_2600 = local_25c0._0_8_;
        uStack_25f8 = local_25c0._8_8_;
        uStack_25f0 = local_25d0._0_8_;
        uStack_25e8 = local_25d0._8_8_;
        local_5740 = local_25c0._0_8_;
        uStack_5738 = local_25c0._8_8_;
        uStack_5730 = local_25d0._0_8_;
        uStack_5728 = local_25d0._8_8_;
        local_2520 = local_25c0._0_8_;
        uStack_2518 = local_25c0._8_8_;
        uStack_2510 = local_25d0._0_8_;
        uStack_2508 = local_25d0._8_8_;
        local_57e0 = local_25c0._0_8_;
        uStack_57d8 = local_25c0._8_8_;
        uStack_57d0 = local_25d0._0_8_;
        uStack_57c8 = local_25d0._8_8_;
        local_56a0 = local_57c0;
        uStack_5698 = uStack_57b8;
        uStack_5690 = uStack_57b0;
        uStack_5688 = uStack_57a8;
        local_56c0._0_4_ = local_25c0._0_4_;
        local_56c0._4_4_ = local_25c0._4_4_;
        uStack_56b8._0_4_ = local_25c0._8_4_;
        uStack_56b8._4_4_ = local_25c0._12_4_;
        uStack_56b0._0_4_ = local_25d0._0_4_;
        uStack_56b0._4_4_ = local_25d0._4_4_;
        uStack_56a8._0_4_ = local_25d0._8_4_;
        fVar175 = fVar175 * (float)local_56c0;
        fVar177 = fVar177 * local_56c0._4_4_;
        fVar178 = fVar178 * (float)uStack_56b8;
        fVar179 = fVar179 * uStack_56b8._4_4_;
        fVar180 = fVar180 * (float)uStack_56b0;
        fVar181 = fVar181 * uStack_56b0._4_4_;
        fVar182 = fVar182 * (float)uStack_56a8;
        local_57c0 = CONCAT44(fVar177,fVar175);
        uStack_57b8 = CONCAT44(fVar179,fVar178);
        uStack_57b0 = CONCAT44(fVar181,fVar180);
        uStack_57a8 = CONCAT44(fVar183,fVar182);
        local_5840 = local_57c0;
        uStack_5838 = uStack_57b8;
        uStack_5830 = uStack_57b0;
        uStack_5828 = uStack_57a8;
        local_4c08 = 0x3f800000;
        local_2220 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2240 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2230 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_2f80 = 0x7f0000007f;
        uStack_2f78 = 0x7f0000007f;
        uStack_2f70 = 0x7f0000007f;
        uStack_2f68 = 0x7f0000007f;
        local_38e0 = 0;
        uStack_6db8 = SUB328(ZEXT832(0),4);
        uStack_38d8 = uStack_6db8;
        uStack_38d0 = 0;
        uStack_38c8 = 0;
        local_5860._0_4_ = local_2240._0_4_;
        local_5860._4_4_ = local_2240._4_4_;
        uStack_5858._0_4_ = local_2240._8_4_;
        uStack_5858._4_4_ = local_2240._12_4_;
        uStack_5850._0_4_ = auStack_2230._0_4_;
        uStack_5850._4_4_ = auStack_2230._4_4_;
        uStack_5848._0_4_ = auStack_2230._8_4_;
        uStack_5848._4_4_ = auStack_2230._12_4_;
        local_6720._4_4_ = fVar177 + local_5860._4_4_;
        local_6720._0_4_ = fVar175 + (float)local_5860;
        uStack_6718._0_4_ = fVar178 + (float)uStack_5858;
        uStack_6718._4_4_ = fVar179 + uStack_5858._4_4_;
        uStack_6710._0_4_ = fVar180 + (float)uStack_5850;
        uStack_6710._4_4_ = fVar181 + uStack_5850._4_4_;
        auVar167 = _local_6720;
        uStack_6708._0_4_ = fVar182 + (float)uStack_5848;
        uStack_6708._4_4_ = fVar183 + uStack_5848._4_4_;
        auVar5 = _local_6720;
        local_6780 = vcmpps_avx(_local_6720,ZEXT832(uStack_6db8) << 0x40,2);
        local_36a0 = local_6720;
        uStack_3698 = uStack_6718;
        uStack_6710 = auVar167._16_8_;
        uStack_3690 = uStack_6710;
        uStack_6708 = auVar5._24_8_;
        uStack_3688 = uStack_6708;
        local_36c0 = 0x80000000800000;
        uStack_36b8 = 0x80000000800000;
        uStack_36b0 = 0x80000000800000;
        uStack_36a8 = 0x80000000800000;
        auVar63._16_8_ = uStack_6710;
        auVar63._0_16_ = _local_6720;
        auVar63._24_8_ = uStack_6708;
        auVar62._8_8_ = 0x80000000800000;
        auVar62._0_8_ = 0x80000000800000;
        auVar62._16_8_ = 0x80000000800000;
        auVar62._24_8_ = 0x80000000800000;
        auVar5 = vmaxps_avx(auVar63,auVar62);
        local_6720 = auVar5._0_8_;
        local_34e0 = local_6720;
        uStack_6718 = auVar5._8_8_;
        uStack_34d8 = uStack_6718;
        uStack_6710 = auVar5._16_8_;
        uStack_34d0 = uStack_6710;
        uStack_6708 = auVar5._24_8_;
        uStack_34c8 = uStack_6708;
        local_3520 = local_6720;
        uStack_3518 = uStack_6718;
        uStack_3510 = uStack_6710;
        uStack_3508 = uStack_6708;
        local_3524 = 0x17;
        local_35a0 = local_6720;
        uStack_3598 = uStack_6718;
        uStack_3590 = uStack_6710;
        uStack_3588 = uStack_6708;
        local_2ed0 = local_6720;
        uStack_2ec8 = uStack_6718;
        local_2ed4 = 0x17;
        local_3540 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
        local_2ef0 = uStack_6710;
        uStack_2ee8 = uStack_6708;
        local_2ef4 = 0x17;
        local_3550 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
        local_35c0 = local_3540._0_8_;
        uStack_35b8 = local_3540._8_8_;
        uStack_35b0 = local_3550._0_8_;
        uStack_35a8 = local_3550._8_8_;
        local_3580 = local_3540._0_8_;
        uStack_3578 = local_3540._8_8_;
        uStack_3570 = local_3550._0_8_;
        uStack_3568 = local_3550._8_8_;
        local_3260 = local_6720;
        uStack_3258 = uStack_6718;
        uStack_3250 = uStack_6710;
        uStack_3248 = uStack_6708;
        local_3280 = 0x807fffff807fffff;
        uStack_3278 = 0x807fffff807fffff;
        uStack_3270 = 0x807fffff807fffff;
        uStack_3268 = 0x807fffff807fffff;
        auVar71._8_8_ = 0x807fffff807fffff;
        auVar71._0_8_ = 0x807fffff807fffff;
        auVar71._16_8_ = 0x807fffff807fffff;
        auVar71._24_8_ = 0x807fffff807fffff;
        auVar5 = vandps_avx(auVar5,auVar71);
        local_6720 = auVar5._0_8_;
        local_3160 = local_6720;
        uStack_6718 = auVar5._8_8_;
        uStack_3158 = uStack_6718;
        uStack_6710 = auVar5._16_8_;
        uStack_3150 = uStack_6710;
        uStack_6708 = auVar5._24_8_;
        uStack_3148 = uStack_6708;
        auVar75._8_8_ = 0x3f0000003f000000;
        auVar75._0_8_ = 0x3f0000003f000000;
        auVar75._16_8_ = 0x3f0000003f000000;
        auVar75._24_8_ = 0x3f0000003f000000;
        auVar4 = vorps_avx(auVar5,auVar75);
        local_2f60 = local_3540._0_8_;
        uStack_2f58 = local_3540._8_8_;
        uStack_2f50 = local_3550._0_8_;
        uStack_2f48 = local_3550._8_8_;
        local_3000 = local_3540._0_8_;
        uStack_2ff8 = local_3540._8_8_;
        uStack_2ff0 = local_3550._0_8_;
        uStack_2fe8 = local_3550._8_8_;
        local_3020 = 0x7f0000007f;
        uStack_3018 = 0x7f0000007f;
        uStack_3010 = 0x7f0000007f;
        uStack_3008 = 0x7f0000007f;
        local_2fb0 = 0x7f0000007f;
        uStack_2fa8 = 0x7f0000007f;
        local_2fc0 = 0x7f0000007f;
        uStack_2fb8 = 0x7f0000007f;
        local_2e50 = local_3540._0_8_;
        uStack_2e48 = local_3540._8_8_;
        local_2e60 = 0x7f0000007f;
        uStack_2e58 = 0x7f0000007f;
        auVar79._8_8_ = 0x7f0000007f;
        auVar79._0_8_ = 0x7f0000007f;
        local_2f90 = vpsubd_avx(local_3540,auVar79);
        local_2e70 = local_3550._0_8_;
        uStack_2e68 = local_3550._8_8_;
        local_2e80 = 0x7f0000007f;
        uStack_2e78 = 0x7f0000007f;
        auVar78._8_8_ = 0x7f0000007f;
        auVar78._0_8_ = 0x7f0000007f;
        local_2fa0 = vpsubd_avx(local_3550,auVar78);
        local_3040 = local_2f90._0_8_;
        uStack_3038 = local_2f90._8_8_;
        uStack_3030 = local_2fa0._0_8_;
        uStack_3028 = local_2fa0._8_8_;
        local_2fe0 = local_2f90._0_8_;
        uStack_2fd8 = local_2f90._8_8_;
        uStack_2fd0 = local_2fa0._0_8_;
        uStack_2fc8 = local_2fa0._8_8_;
        local_6740 = local_2f90._0_8_;
        uStack_6738 = local_2f90._8_8_;
        uStack_6730 = local_2fa0._0_8_;
        uStack_6728 = local_2fa0._8_8_;
        local_2f20 = local_2f90._0_8_;
        uStack_2f18 = local_2f90._8_8_;
        uStack_2f10 = local_2fa0._0_8_;
        uStack_2f08 = local_2fa0._8_8_;
        auVar77._16_8_ = local_2fa0._0_8_;
        auVar77._0_16_ = local_2f90;
        auVar77._24_8_ = local_2fa0._8_8_;
        auVar5 = vcvtdq2ps_avx(auVar77);
        local_67a0 = auVar5._0_8_;
        uVar11 = local_67a0;
        uStack_6798 = auVar5._8_8_;
        uVar12 = uStack_6798;
        uStack_6790 = auVar5._16_8_;
        uVar13 = uStack_6790;
        uStack_6788 = auVar5._24_8_;
        uVar14 = uStack_6788;
        local_58a0 = 0x3f8000003f800000;
        uStack_5898 = 0x3f8000003f800000;
        uStack_5890 = 0x3f8000003f800000;
        uStack_5888 = 0x3f8000003f800000;
        local_5880._0_4_ = auVar5._0_4_;
        local_5880._4_4_ = auVar5._4_4_;
        uStack_5878._0_4_ = auVar5._8_4_;
        uStack_5878._4_4_ = auVar5._12_4_;
        uStack_5870._0_4_ = auVar5._16_4_;
        uStack_5870._4_4_ = auVar5._20_4_;
        uStack_5868._0_4_ = auVar5._24_4_;
        uStack_5868._4_4_ = auVar5._28_4_;
        local_67a0._4_4_ = local_5880._4_4_ + 1.0;
        local_67a0._0_4_ = (float)local_5880 + 1.0;
        uStack_6798._0_4_ = (float)uStack_5878 + 1.0;
        uStack_6798._4_4_ = uStack_5878._4_4_ + 1.0;
        uStack_6790._0_4_ = (float)uStack_5870 + 1.0;
        uStack_6790._4_4_ = uStack_5870._4_4_ + 1.0;
        auVar167 = _local_67a0;
        uStack_6788._0_4_ = (float)uStack_5868 + 1.0;
        uStack_6788._4_4_ = uStack_5868._4_4_ + 1.0;
        auVar6 = _local_67a0;
        local_67c0 = vcmpps_avx(auVar4,_DAT_00954c00,1);
        local_6720 = auVar4._0_8_;
        local_32a0 = local_6720;
        uStack_6718 = auVar4._8_8_;
        uStack_3298 = uStack_6718;
        uStack_6710 = auVar4._16_8_;
        uStack_3290 = uStack_6710;
        uStack_6708 = auVar4._24_8_;
        uStack_3288 = uStack_6708;
        local_32c0 = local_67c0._0_8_;
        uStack_32b8 = local_67c0._8_8_;
        uStack_32b0 = local_67c0._16_8_;
        uStack_32a8 = local_67c0._24_8_;
        auVar5 = vandps_avx(auVar4,local_67c0);
        local_4920 = local_6720;
        uStack_4918 = uStack_6718;
        uStack_4910 = uStack_6710;
        uStack_4908 = uStack_6708;
        local_4940 = 0x3f8000003f800000;
        uStack_4938 = 0x3f8000003f800000;
        uStack_4930 = 0x3f8000003f800000;
        uStack_4928 = 0x3f8000003f800000;
        auVar43._8_8_ = 0x3f8000003f800000;
        auVar43._0_8_ = 0x3f8000003f800000;
        auVar43._16_8_ = 0x3f8000003f800000;
        auVar43._24_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar4,auVar43);
        local_4960 = local_67a0;
        uStack_4958 = uStack_6798;
        uStack_6790 = auVar167._16_8_;
        uStack_4950 = uStack_6790;
        uStack_6788 = auVar6._24_8_;
        uStack_4948 = uStack_6788;
        local_32e0 = 0x3f8000003f800000;
        uStack_32d8 = 0x3f8000003f800000;
        uStack_32d0 = 0x3f8000003f800000;
        uStack_32c8 = 0x3f8000003f800000;
        local_3300 = local_67c0._0_8_;
        uStack_32f8 = local_67c0._8_8_;
        uStack_32f0 = local_67c0._16_8_;
        uStack_32e8 = local_67c0._24_8_;
        auVar70._8_8_ = 0x3f8000003f800000;
        auVar70._0_8_ = 0x3f8000003f800000;
        auVar70._16_8_ = 0x3f8000003f800000;
        auVar70._24_8_ = 0x3f8000003f800000;
        local_4980 = vandps_avx(auVar70,local_67c0);
        auVar42._16_8_ = uStack_6790;
        auVar42._0_16_ = _local_67a0;
        auVar42._24_8_ = uStack_6788;
        _local_67a0 = vsubps_avx(auVar42,local_4980);
        local_6720 = auVar4._0_8_;
        uVar15 = local_6720;
        uStack_6718 = auVar4._8_8_;
        uVar16 = uStack_6718;
        uStack_6710 = auVar4._16_8_;
        uVar17 = uStack_6710;
        uStack_6708 = auVar4._24_8_;
        uVar18 = uStack_6708;
        local_67e0 = auVar5._0_8_;
        uVar19 = local_67e0;
        uStack_67d8 = auVar5._8_8_;
        uVar20 = uStack_67d8;
        uStack_67d0 = auVar5._16_8_;
        uVar21 = uStack_67d0;
        uStack_67c8 = auVar5._24_8_;
        uVar22 = uStack_67c8;
        local_58c0._0_4_ = auVar4._0_4_;
        local_58c0._4_4_ = auVar4._4_4_;
        uStack_58b8._0_4_ = auVar4._8_4_;
        uStack_58b8._4_4_ = auVar4._12_4_;
        uStack_58b0._0_4_ = auVar4._16_4_;
        uStack_58b0._4_4_ = auVar4._20_4_;
        uStack_58a8._0_4_ = auVar4._24_4_;
        uStack_58a8._4_4_ = auVar4._28_4_;
        local_58e0._0_4_ = auVar5._0_4_;
        local_58e0._4_4_ = auVar5._4_4_;
        uStack_58d8._0_4_ = auVar5._8_4_;
        uStack_58d8._4_4_ = auVar5._12_4_;
        uStack_58d0._0_4_ = auVar5._16_4_;
        uStack_58d0._4_4_ = auVar5._20_4_;
        uStack_58c8._0_4_ = auVar5._24_4_;
        uStack_58c8._4_4_ = auVar5._28_4_;
        local_58c0._0_4_ = (float)local_58c0 + (float)local_58e0;
        local_58c0._4_4_ = local_58c0._4_4_ + local_58e0._4_4_;
        uStack_58b8._0_4_ = (float)uStack_58b8 + (float)uStack_58d8;
        uStack_58b8._4_4_ = uStack_58b8._4_4_ + uStack_58d8._4_4_;
        uStack_58b0._0_4_ = (float)uStack_58b0 + (float)uStack_58d0;
        uStack_58b0._4_4_ = uStack_58b0._4_4_ + uStack_58d0._4_4_;
        uStack_58a8._0_4_ = (float)uStack_58a8 + (float)uStack_58c8;
        fStack_67e4 = uStack_58a8._4_4_ + uStack_58c8._4_4_;
        local_6720._4_4_ = local_58c0._4_4_;
        local_6720._0_4_ = (float)local_58c0;
        uStack_6718._0_4_ = (float)uStack_58b8;
        uStack_6718._4_4_ = uStack_58b8._4_4_;
        uStack_6710._0_4_ = (float)uStack_58b0;
        uStack_6710._4_4_ = uStack_58b0._4_4_;
        auVar167 = _local_6720;
        uStack_6708._0_4_ = (float)uStack_58a8;
        uStack_6708._4_4_ = fStack_67e4;
        auVar5 = _local_6720;
        local_63c0 = local_6720;
        uStack_63b8 = uStack_6718;
        uStack_6710 = auVar167._16_8_;
        uStack_63b0 = uStack_6710;
        uStack_6708 = auVar5._24_8_;
        uStack_63a8 = uStack_6708;
        local_6800 = (float)local_58c0 * (float)local_58c0;
        fStack_67fc = local_58c0._4_4_ * local_58c0._4_4_;
        fStack_67f8 = (float)uStack_58b8 * (float)uStack_58b8;
        fStack_67f4 = uStack_58b8._4_4_ * uStack_58b8._4_4_;
        fStack_67f0 = (float)uStack_58b0 * (float)uStack_58b0;
        fStack_67ec = uStack_58b0._4_4_ * uStack_58b0._4_4_;
        fStack_67e8 = (float)uStack_58a8 * (float)uStack_58a8;
        local_63e0 = 0x3d9021bb3d9021bb;
        uStack_63d8 = 0x3d9021bb3d9021bb;
        uStack_63d0 = 0x3d9021bb3d9021bb;
        uStack_63c8 = 0x3d9021bb3d9021bb;
        local_6400 = local_6720;
        uStack_63f8 = uStack_6718;
        uStack_63f0 = uStack_6710;
        uStack_63e8 = uStack_6708;
        local_6820._4_4_ = local_58c0._4_4_ * 0.070376836;
        local_6820._0_4_ = (float)local_58c0 * 0.070376836;
        uStack_6818._0_4_ = (float)uStack_58b8 * 0.070376836;
        uStack_6818._4_4_ = uStack_58b8._4_4_ * 0.070376836;
        uStack_6810._0_4_ = (float)uStack_58b0 * 0.070376836;
        uStack_6810._4_4_ = uStack_58b0._4_4_ * 0.070376836;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = (float)uStack_58a8 * 0.070376836;
        uStack_6808._4_4_ = 0x3d9021bb;
        auVar5 = _local_6820;
        local_5900 = local_6820;
        uStack_58f8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_58f0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_58e8 = uStack_6808;
        local_5920 = 0xbdebd1b8bdebd1b8;
        uStack_5918 = 0xbdebd1b8bdebd1b8;
        uStack_5910 = 0xbdebd1b8bdebd1b8;
        uStack_5908 = 0xbdebd1b8bdebd1b8;
        local_6820._0_4_ = (float)local_58c0 * 0.070376836 + -0.1151461;
        local_6820._4_4_ = local_58c0._4_4_ * 0.070376836 + -0.1151461;
        fVar175 = (float)uStack_58b8 * 0.070376836 + -0.1151461;
        fVar177 = uStack_58b8._4_4_ * 0.070376836 + -0.1151461;
        fVar178 = (float)uStack_58b0 * 0.070376836 + -0.1151461;
        fVar179 = uStack_58b0._4_4_ * 0.070376836 + -0.1151461;
        fVar180 = (float)uStack_58a8 * 0.070376836 + -0.1151461;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbd375ffa;
        auVar5 = _local_6820;
        local_6420 = local_6820;
        uStack_6418 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6410 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6408 = uStack_6808;
        local_6440 = local_6720;
        uStack_6438 = uStack_6718;
        uStack_6430 = uStack_6710;
        uStack_6428 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbd375ffa;
        auVar5 = _local_6820;
        local_5940 = local_6820;
        uStack_5938 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_5930 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_5928 = uStack_6808;
        local_5960 = 0x3def251a3def251a;
        uStack_5958 = 0x3def251a3def251a;
        uStack_5950 = 0x3def251a3def251a;
        uStack_5948 = 0x3def251a3def251a;
        local_6820._0_4_ = (float)local_6820._0_4_ + 0.116769984;
        local_6820._4_4_ = (float)local_6820._4_4_ + 0.116769984;
        fVar175 = fVar175 + 0.116769984;
        fVar177 = fVar177 + 0.116769984;
        fVar178 = fVar178 + 0.116769984;
        fVar179 = fVar179 + 0.116769984;
        fVar180 = fVar180 + 0.116769984;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3d93751d;
        auVar5 = _local_6820;
        local_6460 = local_6820;
        uStack_6458 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6450 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6448 = uStack_6808;
        local_6480 = local_6720;
        uStack_6478 = uStack_6718;
        uStack_6470 = uStack_6710;
        uStack_6468 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3d93751d;
        auVar5 = _local_6820;
        local_5980 = local_6820;
        uStack_5978 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_5970 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_5968 = uStack_6808;
        local_59a0 = 0xbdfe5d4fbdfe5d4f;
        uStack_5998 = 0xbdfe5d4fbdfe5d4f;
        uStack_5990 = 0xbdfe5d4fbdfe5d4f;
        uStack_5988 = 0xbdfe5d4fbdfe5d4f;
        local_6820._0_4_ = (float)local_6820._0_4_ + -0.12420141;
        local_6820._4_4_ = (float)local_6820._4_4_ + -0.12420141;
        fVar175 = fVar175 + -0.12420141;
        fVar177 = fVar177 + -0.12420141;
        fVar178 = fVar178 + -0.12420141;
        fVar179 = fVar179 + -0.12420141;
        fVar180 = fVar180 + -0.12420141;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbd55d064;
        auVar5 = _local_6820;
        local_64a0 = local_6820;
        uStack_6498 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6490 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6488 = uStack_6808;
        local_64c0 = local_6720;
        uStack_64b8 = uStack_6718;
        uStack_64b0 = uStack_6710;
        uStack_64a8 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbd55d064;
        auVar5 = _local_6820;
        local_59c0 = local_6820;
        uStack_59b8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_59b0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_59a8 = uStack_6808;
        local_59e0 = 0x3e11e9bf3e11e9bf;
        uStack_59d8 = 0x3e11e9bf3e11e9bf;
        uStack_59d0 = 0x3e11e9bf3e11e9bf;
        uStack_59c8 = 0x3e11e9bf3e11e9bf;
        local_6820._0_4_ = (float)local_6820._0_4_ + 0.14249323;
        local_6820._4_4_ = (float)local_6820._4_4_ + 0.14249323;
        fVar175 = fVar175 + 0.14249323;
        fVar177 = fVar177 + 0.14249323;
        fVar178 = fVar178 + 0.14249323;
        fVar179 = fVar179 + 0.14249323;
        fVar180 = fVar180 + 0.14249323;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3db8eb4c;
        auVar5 = _local_6820;
        local_64e0 = local_6820;
        uStack_64d8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_64d0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_64c8 = uStack_6808;
        local_6500 = local_6720;
        uStack_64f8 = uStack_6718;
        uStack_64f0 = uStack_6710;
        uStack_64e8 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3db8eb4c;
        auVar5 = _local_6820;
        local_5a00 = local_6820;
        uStack_59f8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_59f0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_59e8 = uStack_6808;
        local_5a20 = 0xbe2aae50be2aae50;
        uStack_5a18 = 0xbe2aae50be2aae50;
        uStack_5a10 = 0xbe2aae50be2aae50;
        uStack_5a08 = 0xbe2aae50be2aae50;
        local_6820._0_4_ = (float)local_6820._0_4_ + -0.16668057;
        local_6820._4_4_ = (float)local_6820._4_4_ + -0.16668057;
        fVar175 = fVar175 + -0.16668057;
        fVar177 = fVar177 + -0.16668057;
        fVar178 = fVar178 + -0.16668057;
        fVar179 = fVar179 + -0.16668057;
        fVar180 = fVar180 + -0.16668057;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbd9c7154;
        auVar5 = _local_6820;
        local_6520 = local_6820;
        uStack_6518 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6510 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6508 = uStack_6808;
        local_6540 = local_6720;
        uStack_6538 = uStack_6718;
        uStack_6530 = uStack_6710;
        uStack_6528 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbd9c7154;
        auVar5 = _local_6820;
        local_5a40 = local_6820;
        uStack_5a38 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_5a30 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_5a28 = uStack_6808;
        local_5a60 = 0x3e4cceac3e4cceac;
        uStack_5a58 = 0x3e4cceac3e4cceac;
        uStack_5a50 = 0x3e4cceac3e4cceac;
        uStack_5a48 = 0x3e4cceac3e4cceac;
        local_6820._0_4_ = (float)local_6820._0_4_ + 0.20000714;
        local_6820._4_4_ = (float)local_6820._4_4_ + 0.20000714;
        fVar175 = fVar175 + 0.20000714;
        fVar177 = fVar177 + 0.20000714;
        fVar178 = fVar178 + 0.20000714;
        fVar179 = fVar179 + 0.20000714;
        fVar180 = fVar180 + 0.20000714;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3dfd2c04;
        auVar5 = _local_6820;
        local_6560 = local_6820;
        uStack_6558 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6550 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6548 = uStack_6808;
        local_6580 = local_6720;
        uStack_6578 = uStack_6718;
        uStack_6570 = uStack_6710;
        uStack_6568 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3dfd2c04;
        auVar5 = _local_6820;
        local_5a80 = local_6820;
        uStack_5a78 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_5a70 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_5a68 = uStack_6808;
        local_5aa0 = 0xbe7ffffcbe7ffffc;
        uStack_5a98 = 0xbe7ffffcbe7ffffc;
        uStack_5a90 = 0xbe7ffffcbe7ffffc;
        uStack_5a88 = 0xbe7ffffcbe7ffffc;
        local_6820._0_4_ = (float)local_6820._0_4_ + -0.24999994;
        local_6820._4_4_ = (float)local_6820._4_4_ + -0.24999994;
        fVar175 = fVar175 + -0.24999994;
        fVar177 = fVar177 + -0.24999994;
        fVar178 = fVar178 + -0.24999994;
        fVar179 = fVar179 + -0.24999994;
        fVar180 = fVar180 + -0.24999994;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbe0169fa;
        auVar5 = _local_6820;
        local_65a0 = local_6820;
        uStack_6598 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6590 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6588 = uStack_6808;
        local_65c0 = local_6720;
        uStack_65b8 = uStack_6718;
        uStack_65b0 = uStack_6710;
        uStack_65a8 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0xbe0169fa;
        auVar5 = _local_6820;
        local_5ac0 = local_6820;
        uStack_5ab8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_5ab0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_5aa8 = uStack_6808;
        local_5ae0 = 0x3eaaaaaa3eaaaaaa;
        uStack_5ad8 = 0x3eaaaaaa3eaaaaaa;
        uStack_5ad0 = 0x3eaaaaaa3eaaaaaa;
        uStack_5ac8 = 0x3eaaaaaa3eaaaaaa;
        local_6820._0_4_ = (float)local_6820._0_4_ + 0.3333333;
        local_6820._4_4_ = (float)local_6820._4_4_ + 0.3333333;
        fVar175 = fVar175 + 0.3333333;
        fVar177 = fVar177 + 0.3333333;
        fVar178 = fVar178 + 0.3333333;
        fVar179 = fVar179 + 0.3333333;
        fVar180 = fVar180 + 0.3333333;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3e53eb5a;
        auVar5 = _local_6820;
        local_65e0 = local_6820;
        uStack_65d8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_65d0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_65c8 = uStack_6808;
        local_6600 = local_6720;
        uStack_65f8 = uStack_6718;
        uStack_65f0 = uStack_6710;
        uStack_65e8 = uStack_6708;
        local_6820._0_4_ = (float)local_6820._0_4_ * (float)local_58c0;
        local_6820._4_4_ = (float)local_6820._4_4_ * local_58c0._4_4_;
        fVar175 = fVar175 * (float)uStack_58b8;
        fVar177 = fVar177 * uStack_58b8._4_4_;
        fVar178 = fVar178 * (float)uStack_58b0;
        fVar179 = fVar179 * uStack_58b0._4_4_;
        fVar180 = fVar180 * (float)uStack_58a8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3e53eb5a;
        auVar5 = _local_6820;
        local_6620 = local_6820;
        uStack_6618 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_6610 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_6608 = uStack_6808;
        local_6640 = CONCAT44(fStack_67fc,local_6800);
        uStack_6638 = CONCAT44(fStack_67f4,fStack_67f8);
        uStack_6630 = CONCAT44(fStack_67ec,fStack_67f0);
        uStack_6628 = CONCAT44(fStack_67e4,fStack_67e8);
        local_6820._0_4_ = (float)local_6820._0_4_ * local_6800;
        local_6820._4_4_ = (float)local_6820._4_4_ * fStack_67fc;
        fVar175 = fVar175 * fStack_67f8;
        fVar177 = fVar177 * fStack_67f4;
        fVar178 = fVar178 * fStack_67f0;
        fVar179 = fVar179 * fStack_67ec;
        fVar180 = fVar180 * fStack_67e8;
        uStack_6818._0_4_ = fVar175;
        uStack_6818._4_4_ = fVar177;
        uStack_6810._0_4_ = fVar178;
        uStack_6810._4_4_ = fVar179;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180;
        uStack_6808._4_4_ = 0x3e53eb5a;
        auVar5 = _local_6820;
        local_6660._0_4_ = local_67a0._0_4_;
        local_6660._4_4_ = local_67a0._4_4_;
        uStack_6658._0_4_ = local_67a0._8_4_;
        uStack_6658._4_4_ = local_67a0._12_4_;
        uStack_6650._0_4_ = local_67a0._16_4_;
        uStack_6650._4_4_ = local_67a0._20_4_;
        uStack_6648._0_4_ = local_67a0._24_4_;
        uStack_6648._4_4_ = local_67a0._28_4_;
        local_67e0._4_4_ = local_6660._4_4_ * -0.00021219444;
        local_67e0._0_4_ = (float)local_6660 * -0.00021219444;
        uStack_67d8._0_4_ = (float)uStack_6658 * -0.00021219444;
        uStack_67d8._4_4_ = uStack_6658._4_4_ * -0.00021219444;
        uStack_67d0._0_4_ = (float)uStack_6650 * -0.00021219444;
        uStack_67d0._4_4_ = uStack_6650._4_4_ * -0.00021219444;
        auVar172 = _local_67e0;
        uStack_67c8._0_4_ = (float)uStack_6648 * -0.00021219444;
        uStack_67c8._4_4_ = uStack_6648._4_4_;
        auVar4 = _local_67e0;
        local_5b00 = local_6820;
        uStack_5af8 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_5af0 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_5ae8 = uStack_6808;
        local_5b20 = local_67e0;
        uStack_5b18 = uStack_67d8;
        uStack_67d0 = auVar172._16_8_;
        uStack_5b10 = uStack_67d0;
        uStack_67c8 = auVar4._24_8_;
        uStack_5b08 = uStack_67c8;
        local_6820._4_4_ = (float)local_6820._4_4_ + local_6660._4_4_ * -0.00021219444;
        local_6820._0_4_ = (float)local_6820._0_4_ + (float)local_6660 * -0.00021219444;
        uStack_6818._0_4_ = fVar175 + (float)uStack_6658 * -0.00021219444;
        uStack_6818._4_4_ = fVar177 + uStack_6658._4_4_ * -0.00021219444;
        uStack_6810._0_4_ = fVar178 + (float)uStack_6650 * -0.00021219444;
        uStack_6810._4_4_ = fVar179 + uStack_6650._4_4_ * -0.00021219444;
        auVar167 = _local_6820;
        uStack_6808._0_4_ = fVar180 + (float)uStack_6648 * -0.00021219444;
        uStack_6808._4_4_ = uStack_6648._4_4_ + 0.20695248;
        auVar5 = _local_6820;
        local_66a0 = CONCAT44(fStack_67fc,local_6800);
        uStack_6698 = CONCAT44(fStack_67f4,fStack_67f8);
        uStack_6690 = CONCAT44(fStack_67ec,fStack_67f0);
        uStack_6688 = CONCAT44(fStack_67e4,fStack_67e8);
        local_67e0._4_4_ = fStack_67fc * 0.5;
        local_67e0._0_4_ = local_6800 * 0.5;
        uStack_67d8._0_4_ = fStack_67f8 * 0.5;
        uStack_67d8._4_4_ = fStack_67f4 * 0.5;
        uStack_67d0._0_4_ = fStack_67f0 * 0.5;
        uStack_67d0._4_4_ = fStack_67ec * 0.5;
        auVar172 = _local_67e0;
        uStack_67c8._0_4_ = fStack_67e8 * 0.5;
        uStack_67c8._4_4_ = fStack_67e4;
        auVar4 = _local_67e0;
        local_49a0 = local_6820;
        uStack_4998 = uStack_6818;
        uStack_6810 = auVar167._16_8_;
        uStack_4990 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uStack_4988 = uStack_6808;
        local_49c0 = local_67e0;
        uStack_49b8 = uStack_67d8;
        uStack_67d0 = auVar172._16_8_;
        uStack_49b0 = uStack_67d0;
        uStack_67c8 = auVar4._24_8_;
        uStack_49a8 = uStack_67c8;
        auVar41._16_8_ = uStack_6810;
        auVar41._0_16_ = _local_6820;
        auVar41._24_8_ = uStack_6808;
        auVar40._16_8_ = uStack_67d0;
        auVar40._0_16_ = _local_67e0;
        auVar40._24_8_ = uStack_67c8;
        auVar5 = vsubps_avx(auVar41,auVar40);
        local_66e0 = local_67a0;
        uStack_66d8 = uStack_6798;
        uStack_66d0 = uStack_6790;
        uStack_66c8 = uStack_6788;
        local_67e0._4_4_ = local_6660._4_4_ * 0.6933594;
        local_67e0._0_4_ = (float)local_6660 * 0.6933594;
        uStack_67d8._0_4_ = (float)uStack_6658 * 0.6933594;
        uStack_67d8._4_4_ = uStack_6658._4_4_ * 0.6933594;
        uStack_67d0._0_4_ = (float)uStack_6650 * 0.6933594;
        uStack_67d0._4_4_ = uStack_6650._4_4_ * 0.6933594;
        auVar167 = _local_67e0;
        uStack_67c8._0_4_ = (float)uStack_6648 * 0.6933594;
        uStack_67c8._4_4_ = uStack_6648._4_4_;
        auVar36 = _local_67e0;
        local_5b40 = local_6720;
        uStack_5b38 = uStack_6718;
        uStack_5b30 = uStack_6710;
        uStack_5b28 = uStack_6708;
        local_6820 = auVar5._0_8_;
        uVar23 = local_6820;
        uStack_6818 = auVar5._8_8_;
        uVar24 = uStack_6818;
        uStack_6810 = auVar5._16_8_;
        uVar25 = uStack_6810;
        uStack_6808 = auVar5._24_8_;
        uVar26 = uStack_6808;
        local_5b60._0_4_ = auVar5._0_4_;
        local_5b60._4_4_ = auVar5._4_4_;
        uStack_5b58._0_4_ = auVar5._8_4_;
        uStack_5b58._4_4_ = auVar5._12_4_;
        uStack_5b50._0_4_ = auVar5._16_4_;
        uStack_5b50._4_4_ = auVar5._20_4_;
        uStack_5b48._0_4_ = auVar5._24_4_;
        uStack_5b48._4_4_ = auVar5._28_4_;
        local_6720._4_4_ = local_58c0._4_4_ + local_5b60._4_4_;
        local_6720._0_4_ = (float)local_58c0 + (float)local_5b60;
        uStack_6718._0_4_ = (float)uStack_58b8 + (float)uStack_5b58;
        uStack_6718._4_4_ = uStack_58b8._4_4_ + uStack_5b58._4_4_;
        uStack_6710._0_4_ = (float)uStack_58b0 + (float)uStack_5b50;
        uStack_6710._4_4_ = uStack_58b0._4_4_ + uStack_5b50._4_4_;
        auVar172 = _local_6720;
        uStack_6708._0_4_ = (float)uStack_58a8 + (float)uStack_5b48;
        uStack_6708._4_4_ = fStack_67e4 + uStack_5b48._4_4_;
        auVar5 = _local_6720;
        local_5b80 = local_6720;
        uStack_5b78 = uStack_6718;
        uStack_6710 = auVar172._16_8_;
        uStack_5b70 = uStack_6710;
        uStack_6708 = auVar5._24_8_;
        uStack_5b68 = uStack_6708;
        local_5ba0 = local_67e0;
        uStack_5b98 = uStack_67d8;
        uStack_67d0 = auVar167._16_8_;
        uStack_5b90 = uStack_67d0;
        uStack_67c8 = auVar36._24_8_;
        uStack_5b88 = uStack_67c8;
        local_6720._4_4_ = local_58c0._4_4_ + local_5b60._4_4_ + local_6660._4_4_ * 0.6933594;
        local_6720._0_4_ = (float)local_58c0 + (float)local_5b60 + (float)local_6660 * 0.6933594;
        uStack_6718._0_4_ = (float)uStack_58b8 + (float)uStack_5b58 + (float)uStack_6658 * 0.6933594
        ;
        uStack_6718._4_4_ = uStack_58b8._4_4_ + uStack_5b58._4_4_ + uStack_6658._4_4_ * 0.6933594;
        uStack_6710._0_4_ = (float)uStack_58b0 + (float)uStack_5b50 + (float)uStack_6650 * 0.6933594
        ;
        uStack_6710._4_4_ = uStack_58b0._4_4_ + uStack_5b50._4_4_ + uStack_6650._4_4_ * 0.6933594;
        auVar167 = _local_6720;
        uStack_6708._0_4_ = (float)uStack_58a8 + (float)uStack_5b48 + (float)uStack_6648 * 0.6933594
        ;
        uStack_6708._4_4_ = fStack_67e4 + uStack_5b48._4_4_ + uStack_6648._4_4_;
        auVar37 = _local_6720;
        local_31a0 = local_6720;
        uStack_3198 = uStack_6718;
        uStack_6710 = auVar167._16_8_;
        uStack_3190 = uStack_6710;
        uStack_6708 = auVar37._24_8_;
        uStack_3188 = uStack_6708;
        local_31c0 = local_6780._0_8_;
        uStack_31b8 = local_6780._8_8_;
        uStack_31b0 = local_6780._16_8_;
        uStack_31a8 = local_6780._24_8_;
        auVar74._16_8_ = uStack_6710;
        auVar74._0_16_ = _local_6720;
        auVar74._24_8_ = uStack_6708;
        _local_6820 = vorps_avx(auVar74,local_6780);
        local_69a0 = local_6820;
        uStack_6998 = uStack_6818;
        uStack_6990 = uStack_6810;
        uStack_6988 = uStack_6808;
        local_4c0c = 0x3f800000;
        local_21e0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2200 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_21f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_69c0 = local_2200._0_8_;
        uStack_69b8 = local_2200._8_8_;
        uStack_69b0 = auStack_21f0._0_8_;
        uStack_69a8 = auStack_21f0._8_8_;
        local_4c10 = 0x40000000;
        local_21a0 = 0x40000000;
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        local_21c0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auStack_21b0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        local_69e0 = local_21c0._0_8_;
        uStack_69d8 = local_21c0._8_8_;
        uStack_69d0 = auStack_21b0._0_8_;
        uStack_69c8 = auStack_21b0._8_8_;
        local_6920._0_4_ = local_6820._0_4_;
        local_6920._4_4_ = local_6820._4_4_;
        uStack_6918._0_4_ = local_6820._8_4_;
        uStack_6918._4_4_ = local_6820._12_4_;
        uStack_6910._0_4_ = local_6820._16_4_;
        uStack_6910._4_4_ = local_6820._20_4_;
        uStack_6908._0_4_ = local_6820._24_4_;
        uStack_6908._4_4_ = local_6820._28_4_;
        uStack_40c4 = uStack_6908._4_4_;
        local_6940._0_4_ = local_21c0._0_4_;
        local_6940._4_4_ = local_21c0._4_4_;
        uStack_6938._0_4_ = local_21c0._8_4_;
        uStack_6938._4_4_ = local_21c0._12_4_;
        uStack_6930._0_4_ = auStack_21b0._0_4_;
        uStack_6930._4_4_ = auStack_21b0._4_4_;
        uStack_6928._0_4_ = auStack_21b0._8_4_;
        local_40e0 = (float)local_6920 * (float)local_6940;
        fStack_40dc = local_6920._4_4_ * local_6940._4_4_;
        fStack_40d8 = (float)uStack_6918 * (float)uStack_6938;
        fStack_40d4 = uStack_6918._4_4_ * uStack_6938._4_4_;
        fStack_40d0 = (float)uStack_6910 * (float)uStack_6930;
        fStack_40cc = uStack_6910._4_4_ * uStack_6930._4_4_;
        fStack_40c8 = (float)uStack_6908 * (float)uStack_6928;
        local_3a84 = 0x3f800000;
        local_22e0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2300 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_22f0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_4100 = local_2300._0_8_;
        uStack_40f8 = local_2300._8_8_;
        uStack_40f0 = auStack_22f0._0_8_;
        uStack_40e8 = auStack_22f0._8_8_;
        local_3960 = local_2300._0_8_;
        uStack_3958 = local_2300._8_8_;
        uStack_3950 = auStack_22f0._0_8_;
        uStack_3948 = auStack_22f0._8_8_;
        local_39a0 = 0;
        uStack_3998 = uStack_6db8;
        uStack_3990 = 0;
        uStack_3988 = 0;
        local_39c0 = CONCAT44(fStack_40dc,local_40e0);
        uStack_39b8 = CONCAT44(fStack_40d4,fStack_40d8);
        uStack_39b0 = CONCAT44(fStack_40cc,fStack_40d0);
        uStack_39a8 = CONCAT44(uStack_6908._4_4_,fStack_40c8);
        auVar52._8_8_ = uStack_39b8;
        auVar52._0_8_ = local_39c0;
        auVar52._16_8_ = uStack_39b0;
        auVar52._24_8_ = uStack_39a8;
        auVar5 = vsubps_avx(ZEXT832(uStack_6db8) << 0x40,auVar52);
        local_3900 = 0;
        uStack_38f8 = uStack_6db8;
        uStack_38f0 = 0;
        uStack_38e8 = 0;
        local_2bc0 = 0x7f0000007f;
        uStack_2bb8 = 0x7f0000007f;
        uStack_2bb0 = 0x7f0000007f;
        uStack_2ba8 = 0x7f0000007f;
        local_3f80._0_8_ = auVar5._0_8_;
        local_2de0 = local_3f80._0_8_;
        local_3f80._8_8_ = auVar5._8_8_;
        uStack_2dd8 = local_3f80._8_8_;
        local_3f80._16_8_ = auVar5._16_8_;
        uStack_2dd0 = local_3f80._16_8_;
        local_3f80._24_8_ = auVar5._24_8_;
        uStack_2dc8 = local_3f80._24_8_;
        auVar80._8_8_ = 0x42b0c0a542b0c0a5;
        auVar80._0_8_ = 0x42b0c0a542b0c0a5;
        auVar80._16_8_ = 0x42b0c0a542b0c0a5;
        auVar80._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar80);
        local_3f80._0_8_ = auVar5._0_8_;
        local_37e0 = local_3f80._0_8_;
        local_3f80._8_8_ = auVar5._8_8_;
        uStack_37d8 = local_3f80._8_8_;
        local_3f80._16_8_ = auVar5._16_8_;
        uStack_37d0 = local_3f80._16_8_;
        local_3f80._24_8_ = auVar5._24_8_;
        uStack_37c8 = local_3f80._24_8_;
        auVar56._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar56._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar56._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar56._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar56);
        local_3f80._0_8_ = auVar4._0_8_;
        uVar27 = local_3f80._0_8_;
        local_3f80._8_8_ = auVar4._8_8_;
        uVar28 = local_3f80._8_8_;
        local_3f80._16_8_ = auVar4._16_8_;
        uVar29 = local_3f80._16_8_;
        local_3f80._24_8_ = auVar4._24_8_;
        uVar30 = local_3f80._24_8_;
        local_3cc0._0_4_ = auVar4._0_4_;
        local_3cc0._4_4_ = auVar4._4_4_;
        uStack_3cb8._0_4_ = auVar4._8_4_;
        uStack_3cb8._4_4_ = auVar4._12_4_;
        uStack_3cb0._0_4_ = auVar4._16_4_;
        uStack_3cb0._4_4_ = auVar4._20_4_;
        uStack_3ca8._0_4_ = auVar4._24_4_;
        uStack_3ca8._4_4_ = auVar4._28_4_;
        local_3fc0._4_4_ = local_3cc0._4_4_ * 1.442695;
        local_3fc0._0_4_ = (float)local_3cc0 * 1.442695;
        uStack_3fb8._0_4_ = (float)uStack_3cb8 * 1.442695;
        uStack_3fb8._4_4_ = uStack_3cb8._4_4_ * 1.442695;
        uStack_3fb0._0_4_ = (float)uStack_3cb0 * 1.442695;
        uStack_3fb0._4_4_ = uStack_3cb0._4_4_ * 1.442695;
        auVar167 = _local_3fc0;
        uStack_3fa8._0_4_ = (float)uStack_3ca8 * 1.442695;
        uStack_3fa8._4_4_ = uStack_3ca8._4_4_;
        auVar5 = _local_3fc0;
        local_3ac0 = local_3fc0;
        uStack_3ab8 = uStack_3fb8;
        uStack_3fb0 = auVar167._16_8_;
        uStack_3ab0 = uStack_3fb0;
        uStack_3fa8 = auVar5._24_8_;
        uStack_3aa8 = uStack_3fa8;
        local_3fc0._4_4_ = local_3cc0._4_4_ * 1.442695 + 0.5;
        local_3fc0._0_4_ = (float)local_3cc0 * 1.442695 + 0.5;
        uStack_3fb8._0_4_ = (float)uStack_3cb8 * 1.442695 + 0.5;
        uStack_3fb8._4_4_ = uStack_3cb8._4_4_ * 1.442695 + 0.5;
        uStack_3fb0._0_4_ = (float)uStack_3cb0 * 1.442695 + 0.5;
        uStack_3fb0._4_4_ = uStack_3cb0._4_4_ * 1.442695 + 0.5;
        uStack_3fa8._0_4_ = (float)uStack_3ca8 * 1.442695 + 0.5;
        uStack_3fa8._4_4_ = uStack_3ca8._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_3fc0,1);
        auVar5 = vcmpps_avx(_local_3fc0,auVar6,1);
        local_4020._0_8_ = auVar5._0_8_;
        local_34a0 = local_4020._0_8_;
        local_4020._8_8_ = auVar5._8_8_;
        uStack_3498 = local_4020._8_8_;
        local_4020._16_8_ = auVar5._16_8_;
        uStack_3490 = local_4020._16_8_;
        local_4020._24_8_ = auVar5._24_8_;
        uStack_3488 = local_4020._24_8_;
        local_34c0 = 0x3f8000003f800000;
        uStack_34b8 = 0x3f8000003f800000;
        uStack_34b0 = 0x3f8000003f800000;
        uStack_34a8 = 0x3f8000003f800000;
        auVar64._8_8_ = 0x3f8000003f800000;
        auVar64._0_8_ = 0x3f8000003f800000;
        auVar64._16_8_ = 0x3f8000003f800000;
        auVar64._24_8_ = 0x3f8000003f800000;
        local_4020 = vandps_avx(auVar5,auVar64);
        local_3fa0 = auVar6._0_8_;
        local_39e0 = local_3fa0;
        uStack_3f98 = auVar6._8_8_;
        uStack_39d8 = uStack_3f98;
        uStack_3f90 = auVar6._16_8_;
        uStack_39d0 = uStack_3f90;
        uStack_3f88 = auVar6._24_8_;
        uStack_39c8 = uStack_3f88;
        local_3a00 = local_4020._0_8_;
        uStack_39f8 = local_4020._8_8_;
        uStack_39f0 = local_4020._16_8_;
        uStack_39e8 = local_4020._24_8_;
        _local_3fc0 = vsubps_avx(auVar6,local_4020);
        local_3d00._0_4_ = local_3fc0._0_4_;
        local_3d00._4_4_ = local_3fc0._4_4_;
        uStack_3cf8._0_4_ = local_3fc0._8_4_;
        uStack_3cf8._4_4_ = local_3fc0._12_4_;
        uStack_3cf0._0_4_ = local_3fc0._16_4_;
        uStack_3cf0._4_4_ = local_3fc0._20_4_;
        uStack_3ce8._0_4_ = local_3fc0._24_4_;
        uStack_3ce8._4_4_ = local_3fc0._28_4_;
        local_3fa0._4_4_ = local_3d00._4_4_ * 0.6933594;
        local_3fa0._0_4_ = (float)local_3d00 * 0.6933594;
        uStack_3f98._0_4_ = (float)uStack_3cf8 * 0.6933594;
        uStack_3f98._4_4_ = uStack_3cf8._4_4_ * 0.6933594;
        uStack_3f90._0_4_ = (float)uStack_3cf0 * 0.6933594;
        uStack_3f90._4_4_ = uStack_3cf0._4_4_ * 0.6933594;
        auVar167 = _local_3fa0;
        uStack_3f88._0_4_ = (float)uStack_3ce8 * 0.6933594;
        uStack_3f88._4_4_ = uStack_3ce8._4_4_;
        auVar6 = _local_3fa0;
        local_3d40 = local_3fc0;
        uStack_3d38 = uStack_3fb8;
        uStack_3d30 = uStack_3fb0;
        uStack_3d28 = uStack_3fa8;
        local_3a20 = local_3f80._0_8_;
        uStack_3a18 = local_3f80._8_8_;
        uStack_3a10 = local_3f80._16_8_;
        uStack_3a08 = local_3f80._24_8_;
        local_3a40 = local_3fa0;
        uStack_3a38 = uStack_3f98;
        uStack_3f90 = auVar167._16_8_;
        uStack_3a30 = uStack_3f90;
        uStack_3f88 = auVar6._24_8_;
        uStack_3a28 = uStack_3f88;
        auVar51._16_8_ = uStack_3f90;
        auVar51._0_16_ = _local_3fa0;
        auVar51._24_8_ = uStack_3f88;
        auVar5 = vsubps_avx(auVar4,auVar51);
        local_3f80._0_8_ = auVar5._0_8_;
        local_3a60 = local_3f80._0_8_;
        local_3f80._8_8_ = auVar5._8_8_;
        uStack_3a58 = local_3f80._8_8_;
        local_3f80._16_8_ = auVar5._16_8_;
        uStack_3a50 = local_3f80._16_8_;
        local_3f80._24_8_ = auVar5._24_8_;
        uStack_3a48 = local_3f80._24_8_;
        local_3a80 = CONCAT44(local_3d00._4_4_ * -0.00021219444,(float)local_3d00 * -0.00021219444);
        uStack_3a78 = CONCAT44(uStack_3cf8._4_4_ * -0.00021219444,
                               (float)uStack_3cf8 * -0.00021219444);
        uStack_3a70 = CONCAT44(uStack_3cf0._4_4_ * -0.00021219444,
                               (float)uStack_3cf0 * -0.00021219444);
        uStack_3a68 = CONCAT44(uStack_3ce8._4_4_,(float)uStack_3ce8 * -0.00021219444);
        auVar50._8_8_ = uStack_3a78;
        auVar50._0_8_ = local_3a80;
        auVar50._16_8_ = uStack_3a70;
        auVar50._24_8_ = uStack_3a68;
        local_3f80 = vsubps_avx(auVar5,auVar50);
        local_3da0 = local_3f80._0_8_;
        uStack_3d98 = local_3f80._8_8_;
        uStack_3d90 = local_3f80._16_8_;
        uStack_3d88 = local_3f80._24_8_;
        local_3d80._0_4_ = local_3f80._0_4_;
        local_3d80._4_4_ = local_3f80._4_4_;
        uStack_3d78._0_4_ = local_3f80._8_4_;
        uStack_3d78._4_4_ = local_3f80._12_4_;
        uStack_3d70._0_4_ = local_3f80._16_4_;
        uStack_3d70._4_4_ = local_3f80._20_4_;
        uStack_3d68._0_4_ = local_3f80._24_4_;
        uStack_3d68._4_4_ = local_3f80._28_4_;
        fStack_4024 = uStack_3d68._4_4_;
        local_4040 = (float)local_3d80 * (float)local_3d80;
        fStack_403c = local_3d80._4_4_ * local_3d80._4_4_;
        fStack_4038 = (float)uStack_3d78 * (float)uStack_3d78;
        fStack_4034 = uStack_3d78._4_4_ * uStack_3d78._4_4_;
        fStack_4030 = (float)uStack_3d70 * (float)uStack_3d70;
        fStack_402c = uStack_3d70._4_4_ * uStack_3d70._4_4_;
        fStack_4028 = (float)uStack_3d68 * (float)uStack_3d68;
        local_3dc0 = 0x3950696739506967;
        uStack_3db8 = 0x3950696739506967;
        uStack_3db0 = 0x3950696739506967;
        uStack_3da8 = 0x3950696739506967;
        local_3de0 = local_3f80._0_8_;
        uStack_3dd8 = local_3f80._8_8_;
        uStack_3dd0 = local_3f80._16_8_;
        uStack_3dc8 = local_3f80._24_8_;
        local_4060 = CONCAT44(local_3d80._4_4_ * 0.00019875691,(float)local_3d80 * 0.00019875691);
        uStack_4058 = CONCAT44(uStack_3d78._4_4_ * 0.00019875691,(float)uStack_3d78 * 0.00019875691)
        ;
        uStack_4050 = CONCAT44(uStack_3d70._4_4_ * 0.00019875691,(float)uStack_3d70 * 0.00019875691)
        ;
        uStack_4048 = CONCAT44(0x39506967,(float)uStack_3d68 * 0.00019875691);
        local_3b00 = local_4060;
        uStack_3af8 = uStack_4058;
        uStack_3af0 = uStack_4050;
        uStack_3ae8 = uStack_4048;
        local_3980 = (float)local_3d80 * 0.00019875691 + 0.0013981999;
        fStack_397c = local_3d80._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3978 = (float)uStack_3d78 * 0.00019875691 + 0.0013981999;
        fStack_3974 = uStack_3d78._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3970 = (float)uStack_3d70 * 0.00019875691 + 0.0013981999;
        fStack_396c = uStack_3d70._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3968 = (float)uStack_3d68 * 0.00019875691 + 0.0013981999;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3ad150fb,fStack_3968);
        local_3e00 = local_4060;
        uStack_3df8 = uStack_4058;
        uStack_3df0 = uStack_4050;
        uStack_3de8 = uStack_4048;
        local_3e20 = local_3f80._0_8_;
        uStack_3e18 = local_3f80._8_8_;
        uStack_3e10 = local_3f80._16_8_;
        uStack_3e08 = local_3f80._24_8_;
        local_3980 = local_3980 * (float)local_3d80;
        fStack_397c = fStack_397c * local_3d80._4_4_;
        fStack_3978 = fStack_3978 * (float)uStack_3d78;
        fStack_3974 = fStack_3974 * uStack_3d78._4_4_;
        fStack_3970 = fStack_3970 * (float)uStack_3d70;
        fStack_396c = fStack_396c * uStack_3d70._4_4_;
        fStack_3968 = fStack_3968 * (float)uStack_3d68;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3ad150fb,fStack_3968);
        local_3b40 = local_4060;
        uStack_3b38 = uStack_4058;
        uStack_3b30 = uStack_4050;
        uStack_3b28 = uStack_4048;
        local_3980 = local_3980 + 0.008333452;
        fStack_397c = fStack_397c + 0.008333452;
        fStack_3978 = fStack_3978 + 0.008333452;
        fStack_3974 = fStack_3974 + 0.008333452;
        fStack_3970 = fStack_3970 + 0.008333452;
        fStack_396c = fStack_396c + 0.008333452;
        fStack_3968 = fStack_3968 + 0.008333452;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3c22b327,fStack_3968);
        local_3e40 = local_4060;
        uStack_3e38 = uStack_4058;
        uStack_3e30 = uStack_4050;
        uStack_3e28 = uStack_4048;
        local_3e60 = local_3f80._0_8_;
        uStack_3e58 = local_3f80._8_8_;
        uStack_3e50 = local_3f80._16_8_;
        uStack_3e48 = local_3f80._24_8_;
        local_3980 = (float)local_3d80 * local_3980;
        fStack_397c = local_3d80._4_4_ * fStack_397c;
        fStack_3978 = (float)uStack_3d78 * fStack_3978;
        fStack_3974 = uStack_3d78._4_4_ * fStack_3974;
        fStack_3970 = (float)uStack_3d70 * fStack_3970;
        fStack_396c = uStack_3d70._4_4_ * fStack_396c;
        fStack_3968 = (float)uStack_3d68 * fStack_3968;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3c22b327,fStack_3968);
        local_3b80 = local_4060;
        uStack_3b78 = uStack_4058;
        uStack_3b70 = uStack_4050;
        uStack_3b68 = uStack_4048;
        local_3980 = local_3980 + 0.041665796;
        fStack_397c = fStack_397c + 0.041665796;
        fStack_3978 = fStack_3978 + 0.041665796;
        fStack_3974 = fStack_3974 + 0.041665796;
        fStack_3970 = fStack_3970 + 0.041665796;
        fStack_396c = fStack_396c + 0.041665796;
        fStack_3968 = fStack_3968 + 0.041665796;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3d53568b,fStack_3968);
        local_3e80 = local_4060;
        uStack_3e78 = uStack_4058;
        uStack_3e70 = uStack_4050;
        uStack_3e68 = uStack_4048;
        local_3ea0 = local_3f80._0_8_;
        uStack_3e98 = local_3f80._8_8_;
        uStack_3e90 = local_3f80._16_8_;
        uStack_3e88 = local_3f80._24_8_;
        local_3980 = local_3980 * (float)local_3d80;
        fStack_397c = fStack_397c * local_3d80._4_4_;
        fStack_3978 = fStack_3978 * (float)uStack_3d78;
        fStack_3974 = fStack_3974 * uStack_3d78._4_4_;
        fStack_3970 = fStack_3970 * (float)uStack_3d70;
        fStack_396c = fStack_396c * uStack_3d70._4_4_;
        fStack_3968 = fStack_3968 * (float)uStack_3d68;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3d53568b,fStack_3968);
        local_3bc0 = local_4060;
        uStack_3bb8 = uStack_4058;
        uStack_3bb0 = uStack_4050;
        uStack_3ba8 = uStack_4048;
        local_3980 = local_3980 + 0.16666666;
        fStack_397c = fStack_397c + 0.16666666;
        fStack_3978 = fStack_3978 + 0.16666666;
        fStack_3974 = fStack_3974 + 0.16666666;
        fStack_3970 = fStack_3970 + 0.16666666;
        fStack_396c = fStack_396c + 0.16666666;
        fStack_3968 = fStack_3968 + 0.16666666;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3e5f804d,fStack_3968);
        local_3ec0 = local_4060;
        uStack_3eb8 = uStack_4058;
        uStack_3eb0 = uStack_4050;
        uStack_3ea8 = uStack_4048;
        local_3ee0 = local_3f80._0_8_;
        uStack_3ed8 = local_3f80._8_8_;
        uStack_3ed0 = local_3f80._16_8_;
        uStack_3ec8 = local_3f80._24_8_;
        local_3980 = local_3980 * (float)local_3d80;
        fStack_397c = fStack_397c * local_3d80._4_4_;
        fStack_3978 = fStack_3978 * (float)uStack_3d78;
        fStack_3974 = fStack_3974 * uStack_3d78._4_4_;
        fStack_3970 = fStack_3970 * (float)uStack_3d70;
        fStack_396c = fStack_396c * uStack_3d70._4_4_;
        fStack_3968 = fStack_3968 * (float)uStack_3d68;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3e5f804d,fStack_3968);
        local_3c00 = local_4060;
        uStack_3bf8 = uStack_4058;
        uStack_3bf0 = uStack_4050;
        uStack_3be8 = uStack_4048;
        local_3980 = local_3980 + 0.5;
        fStack_397c = fStack_397c + 0.5;
        fStack_3978 = fStack_3978 + 0.5;
        fStack_3974 = fStack_3974 + 0.5;
        fStack_3970 = fStack_3970 + 0.5;
        fStack_396c = fStack_396c + 0.5;
        fStack_3968 = fStack_3968 + 0.5;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3f37e013,fStack_3968);
        local_3f00 = local_4060;
        uStack_3ef8 = uStack_4058;
        uStack_3ef0 = uStack_4050;
        uStack_3ee8 = uStack_4048;
        local_3f20 = CONCAT44(fStack_403c,local_4040);
        uStack_3f18 = CONCAT44(fStack_4034,fStack_4038);
        uStack_3f10 = CONCAT44(fStack_402c,fStack_4030);
        uStack_3f08 = CONCAT44(uStack_3d68._4_4_,fStack_4028);
        local_3980 = local_3980 * local_4040;
        fStack_397c = fStack_397c * fStack_403c;
        fStack_3978 = fStack_3978 * fStack_4038;
        fStack_3974 = fStack_3974 * fStack_4034;
        fStack_3970 = fStack_3970 * fStack_4030;
        fStack_396c = fStack_396c * fStack_402c;
        fStack_3968 = fStack_3968 * fStack_4028;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(0x3f37e013,fStack_3968);
        local_3c40 = local_4060;
        uStack_3c38 = uStack_4058;
        uStack_3c30 = uStack_4050;
        uStack_3c28 = uStack_4048;
        local_3c60 = local_3f80._0_8_;
        uStack_3c58 = local_3f80._8_8_;
        uStack_3c50 = local_3f80._16_8_;
        uStack_3c48 = local_3f80._24_8_;
        local_3980 = local_3980 + (float)local_3d80;
        fStack_397c = fStack_397c + local_3d80._4_4_;
        fStack_3978 = fStack_3978 + (float)uStack_3d78;
        fStack_3974 = fStack_3974 + uStack_3d78._4_4_;
        fStack_3970 = fStack_3970 + (float)uStack_3d70;
        fStack_396c = fStack_396c + uStack_3d70._4_4_;
        fStack_3968 = fStack_3968 + (float)uStack_3d68;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(uStack_3d68._4_4_ + 0.71826285,fStack_3968);
        local_3c80 = local_4060;
        uStack_3c78 = uStack_4058;
        uStack_3c70 = uStack_4050;
        uStack_3c68 = uStack_4048;
        local_3ca0 = 0x3f8000003f800000;
        uStack_3c98 = 0x3f8000003f800000;
        uStack_3c90 = 0x3f8000003f800000;
        uStack_3c88 = 0x3f8000003f800000;
        local_3980 = local_3980 + 1.0;
        fStack_397c = fStack_397c + 1.0;
        fStack_3978 = fStack_3978 + 1.0;
        fStack_3974 = fStack_3974 + 1.0;
        fStack_3970 = fStack_3970 + 1.0;
        fStack_396c = fStack_396c + 1.0;
        fStack_3968 = fStack_3968 + 1.0;
        fStack_3964 = uStack_3d68._4_4_ + 0.71826285 + 1.0;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(fStack_3964,fStack_3968);
        local_2d00 = local_3fc0;
        uStack_2cf8 = uStack_3fb8;
        uStack_2cf0 = uStack_3fb0;
        uStack_2ce8 = uStack_3fa8;
        local_3fe0 = CONCAT44((int)local_3d00._4_4_,(int)(float)local_3d00);
        uStack_3fd8 = CONCAT44((int)uStack_3cf8._4_4_,(int)(float)uStack_3cf8);
        uStack_3fd0 = CONCAT44((int)uStack_3cf0._4_4_,(int)(float)uStack_3cf0);
        uStack_3fc8 = CONCAT44((int)uStack_3ce8._4_4_,(int)(float)uStack_3ce8);
        local_2ba0 = local_3fe0;
        uStack_2b98 = uStack_3fd8;
        uStack_2b90 = uStack_3fd0;
        uStack_2b88 = uStack_3fc8;
        local_2c40 = local_3fe0;
        uStack_2c38 = uStack_3fd8;
        uStack_2c30 = uStack_3fd0;
        uStack_2c28 = uStack_3fc8;
        local_2c60 = 0x7f0000007f;
        uStack_2c58 = 0x7f0000007f;
        uStack_2c50 = 0x7f0000007f;
        uStack_2c48 = 0x7f0000007f;
        local_2bf0 = 0x7f0000007f;
        uStack_2be8 = 0x7f0000007f;
        local_2c00 = 0x7f0000007f;
        uStack_2bf8 = 0x7f0000007f;
        local_2410 = local_3fe0;
        uStack_2408 = uStack_3fd8;
        local_2420 = 0x7f0000007f;
        uStack_2418 = 0x7f0000007f;
        auVar98._8_8_ = uStack_3fd8;
        auVar98._0_8_ = local_3fe0;
        auVar97._8_8_ = 0x7f0000007f;
        auVar97._0_8_ = 0x7f0000007f;
        local_2bd0 = vpaddd_avx(auVar98,auVar97);
        local_2430 = uStack_3fd0;
        uStack_2428 = uStack_3fc8;
        local_2440 = 0x7f0000007f;
        uStack_2438 = 0x7f0000007f;
        auVar96._8_8_ = uStack_3fc8;
        auVar96._0_8_ = uStack_3fd0;
        auVar95._8_8_ = 0x7f0000007f;
        auVar95._0_8_ = 0x7f0000007f;
        local_2be0 = vpaddd_avx(auVar96,auVar95);
        local_2c80 = local_2bd0._0_8_;
        uStack_2c78 = local_2bd0._8_8_;
        uStack_2c70 = local_2be0._0_8_;
        uStack_2c68 = local_2be0._8_8_;
        local_2c20 = local_2bd0._0_8_;
        uStack_2c18 = local_2bd0._8_8_;
        uStack_2c10 = local_2be0._0_8_;
        uStack_2c08 = local_2be0._8_8_;
        local_27e0 = local_2bd0._0_8_;
        uStack_27d8 = local_2bd0._8_8_;
        uStack_27d0 = local_2be0._0_8_;
        uStack_27c8 = local_2be0._8_8_;
        local_27e4 = 0x17;
        local_2860 = local_2bd0._0_8_;
        uStack_2858 = local_2bd0._8_8_;
        uStack_2850 = local_2be0._0_8_;
        uStack_2848 = local_2be0._8_8_;
        local_2310 = local_2bd0._0_8_;
        uStack_2308 = local_2bd0._8_8_;
        local_2314 = 0x17;
        local_2800 = vpslld_avx(local_2bd0,ZEXT416(0x17));
        local_2330 = local_2be0._0_8_;
        uStack_2328 = local_2be0._8_8_;
        local_2334 = 0x17;
        local_2810 = vpslld_avx(local_2be0,ZEXT416(0x17));
        local_2880 = local_2800._0_8_;
        uStack_2878 = local_2800._8_8_;
        uStack_2870 = local_2810._0_8_;
        uStack_2868 = local_2810._8_8_;
        local_2840 = local_2800._0_8_;
        uStack_2838 = local_2800._8_8_;
        uStack_2830 = local_2810._0_8_;
        uStack_2828 = local_2810._8_8_;
        local_3fe0 = local_2800._0_8_;
        uStack_3fd8 = local_2800._8_8_;
        uStack_3fd0 = local_2810._0_8_;
        uStack_3fc8 = local_2810._8_8_;
        local_2580 = local_2800._0_8_;
        uStack_2578 = local_2800._8_8_;
        uStack_2570 = local_2810._0_8_;
        uStack_2568 = local_2810._8_8_;
        local_4080 = local_2800._0_8_;
        uStack_4078 = local_2800._8_8_;
        uStack_4070 = local_2810._0_8_;
        uStack_4068 = local_2810._8_8_;
        local_3f40 = local_4060;
        uStack_3f38 = uStack_4058;
        uStack_3f30 = uStack_4050;
        uStack_3f28 = uStack_4048;
        local_3f60._0_4_ = local_2800._0_4_;
        local_3f60._4_4_ = local_2800._4_4_;
        uStack_3f58._0_4_ = local_2800._8_4_;
        uStack_3f58._4_4_ = local_2800._12_4_;
        uStack_3f50._0_4_ = local_2810._0_4_;
        uStack_3f50._4_4_ = local_2810._4_4_;
        uStack_3f48._0_4_ = local_2810._8_4_;
        local_3980 = local_3980 * (float)local_3f60;
        fStack_397c = fStack_397c * local_3f60._4_4_;
        fStack_3978 = fStack_3978 * (float)uStack_3f58;
        fStack_3974 = fStack_3974 * uStack_3f58._4_4_;
        fStack_3970 = fStack_3970 * (float)uStack_3f50;
        fStack_396c = fStack_396c * uStack_3f50._4_4_;
        fStack_3968 = fStack_3968 * (float)uStack_3f48;
        local_4060 = CONCAT44(fStack_397c,local_3980);
        uStack_4058 = CONCAT44(fStack_3974,fStack_3978);
        uStack_4050 = CONCAT44(fStack_396c,fStack_3970);
        uStack_4048 = CONCAT44(fStack_3964,fStack_3968);
        local_40c0 = local_4060;
        uStack_40b8 = uStack_4058;
        uStack_40b0 = uStack_4050;
        uStack_40a8 = uStack_4048;
        local_40a0._0_4_ = local_2300._0_4_;
        local_40a0._4_4_ = local_2300._4_4_;
        uStack_4098._0_4_ = local_2300._8_4_;
        uStack_4098._4_4_ = local_2300._12_4_;
        uStack_4090._0_4_ = auStack_22f0._0_4_;
        uStack_4090._4_4_ = auStack_22f0._4_4_;
        uStack_4088._0_4_ = auStack_22f0._8_4_;
        uStack_4088._4_4_ = auStack_22f0._12_4_;
        local_3980 = (float)local_40a0 + local_3980;
        fStack_397c = local_40a0._4_4_ + fStack_397c;
        fStack_3978 = (float)uStack_4098 + fStack_3978;
        fStack_3974 = uStack_4098._4_4_ + fStack_3974;
        fStack_3970 = (float)uStack_4090 + fStack_3970;
        fStack_396c = uStack_4090._4_4_ + fStack_396c;
        fStack_3968 = (float)uStack_4088 + fStack_3968;
        fStack_3964 = uStack_4088._4_4_ + fStack_3964;
        auVar54._16_8_ = auStack_22f0._0_8_;
        auVar54._0_16_ = local_2300;
        auVar54._24_8_ = auStack_22f0._8_8_;
        auVar53._4_4_ = fStack_397c;
        auVar53._0_4_ = local_3980;
        auVar53._8_4_ = fStack_3978;
        auVar53._12_4_ = fStack_3974;
        auVar53._16_4_ = fStack_3970;
        auVar53._20_4_ = fStack_396c;
        auVar53._24_4_ = fStack_3968;
        auVar53._28_4_ = fStack_3964;
        _local_6960 = vdivps_avx(auVar54,auVar53);
        local_6980 = local_21c0._0_8_;
        uStack_6978 = local_21c0._8_8_;
        uStack_6970 = auStack_21b0._0_8_;
        uStack_6968 = auStack_21b0._8_8_;
        local_48a0 = (float)local_6960._0_4_ * (float)local_6940;
        fStack_489c = (float)local_6960._4_4_ * local_6940._4_4_;
        fStack_4898 = fStack_6958 * (float)uStack_6938;
        fStack_4894 = fStack_6954 * uStack_6938._4_4_;
        fStack_4890 = fStack_6950 * (float)uStack_6930;
        fStack_488c = fStack_694c * uStack_6930._4_4_;
        uStack_4884 = local_6960._28_4_;
        fStack_4888 = fStack_6948 * (float)uStack_6928;
        local_48c0 = local_2200._0_8_;
        uStack_48b8 = local_2200._8_8_;
        uStack_48b0 = auStack_21f0._0_8_;
        uStack_48a8 = auStack_21f0._8_8_;
        auVar46._4_4_ = fStack_489c;
        auVar46._0_4_ = local_48a0;
        auVar46._8_4_ = fStack_4898;
        auVar46._12_4_ = fStack_4894;
        auVar46._16_4_ = fStack_4890;
        auVar46._20_4_ = fStack_488c;
        auVar46._24_4_ = fStack_4888;
        auVar46._28_4_ = uStack_4884;
        auVar45._16_8_ = auStack_21f0._0_8_;
        auVar45._0_16_ = local_2200;
        auVar45._24_8_ = auStack_21f0._8_8_;
        _local_6a60 = vsubps_avx(auVar46,auVar45);
        local_6a40._0_4_ = (float)local_6b60;
        local_6a40._4_4_ = (float)((ulong)local_6b60 >> 0x20);
        uStack_6a38._0_4_ = (float)uStack_6b58;
        uStack_6a38._4_4_ = (float)((ulong)uStack_6b58 >> 0x20);
        uStack_6a30._0_4_ = (float)uStack_6b50;
        uStack_6a30._4_4_ = (float)((ulong)uStack_6b50 >> 0x20);
        uStack_6a28._0_4_ = (float)uStack_6b48;
        uStack_6a28._4_4_ = (undefined4)((ulong)uStack_6b48 >> 0x20);
        local_6c60 = CONCAT44(local_6a40._4_4_ * (float)local_6a60._4_4_,
                              (float)local_6a40 * (float)local_6a60._0_4_);
        uStack_6c58 = CONCAT44(uStack_6a38._4_4_ * fStack_6a54,(float)uStack_6a38 * fStack_6a58);
        uStack_6c50 = CONCAT44(uStack_6a30._4_4_ * fStack_6a4c,(float)uStack_6a30 * fStack_6a50);
        uStack_6c48 = CONCAT44(uStack_6a28._4_4_,(float)uStack_6a28 * fStack_6a48);
        local_6ad8 = local_6bd0;
        local_6b00 = local_6c60;
        uStack_6af8 = uStack_6c58;
        uStack_6af0 = uStack_6c50;
        uStack_6ae8 = uStack_6c48;
        auVar31._8_8_ = uStack_6c58;
        auVar31._0_8_ = local_6c60;
        auVar31._16_8_ = uStack_6c50;
        auVar31._24_8_ = uStack_6c48;
        *local_6bd0 = auVar31;
        local_6bd0 = local_6bd0 + 1;
        local_6a40 = local_6b60;
        uStack_6a38 = uStack_6b58;
        uStack_6a30 = uStack_6b50;
        uStack_6a28 = uStack_6b48;
        local_6940 = local_21c0._0_8_;
        uStack_6938 = local_21c0._8_8_;
        uStack_6930 = auStack_21b0._0_8_;
        uStack_6928 = auStack_21b0._8_8_;
        local_6920 = local_6820;
        uStack_6918 = uStack_6818;
        uStack_6910 = uStack_6810;
        uStack_6908 = uStack_6808;
        _local_67e0 = auVar36;
        _local_6720 = auVar37;
        local_6660 = local_67a0;
        uStack_6658 = uStack_6798;
        uStack_6650 = uStack_6790;
        uStack_6648 = uStack_6788;
        local_63a0 = local_63c0;
        uStack_6398 = uStack_63b8;
        uStack_6390 = uStack_63b0;
        uStack_6388 = uStack_63a8;
        local_5b60 = uVar23;
        uStack_5b58 = uVar24;
        uStack_5b50 = uVar25;
        uStack_5b48 = uVar26;
        local_58e0 = uVar19;
        uStack_58d8 = uVar20;
        uStack_58d0 = uVar21;
        uStack_58c8 = uVar22;
        local_58c0 = uVar15;
        uStack_58b8 = uVar16;
        uStack_58b0 = uVar17;
        uStack_58a8 = uVar18;
        local_5880 = uVar11;
        uStack_5878 = uVar12;
        uStack_5870 = uVar13;
        uStack_5868 = uVar14;
        local_5860 = local_2240._0_8_;
        uStack_5858 = local_2240._8_8_;
        uStack_5850 = auStack_2230._0_8_;
        uStack_5848 = auStack_2230._8_8_;
        local_5760 = local_6760;
        uStack_5758 = uStack_6758;
        uStack_5750 = uStack_6750;
        uStack_5748 = uStack_6748;
        _local_5700 = auVar38;
        local_56c0 = local_25c0._0_8_;
        uStack_56b8 = local_25c0._8_8_;
        uStack_56b0 = local_25d0._0_8_;
        uStack_56a8 = local_25d0._8_8_;
        local_54e0 = local_5500;
        uStack_54d8 = uStack_54f8;
        uStack_54d0 = uStack_54f0;
        uStack_54c8 = uStack_54e8;
        local_54c0 = local_6680;
        uStack_54b8 = uStack_6678;
        uStack_54b0 = uStack_6670;
        uStack_54a8 = uStack_6668;
        local_5480 = local_6700;
        uStack_5478 = uStack_66f8;
        uStack_5470 = uStack_66f0;
        uStack_5468 = uStack_66e8;
        local_5460 = local_5720;
        uStack_5458 = uStack_5718;
        uStack_5450 = uStack_5710;
        uStack_5448 = uStack_5708;
        local_5420 = uVar7;
        uStack_5418 = uVar8;
        uStack_5410 = uVar9;
        uStack_5408 = uVar10;
        local_5380 = local_66c0;
        uStack_5378 = uStack_66b8;
        uStack_5370 = uStack_66b0;
        uStack_5368 = uStack_66a8;
        local_5240 = local_66c0;
        uStack_5238 = uStack_66b8;
        uStack_5230 = uStack_66b0;
        uStack_5228 = uStack_66a8;
        local_40a0 = local_3960;
        uStack_4098 = uStack_3958;
        uStack_4090 = uStack_3950;
        uStack_4088 = uStack_3948;
        local_4000 = local_6760;
        uStack_3ff8 = uStack_6758;
        uStack_3ff0 = uStack_6750;
        uStack_3fe8 = uStack_6748;
        _local_3fa0 = auVar6;
        local_3f60 = local_2800._0_8_;
        uStack_3f58 = local_2800._8_8_;
        uStack_3f50 = local_2810._0_8_;
        uStack_3f48 = local_2810._8_8_;
        local_3d80 = local_3da0;
        uStack_3d78 = uStack_3d98;
        uStack_3d70 = uStack_3d90;
        uStack_3d68 = uStack_3d88;
        local_3d60 = local_6680;
        uStack_3d58 = uStack_6678;
        uStack_3d50 = uStack_6670;
        uStack_3d48 = uStack_6668;
        local_3d20 = local_6700;
        uStack_3d18 = uStack_66f8;
        uStack_3d10 = uStack_66f0;
        uStack_3d08 = uStack_66e8;
        local_3d00 = local_3fc0;
        uStack_3cf8 = uStack_3fb8;
        uStack_3cf0 = uStack_3fb0;
        uStack_3ce8 = uStack_3fa8;
        local_3ce0 = local_5440;
        uStack_3cd8 = uStack_5438;
        uStack_3cd0 = uStack_5430;
        uStack_3cc8 = uStack_5428;
        local_3cc0 = uVar27;
        uStack_3cb8 = uVar28;
        uStack_3cb0 = uVar29;
        uStack_3ca8 = uVar30;
        local_3c20 = local_66c0;
        uStack_3c18 = uStack_66b8;
        uStack_3c10 = uStack_66b0;
        uStack_3c08 = uStack_66a8;
        local_3be0 = local_5340;
        uStack_3bd8 = uStack_5338;
        uStack_3bd0 = uStack_5330;
        uStack_3bc8 = uStack_5328;
        local_3ba0 = local_5300;
        uStack_3b98 = uStack_52f8;
        uStack_3b90 = uStack_52f0;
        uStack_3b88 = uStack_52e8;
        local_3b60 = local_52c0;
        uStack_3b58 = uStack_52b8;
        uStack_3b50 = uStack_52b0;
        uStack_3b48 = uStack_52a8;
        local_3b20 = local_5280;
        uStack_3b18 = uStack_5278;
        uStack_3b10 = uStack_5270;
        uStack_3b08 = uStack_5268;
        local_3ae0 = local_66c0;
        uStack_3ad8 = uStack_66b8;
        uStack_3ad0 = uStack_66b0;
        uStack_3ac8 = uStack_66a8;
        local_3820 = local_38e0;
        uStack_3818 = uStack_38d8;
        uStack_3810 = uStack_38d0;
        uStack_3808 = uStack_38c8;
        local_3740 = local_3800;
        uStack_3738 = uStack_37f8;
        uStack_3730 = uStack_37f0;
        uStack_3728 = uStack_37e8;
        local_3180 = local_66c0;
        uStack_3178 = uStack_66b8;
        uStack_3170 = uStack_66b0;
        uStack_3168 = uStack_66a8;
        local_2d40 = local_2e00;
        uStack_2d38 = uStack_2df8;
        uStack_2d30 = uStack_2df0;
        uStack_2d28 = uStack_2de8;
        uStack_2d08 = uStack_6b48;
        local_22dc = local_22e0;
        local_22d8 = local_22e0;
        local_22d4 = local_22e0;
        local_22d0 = local_22e0;
        local_22cc = local_22e0;
        local_22c8 = local_22e0;
        local_22c4 = local_22e0;
        local_221c = local_2220;
        local_2218 = local_2220;
        local_2214 = local_2220;
        local_2210 = local_2220;
        local_220c = local_2220;
        local_2208 = local_2220;
        local_2204 = local_2220;
        local_21dc = local_21e0;
        local_21d8 = local_21e0;
        local_21d4 = local_21e0;
        local_21d0 = local_21e0;
        local_21cc = local_21e0;
        local_21c8 = local_21e0;
        local_21c4 = local_21e0;
        local_219c = local_21a0;
        local_2198 = local_21a0;
        local_2194 = local_21a0;
        local_2190 = local_21a0;
        local_218c = local_21a0;
        local_2188 = local_21a0;
        local_2184 = local_21a0;
      }
    }
  }
  else if (local_6bc4 == 4) {
    local_6bc4 = 4;
    for (local_6c64 = 0; local_6c64 < local_6bbc; local_6c64 = local_6c64 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffff9130._0_8_,
                         (int)((ulong)in_stack_ffffffffffff9128 >> 0x20));
      pauVar174 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_6cb8);
      ncnn::Mat::~Mat((Mat *)0x8f7954);
      local_6c70 = pauVar174;
      for (local_6cbc = 0; local_6cbc < local_6bc0; local_6cbc = local_6cbc + 1) {
        local_6ac8 = local_6c70;
        local_6ab0 = *(undefined8 *)*local_6c70;
        uStack_6aa8 = *(undefined8 *)(*local_6c70 + 8);
        local_5e0 = ZEXT816(0) << 0x20;
        local_1f70 = 0x3f8000003f800000;
        uStack_1f68 = 0x3f8000003f800000;
        local_1f0 = 0x42b0c0a542b0c0a5;
        uStack_1e8 = 0x42b0c0a542b0c0a5;
        auVar162._8_8_ = 0x42b0c0a542b0c0a5;
        auVar162._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(*local_6c70,auVar162);
        local_16b0._0_8_ = auVar2._0_8_;
        local_4c0 = local_16b0._0_8_;
        local_16b0._8_8_ = auVar2._8_8_;
        uStack_4b8 = local_16b0._8_8_;
        local_530 = 0xc2b0c0a5c2b0c0a5;
        uStack_528 = 0xc2b0c0a5c2b0c0a5;
        auVar136._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar136._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar136);
        local_16b0._0_8_ = auVar3._0_8_;
        uVar7 = local_16b0._0_8_;
        local_16b0._8_8_ = auVar3._8_8_;
        uVar8 = local_16b0._8_8_;
        local_1520 = 0x3fb8aa3b3fb8aa3b;
        uStack_1518 = 0x3fb8aa3b3fb8aa3b;
        local_1510._0_4_ = auVar3._0_4_;
        local_1510._4_4_ = auVar3._4_4_;
        uStack_1508._0_4_ = auVar3._8_4_;
        uStack_1508._4_4_ = auVar3._12_4_;
        local_16d0._4_4_ = local_1510._4_4_ * 1.442695;
        local_16d0._0_4_ = (float)local_1510 * 1.442695;
        uStack_16c8._0_4_ = (float)uStack_1508 * 1.442695;
        uStack_16c8._4_4_ = uStack_1508._4_4_ * 1.442695;
        local_1410 = local_16d0;
        uStack_1408 = uStack_16c8;
        local_1ee0 = 0x3f0000003f000000;
        uStack_1ed8 = 0x3f0000003f000000;
        local_16d0._0_4_ = (float)local_1510 * 1.442695 + 0.5;
        local_16d0._4_4_ = local_1510._4_4_ * 1.442695 + 0.5;
        fVar175 = (float)uStack_1508 * 1.442695 + 0.5;
        fVar177 = uStack_1508._4_4_ * 1.442695 + 0.5;
        uStack_16c8._0_4_ = fVar175;
        uStack_16c8._4_4_ = fVar177;
        local_100 = local_16d0;
        uStack_f8 = uStack_16c8;
        local_16e0._4_4_ = (int)(float)local_16d0._4_4_;
        local_16e0._0_4_ = (int)(float)local_16d0._0_4_;
        local_16e0._8_4_ = (int)fVar175;
        local_16e0._12_4_ = (int)fVar177;
        local_260 = local_16e0._0_8_;
        uStack_258 = local_16e0._8_8_;
        auVar156._8_8_ = local_16e0._8_8_;
        auVar156._0_8_ = local_16e0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar156);
        local_16c0 = auVar1._0_8_;
        local_80 = local_16c0;
        uStack_16b8 = auVar1._8_8_;
        uStack_78 = uStack_16b8;
        local_90 = local_16d0;
        uStack_88 = uStack_16c8;
        auVar166._8_8_ = uStack_16c8;
        auVar166._0_8_ = local_16d0;
        auVar2 = vcmpps_avx(auVar166,auVar1,1);
        local_1700._0_8_ = auVar2._0_8_;
        local_3e0 = local_1700._0_8_;
        local_1700._8_8_ = auVar2._8_8_;
        uStack_3d8 = local_1700._8_8_;
        local_3f0 = 0x3f8000003f800000;
        uStack_3e8 = 0x3f8000003f800000;
        auVar144._8_8_ = 0x3f8000003f800000;
        auVar144._0_8_ = 0x3f8000003f800000;
        local_1700 = vpand_avx(auVar2,auVar144);
        local_f60 = local_16c0;
        uStack_f58 = uStack_16b8;
        local_f70 = local_1700._0_8_;
        uStack_f68 = local_1700._8_8_;
        _local_16d0 = vsubps_avx(auVar1,local_1700);
        local_1f00 = 0x3f3180003f318000;
        uStack_1ef8 = 0x3f3180003f318000;
        local_1530._0_4_ = local_16d0._0_4_;
        local_1530._4_4_ = local_16d0._4_4_;
        uStack_1528._0_4_ = local_16d0._8_4_;
        uStack_1528._4_4_ = local_16d0._12_4_;
        local_16c0 = CONCAT44(local_1530._4_4_ * 0.6933594,(float)local_1530 * 0.6933594);
        uStack_16b8._0_4_ = (float)uStack_1528 * 0.6933594;
        uStack_16b8._4_4_ = uStack_1528._4_4_ * 0.6933594;
        local_1550 = local_16d0;
        uStack_1548 = uStack_16c8;
        local_1ec0 = 0xb95e8083b95e8083;
        uStack_1eb8 = 0xb95e8083b95e8083;
        local_f80 = local_16b0._0_8_;
        uStack_f78 = local_16b0._8_8_;
        local_f90 = local_16c0;
        uStack_f88 = uStack_16b8;
        auVar108._8_8_ = uStack_16b8;
        auVar108._0_8_ = local_16c0;
        auVar2 = vsubps_avx(auVar3,auVar108);
        local_16b0._0_8_ = auVar2._0_8_;
        local_fa0 = local_16b0._0_8_;
        local_16b0._8_8_ = auVar2._8_8_;
        uStack_f98 = local_16b0._8_8_;
        local_fb0 = CONCAT44(local_1530._4_4_ * -0.00021219444,(float)local_1530 * -0.00021219444);
        uStack_fa8 = CONCAT44(uStack_1528._4_4_ * -0.00021219444,(float)uStack_1528 * -0.00021219444
                             );
        auVar107._8_8_ = uStack_fa8;
        auVar107._0_8_ = local_fb0;
        local_16b0 = vsubps_avx(auVar2,auVar107);
        local_1580 = local_16b0._0_8_;
        uStack_1578 = local_16b0._8_8_;
        local_1570._0_4_ = local_16b0._0_4_;
        local_1570._4_4_ = local_16b0._4_4_;
        uStack_1568._0_4_ = local_16b0._8_4_;
        uStack_1568._4_4_ = local_16b0._12_4_;
        local_1710 = (float)local_1570 * (float)local_1570;
        fStack_170c = local_1570._4_4_ * local_1570._4_4_;
        fStack_1708 = (float)uStack_1568 * (float)uStack_1568;
        fStack_1704 = uStack_1568._4_4_ * uStack_1568._4_4_;
        local_1590 = 0x3950696739506967;
        uStack_1588 = 0x3950696739506967;
        local_15a0 = local_16b0._0_8_;
        uStack_1598 = local_16b0._8_8_;
        local_1720 = CONCAT44(local_1570._4_4_ * 0.00019875691,(float)local_1570 * 0.00019875691);
        uStack_1718 = CONCAT44(uStack_1568._4_4_ * 0.00019875691,(float)uStack_1568 * 0.00019875691)
        ;
        local_1430 = local_1720;
        uStack_1428 = uStack_1718;
        local_1440 = 0x3ab743ce3ab743ce;
        uStack_1438 = 0x3ab743ce3ab743ce;
        fVar175 = (float)local_1570 * 0.00019875691 + 0.0013981999;
        fVar177 = local_1570._4_4_ * 0.00019875691 + 0.0013981999;
        fVar178 = (float)uStack_1568 * 0.00019875691 + 0.0013981999;
        fVar179 = uStack_1568._4_4_ * 0.00019875691 + 0.0013981999;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_15b0 = local_1720;
        uStack_15a8 = uStack_1718;
        local_15c0 = local_16b0._0_8_;
        uStack_15b8 = local_16b0._8_8_;
        fVar175 = fVar175 * (float)local_1570;
        fVar177 = fVar177 * local_1570._4_4_;
        fVar178 = fVar178 * (float)uStack_1568;
        fVar179 = fVar179 * uStack_1568._4_4_;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_1450 = local_1720;
        uStack_1448 = uStack_1718;
        local_1460 = 0x3c0889083c088908;
        uStack_1458 = 0x3c0889083c088908;
        fVar175 = fVar175 + 0.008333452;
        fVar177 = fVar177 + 0.008333452;
        fVar178 = fVar178 + 0.008333452;
        fVar179 = fVar179 + 0.008333452;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_15d0 = local_1720;
        uStack_15c8 = uStack_1718;
        local_15e0 = local_16b0._0_8_;
        uStack_15d8 = local_16b0._8_8_;
        fVar175 = fVar175 * (float)local_1570;
        fVar177 = fVar177 * local_1570._4_4_;
        fVar178 = fVar178 * (float)uStack_1568;
        fVar179 = fVar179 * uStack_1568._4_4_;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_1470 = local_1720;
        uStack_1468 = uStack_1718;
        local_1480 = 0x3d2aa9c13d2aa9c1;
        uStack_1478 = 0x3d2aa9c13d2aa9c1;
        fVar175 = fVar175 + 0.041665796;
        fVar177 = fVar177 + 0.041665796;
        fVar178 = fVar178 + 0.041665796;
        fVar179 = fVar179 + 0.041665796;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_15f0 = local_1720;
        uStack_15e8 = uStack_1718;
        local_1600 = local_16b0._0_8_;
        uStack_15f8 = local_16b0._8_8_;
        fVar175 = fVar175 * (float)local_1570;
        fVar177 = fVar177 * local_1570._4_4_;
        fVar178 = fVar178 * (float)uStack_1568;
        fVar179 = fVar179 * uStack_1568._4_4_;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_1490 = local_1720;
        uStack_1488 = uStack_1718;
        local_14a0 = 0x3e2aaaaa3e2aaaaa;
        uStack_1498 = 0x3e2aaaaa3e2aaaaa;
        fVar175 = fVar175 + 0.16666666;
        fVar177 = fVar177 + 0.16666666;
        fVar178 = fVar178 + 0.16666666;
        fVar179 = fVar179 + 0.16666666;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_1610 = local_1720;
        uStack_1608 = uStack_1718;
        local_1620 = local_16b0._0_8_;
        uStack_1618 = local_16b0._8_8_;
        fVar175 = fVar175 * (float)local_1570;
        fVar177 = fVar177 * local_1570._4_4_;
        fVar178 = fVar178 * (float)uStack_1568;
        fVar179 = fVar179 * uStack_1568._4_4_;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_14b0 = local_1720;
        uStack_14a8 = uStack_1718;
        fVar175 = fVar175 + 0.5;
        fVar177 = fVar177 + 0.5;
        fVar178 = fVar178 + 0.5;
        fVar179 = fVar179 + 0.5;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_1630 = local_1720;
        uStack_1628 = uStack_1718;
        local_1640 = CONCAT44(fStack_170c,local_1710);
        uStack_1638 = CONCAT44(fStack_1704,fStack_1708);
        fVar175 = fVar175 * local_1710;
        fVar177 = fVar177 * fStack_170c;
        fVar178 = fVar178 * fStack_1708;
        fVar179 = fVar179 * fStack_1704;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_14d0 = local_1720;
        uStack_14c8 = uStack_1718;
        local_14e0 = local_16b0._0_8_;
        uStack_14d8 = local_16b0._8_8_;
        fVar175 = fVar175 + (float)local_1570;
        fVar177 = fVar177 + local_1570._4_4_;
        fVar178 = fVar178 + (float)uStack_1568;
        fVar179 = fVar179 + uStack_1568._4_4_;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_14f0 = local_1720;
        uStack_14e8 = uStack_1718;
        local_1500 = 0x3f8000003f800000;
        uStack_14f8 = 0x3f8000003f800000;
        fVar175 = fVar175 + 1.0;
        fVar177 = fVar177 + 1.0;
        fVar178 = fVar178 + 1.0;
        fVar179 = fVar179 + 1.0;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_110 = local_16d0;
        uStack_108 = uStack_16c8;
        local_16e0._4_4_ = (int)local_1530._4_4_;
        local_16e0._0_4_ = (int)(float)local_1530;
        local_16e0._8_4_ = (int)(float)uStack_1528;
        local_16e0._12_4_ = (int)uStack_1528._4_4_;
        local_1690 = local_16e0._0_8_;
        uStack_1688 = local_16e0._8_8_;
        local_1f20 = 0x7f0000007f;
        uStack_1f18 = 0x7f0000007f;
        auVar102._8_8_ = local_16e0._8_8_;
        auVar102._0_8_ = local_16e0._0_8_;
        auVar101._8_8_ = 0x7f0000007f;
        auVar101._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar102,auVar101);
        local_16e0._0_8_ = auVar2._0_8_;
        local_1670 = local_16e0._0_8_;
        local_16e0._8_8_ = auVar2._8_8_;
        uStack_1668 = local_16e0._8_8_;
        local_1674 = 0x17;
        local_16e0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_40 = local_16e0._0_8_;
        uStack_38 = local_16e0._8_8_;
        local_1730 = local_16e0._0_8_;
        uStack_1728 = local_16e0._8_8_;
        local_1650 = local_1720;
        uStack_1648 = uStack_1718;
        local_1660._0_4_ = local_16e0._0_4_;
        local_1660._4_4_ = local_16e0._4_4_;
        uStack_1658._0_4_ = local_16e0._8_4_;
        uStack_1658._4_4_ = local_16e0._12_4_;
        fVar175 = fVar175 * (float)local_1660;
        fVar177 = fVar177 * local_1660._4_4_;
        fVar178 = fVar178 * (float)uStack_1658;
        fVar179 = fVar179 * uStack_1658._4_4_;
        local_1720 = CONCAT44(fVar177,fVar175);
        uStack_1718 = CONCAT44(fVar179,fVar178);
        local_1760 = local_1720;
        uStack_1758 = uStack_1718;
        local_1034 = 0x3f800000;
        local_1050 = 0x3f800000;
        local_1770 = 0x3f8000003f800000;
        uStack_1768 = 0x3f8000003f800000;
        local_1f50._4_4_ = fVar177 + 1.0;
        local_1f50._0_4_ = fVar175 + 1.0;
        uStack_1f48._0_4_ = fVar178 + 1.0;
        uStack_1f48._4_4_ = fVar179 + 1.0;
        local_540 = local_1f50;
        uStack_538 = uStack_1f48;
        local_550 = 0;
        local_580._8_8_ = SUB168(ZEXT816(0),4);
        uStack_548 = local_580._8_8_;
        auVar132._8_8_ = uStack_1f48;
        auVar132._0_8_ = local_1f50;
        auVar168._8_8_ = 0;
        auVar168._0_8_ = local_580._8_8_;
        local_1f80 = vcmpps_avx(auVar132,auVar168 << 0x40,2);
        local_480 = local_1f50;
        uStack_478 = uStack_1f48;
        local_490 = 0x80000000800000;
        uStack_488 = 0x80000000800000;
        auVar140._8_8_ = uStack_1f48;
        auVar140._0_8_ = local_1f50;
        auVar139._8_8_ = 0x80000000800000;
        auVar139._0_8_ = 0x80000000800000;
        auVar2 = vmaxps_avx(auVar140,auVar139);
        local_1f50 = auVar2._0_8_;
        local_460 = local_1f50;
        uStack_1f48 = auVar2._8_8_;
        uStack_458 = uStack_1f48;
        local_1f30 = local_1f50;
        uStack_1f28 = uStack_1f48;
        local_1f34 = 0x17;
        auVar3 = vpsrld_avx(auVar2,ZEXT416(0x17));
        local_320 = local_1f50;
        uStack_318 = uStack_1f48;
        local_330 = 0x807fffff807fffff;
        uStack_328 = 0x807fffff807fffff;
        auVar148._8_8_ = 0x807fffff807fffff;
        auVar148._0_8_ = 0x807fffff807fffff;
        auVar2 = vpand_avx(auVar2,auVar148);
        local_1f50 = auVar2._0_8_;
        local_2a0 = local_1f50;
        uStack_1f48 = auVar2._8_8_;
        uStack_298 = uStack_1f48;
        auVar152._8_8_ = 0x3f0000003f000000;
        auVar152._0_8_ = 0x3f0000003f000000;
        auVar1 = vpor_avx(auVar2,auVar152);
        local_1f60._0_8_ = auVar3._0_8_;
        local_1f10 = local_1f60._0_8_;
        local_1f60._8_8_ = auVar3._8_8_;
        uStack_1f08 = local_1f60._8_8_;
        auVar99._8_8_ = 0x7f0000007f;
        auVar99._0_8_ = 0x7f0000007f;
        local_1f60 = vpsubd_avx(auVar3,auVar99);
        local_240 = local_1f60._0_8_;
        uStack_238 = local_1f60._8_8_;
        auVar2 = vcvtdq2ps_avx(local_1f60);
        local_1f90 = auVar2._0_8_;
        uVar9 = local_1f90;
        uStack_1f88 = auVar2._8_8_;
        uVar10 = uStack_1f88;
        local_1790 = 0x3f8000003f800000;
        uStack_1788 = 0x3f8000003f800000;
        local_1780._0_4_ = auVar2._0_4_;
        local_1780._4_4_ = auVar2._4_4_;
        uStack_1778._0_4_ = auVar2._8_4_;
        uStack_1778._4_4_ = auVar2._12_4_;
        local_1f90._4_4_ = local_1780._4_4_ + 1.0;
        local_1f90._0_4_ = (float)local_1780 + 1.0;
        uStack_1f88._0_4_ = (float)uStack_1778 + 1.0;
        uStack_1f88._4_4_ = uStack_1778._4_4_ + 1.0;
        local_1f50 = auVar1._0_8_;
        local_200 = local_1f50;
        uStack_1f48 = auVar1._8_8_;
        uStack_1f8 = uStack_1f48;
        local_210 = 0x3f3504f33f3504f3;
        uStack_208 = 0x3f3504f33f3504f3;
        auVar158._8_8_ = 0x3f3504f33f3504f3;
        auVar158._0_8_ = 0x3f3504f33f3504f3;
        local_1fa0 = vcmpps_avx(auVar1,auVar158,1);
        local_340 = local_1f50;
        uStack_338 = uStack_1f48;
        local_350 = local_1fa0._0_8_;
        uStack_348 = local_1fa0._8_8_;
        auVar2 = vpand_avx(auVar1,local_1fa0);
        local_ea0 = local_1f50;
        uStack_e98 = uStack_1f48;
        local_eb0 = 0x3f8000003f800000;
        uStack_ea8 = 0x3f8000003f800000;
        auVar116._8_8_ = 0x3f8000003f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar1 = vsubps_avx(auVar1,auVar116);
        local_ec0 = local_1f90;
        uStack_eb8 = uStack_1f88;
        local_360 = 0x3f8000003f800000;
        uStack_358 = 0x3f8000003f800000;
        local_370 = local_1fa0._0_8_;
        uStack_368 = local_1fa0._8_8_;
        auVar147._8_8_ = 0x3f8000003f800000;
        auVar147._0_8_ = 0x3f8000003f800000;
        local_ed0 = vpand_avx(auVar147,local_1fa0);
        auVar115._8_8_ = uStack_1f88;
        auVar115._0_8_ = local_1f90;
        _local_1f90 = vsubps_avx(auVar115,local_ed0);
        local_1f50 = auVar1._0_8_;
        uVar11 = local_1f50;
        uStack_1f48 = auVar1._8_8_;
        uVar12 = uStack_1f48;
        local_1fb0 = auVar2._0_8_;
        uVar13 = local_1fb0;
        uStack_1fa8 = auVar2._8_8_;
        uVar14 = uStack_1fa8;
        local_17a0._0_4_ = auVar1._0_4_;
        local_17a0._4_4_ = auVar1._4_4_;
        uStack_1798._0_4_ = auVar1._8_4_;
        uStack_1798._4_4_ = auVar1._12_4_;
        local_17b0._0_4_ = auVar2._0_4_;
        local_17b0._4_4_ = auVar2._4_4_;
        uStack_17a8._0_4_ = auVar2._8_4_;
        uStack_17a8._4_4_ = auVar2._12_4_;
        local_17a0._0_4_ = (float)local_17a0 + (float)local_17b0;
        local_17a0._4_4_ = local_17a0._4_4_ + local_17b0._4_4_;
        uStack_1798._0_4_ = (float)uStack_1798 + (float)uStack_17a8;
        uStack_1798._4_4_ = uStack_1798._4_4_ + uStack_17a8._4_4_;
        local_1f50._4_4_ = local_17a0._4_4_;
        local_1f50._0_4_ = (float)local_17a0;
        uStack_1f48._0_4_ = (float)uStack_1798;
        uStack_1f48._4_4_ = uStack_1798._4_4_;
        local_1d60 = local_1f50;
        uStack_1d58 = uStack_1f48;
        local_1fc0 = (float)local_17a0 * (float)local_17a0;
        fStack_1fbc = local_17a0._4_4_ * local_17a0._4_4_;
        fStack_1fb8 = (float)uStack_1798 * (float)uStack_1798;
        fStack_1fb4 = uStack_1798._4_4_ * uStack_1798._4_4_;
        local_1d70 = 0x3d9021bb3d9021bb;
        uStack_1d68 = 0x3d9021bb3d9021bb;
        local_1d80 = local_1f50;
        uStack_1d78 = uStack_1f48;
        local_1fd0._4_4_ = local_17a0._4_4_ * 0.070376836;
        local_1fd0._0_4_ = (float)local_17a0 * 0.070376836;
        uStack_1fc8._0_4_ = (float)uStack_1798 * 0.070376836;
        uStack_1fc8._4_4_ = uStack_1798._4_4_ * 0.070376836;
        local_17c0 = local_1fd0;
        uStack_17b8 = uStack_1fc8;
        local_17d0 = 0xbdebd1b8bdebd1b8;
        uStack_17c8 = 0xbdebd1b8bdebd1b8;
        local_1fd0._0_4_ = (float)local_17a0 * 0.070376836 + -0.1151461;
        local_1fd0._4_4_ = local_17a0._4_4_ * 0.070376836 + -0.1151461;
        fVar175 = (float)uStack_1798 * 0.070376836 + -0.1151461;
        fVar177 = uStack_1798._4_4_ * 0.070376836 + -0.1151461;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1d90 = local_1fd0;
        uStack_1d88 = uStack_1fc8;
        local_1da0 = local_1f50;
        uStack_1d98 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_17e0 = local_1fd0;
        uStack_17d8 = uStack_1fc8;
        local_17f0 = 0x3def251a3def251a;
        uStack_17e8 = 0x3def251a3def251a;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.116769984;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.116769984;
        fVar175 = fVar175 + 0.116769984;
        fVar177 = fVar177 + 0.116769984;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1db0 = local_1fd0;
        uStack_1da8 = uStack_1fc8;
        local_1dc0 = local_1f50;
        uStack_1db8 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1800 = local_1fd0;
        uStack_17f8 = uStack_1fc8;
        local_1810 = 0xbdfe5d4fbdfe5d4f;
        uStack_1808 = 0xbdfe5d4fbdfe5d4f;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + -0.12420141;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + -0.12420141;
        fVar175 = fVar175 + -0.12420141;
        fVar177 = fVar177 + -0.12420141;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1dd0 = local_1fd0;
        uStack_1dc8 = uStack_1fc8;
        local_1de0 = local_1f50;
        uStack_1dd8 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1820 = local_1fd0;
        uStack_1818 = uStack_1fc8;
        local_1830 = 0x3e11e9bf3e11e9bf;
        uStack_1828 = 0x3e11e9bf3e11e9bf;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.14249323;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.14249323;
        fVar175 = fVar175 + 0.14249323;
        fVar177 = fVar177 + 0.14249323;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1df0 = local_1fd0;
        uStack_1de8 = uStack_1fc8;
        local_1e00 = local_1f50;
        uStack_1df8 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1840 = local_1fd0;
        uStack_1838 = uStack_1fc8;
        local_1850 = 0xbe2aae50be2aae50;
        uStack_1848 = 0xbe2aae50be2aae50;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + -0.16668057;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + -0.16668057;
        fVar175 = fVar175 + -0.16668057;
        fVar177 = fVar177 + -0.16668057;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1e10 = local_1fd0;
        uStack_1e08 = uStack_1fc8;
        local_1e20 = local_1f50;
        uStack_1e18 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1860 = local_1fd0;
        uStack_1858 = uStack_1fc8;
        local_1870 = 0x3e4cceac3e4cceac;
        uStack_1868 = 0x3e4cceac3e4cceac;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.20000714;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.20000714;
        fVar175 = fVar175 + 0.20000714;
        fVar177 = fVar177 + 0.20000714;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1e30 = local_1fd0;
        uStack_1e28 = uStack_1fc8;
        local_1e40 = local_1f50;
        uStack_1e38 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1880 = local_1fd0;
        uStack_1878 = uStack_1fc8;
        local_1890 = 0xbe7ffffcbe7ffffc;
        uStack_1888 = 0xbe7ffffcbe7ffffc;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + -0.24999994;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + -0.24999994;
        fVar175 = fVar175 + -0.24999994;
        fVar177 = fVar177 + -0.24999994;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1e50 = local_1fd0;
        uStack_1e48 = uStack_1fc8;
        local_1e60 = local_1f50;
        uStack_1e58 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_18a0 = local_1fd0;
        uStack_1898 = uStack_1fc8;
        local_18b0 = 0x3eaaaaaa3eaaaaaa;
        uStack_18a8 = 0x3eaaaaaa3eaaaaaa;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.3333333;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.3333333;
        fVar175 = fVar175 + 0.3333333;
        fVar177 = fVar177 + 0.3333333;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1e70 = local_1fd0;
        uStack_1e68 = uStack_1fc8;
        local_1e80 = local_1f50;
        uStack_1e78 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_17a0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_17a0._4_4_;
        fVar175 = fVar175 * (float)uStack_1798;
        fVar177 = fVar177 * uStack_1798._4_4_;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1e90 = local_1fd0;
        uStack_1e88 = uStack_1fc8;
        local_1ea0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1e98 = CONCAT44(fStack_1fb4,fStack_1fb8);
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * local_1fc0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * fStack_1fbc;
        fVar175 = fVar175 * fStack_1fb8;
        fVar177 = fVar177 * fStack_1fb4;
        uStack_1fc8._0_4_ = fVar175;
        uStack_1fc8._4_4_ = fVar177;
        local_1eb0._0_4_ = local_1f90._0_4_;
        local_1eb0._4_4_ = local_1f90._4_4_;
        uStack_1ea8._0_4_ = local_1f90._8_4_;
        uStack_1ea8._4_4_ = local_1f90._12_4_;
        local_1fb0 = CONCAT44(local_1eb0._4_4_ * -0.00021219444,(float)local_1eb0 * -0.00021219444);
        uStack_1fa8._0_4_ = (float)uStack_1ea8 * -0.00021219444;
        uStack_1fa8._4_4_ = uStack_1ea8._4_4_ * -0.00021219444;
        local_18c0 = local_1fd0;
        uStack_18b8 = uStack_1fc8;
        local_18d0 = local_1fb0;
        uStack_18c8 = uStack_1fa8;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + local_1eb0._4_4_ * -0.00021219444;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + (float)local_1eb0 * -0.00021219444;
        uStack_1fc8._0_4_ = fVar175 + (float)uStack_1ea8 * -0.00021219444;
        uStack_1fc8._4_4_ = fVar177 + uStack_1ea8._4_4_ * -0.00021219444;
        local_1ed0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1ec8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        local_1fb0 = CONCAT44(fStack_1fbc * 0.5,local_1fc0 * 0.5);
        uStack_1fa8._0_4_ = fStack_1fb8 * 0.5;
        uStack_1fa8._4_4_ = fStack_1fb4 * 0.5;
        local_ee0 = local_1fd0;
        uStack_ed8 = uStack_1fc8;
        local_ef0 = local_1fb0;
        uStack_ee8 = uStack_1fa8;
        auVar114._8_8_ = uStack_1fc8;
        auVar114._0_8_ = local_1fd0;
        auVar113._8_8_ = uStack_1fa8;
        auVar113._0_8_ = local_1fb0;
        _local_1fd0 = vsubps_avx(auVar114,auVar113);
        local_1ef0 = local_1f90;
        uStack_1ee8 = uStack_1f88;
        local_1fb0 = CONCAT44(local_1eb0._4_4_ * 0.6933594,(float)local_1eb0 * 0.6933594);
        uStack_1fa8._0_4_ = (float)uStack_1ea8 * 0.6933594;
        uStack_1fa8._4_4_ = uStack_1ea8._4_4_ * 0.6933594;
        local_18e0 = local_1f50;
        uStack_18d8 = uStack_1f48;
        local_18f0._0_4_ = local_1fd0._0_4_;
        local_18f0._4_4_ = local_1fd0._4_4_;
        uStack_18e8._0_4_ = local_1fd0._8_4_;
        uStack_18e8._4_4_ = local_1fd0._12_4_;
        local_1f50._4_4_ = local_17a0._4_4_ + local_18f0._4_4_;
        local_1f50._0_4_ = (float)local_17a0 + (float)local_18f0;
        uStack_1f48._0_4_ = (float)uStack_1798 + (float)uStack_18e8;
        uStack_1f48._4_4_ = uStack_1798._4_4_ + uStack_18e8._4_4_;
        local_1900 = local_1f50;
        uStack_18f8 = uStack_1f48;
        local_1910 = local_1fb0;
        uStack_1908 = uStack_1fa8;
        local_1f50._4_4_ = local_17a0._4_4_ + local_18f0._4_4_ + local_1eb0._4_4_ * 0.6933594;
        local_1f50._0_4_ = (float)local_17a0 + (float)local_18f0 + (float)local_1eb0 * 0.6933594;
        uStack_1f48._0_4_ = (float)uStack_1798 + (float)uStack_18e8 + (float)uStack_1ea8 * 0.6933594
        ;
        uStack_1f48._4_4_ = uStack_1798._4_4_ + uStack_18e8._4_4_ + uStack_1ea8._4_4_ * 0.6933594;
        local_2c0 = local_1f50;
        uStack_2b8 = uStack_1f48;
        local_2d0 = local_1f80._0_8_;
        uStack_2c8 = local_1f80._8_8_;
        auVar151._8_8_ = uStack_1f48;
        auVar151._0_8_ = local_1f50;
        _local_1f50 = vpor_avx(auVar151,local_1f80);
        local_2090 = local_1f50;
        uStack_2088 = uStack_1f48;
        local_1054 = 0x3f800000;
        local_1070 = 0x3f800000;
        local_20a0 = 0x3f8000003f800000;
        uStack_2098 = 0x3f8000003f800000;
        local_1074 = 0x40000000;
        local_1090 = 0x40000000;
        local_20b0 = 0x4000000040000000;
        uStack_20a8 = 0x4000000040000000;
        local_2050._0_4_ = local_1f50._0_4_;
        local_2050._4_4_ = local_1f50._4_4_;
        uStack_2048._0_4_ = local_1f50._8_4_;
        uStack_2048._4_4_ = local_1f50._12_4_;
        local_a30 = (float)local_2050 * 2.0;
        fStack_a2c = local_2050._4_4_ * 2.0;
        fStack_a28 = (float)uStack_2048 * 2.0;
        fStack_a24 = uStack_2048._4_4_ * 2.0;
        local_6b4 = 0x3f800000;
        local_6d0 = 0x3f800000;
        local_a40 = 0x3f8000003f800000;
        uStack_a38 = 0x3f8000003f800000;
        local_a10._8_8_ = 0x3f8000003f800000;
        local_a10._0_8_ = 0x3f8000003f800000;
        local_640 = 0;
        uStack_638 = local_580._8_8_;
        local_650 = CONCAT44(fStack_a2c,local_a30);
        uStack_648 = CONCAT44(fStack_a24,fStack_a28);
        auVar169._8_8_ = 0;
        auVar169._0_8_ = local_580._8_8_;
        auVar128._8_8_ = uStack_648;
        auVar128._0_8_ = local_650;
        auVar2 = vsubps_avx(auVar169 << 0x40,auVar128);
        local_5f0 = 0;
        uStack_5e8 = local_580._8_8_;
        local_970 = 0x7f0000007f;
        uStack_968 = 0x7f0000007f;
        local_980._0_8_ = auVar2._0_8_;
        local_1e0 = local_980._0_8_;
        local_980._8_8_ = auVar2._8_8_;
        uStack_1d8 = local_980._8_8_;
        auVar159._8_8_ = 0x42b0c0a542b0c0a5;
        auVar159._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar159);
        local_980._0_8_ = auVar2._0_8_;
        local_520 = local_980._0_8_;
        local_980._8_8_ = auVar2._8_8_;
        uStack_518 = local_980._8_8_;
        auVar133._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar133._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar133);
        local_980._0_8_ = auVar3._0_8_;
        uVar15 = local_980._0_8_;
        local_980._8_8_ = auVar3._8_8_;
        uVar16 = local_980._8_8_;
        local_7e0._0_4_ = auVar3._0_4_;
        local_7e0._4_4_ = auVar3._4_4_;
        uStack_7d8._0_4_ = auVar3._8_4_;
        uStack_7d8._4_4_ = auVar3._12_4_;
        local_9a0._4_4_ = local_7e0._4_4_ * 1.442695;
        local_9a0._0_4_ = (float)local_7e0 * 1.442695;
        uStack_998._0_4_ = (float)uStack_7d8 * 1.442695;
        uStack_998._4_4_ = uStack_7d8._4_4_ * 1.442695;
        local_6e0 = local_9a0;
        uStack_6d8 = uStack_998;
        local_9a0._0_4_ = (float)local_7e0 * 1.442695 + 0.5;
        local_9a0._4_4_ = local_7e0._4_4_ * 1.442695 + 0.5;
        fVar175 = (float)uStack_7d8 * 1.442695 + 0.5;
        fVar177 = uStack_7d8._4_4_ * 1.442695 + 0.5;
        uStack_998._0_4_ = fVar175;
        uStack_998._4_4_ = fVar177;
        local_160 = local_9a0;
        uStack_158 = uStack_998;
        local_9b0._4_4_ = (int)(float)local_9a0._4_4_;
        local_9b0._0_4_ = (int)(float)local_9a0._0_4_;
        local_9b0._8_4_ = (int)fVar175;
        local_9b0._12_4_ = (int)fVar177;
        local_290 = local_9b0._0_8_;
        uStack_288 = local_9b0._8_8_;
        auVar153._8_8_ = local_9b0._8_8_;
        auVar153._0_8_ = local_9b0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar153);
        local_990 = auVar1._0_8_;
        local_e0 = local_990;
        uStack_988 = auVar1._8_8_;
        uStack_d8 = uStack_988;
        local_f0 = local_9a0;
        uStack_e8 = uStack_998;
        auVar163._8_8_ = uStack_998;
        auVar163._0_8_ = local_9a0;
        auVar2 = vcmpps_avx(auVar163,auVar1,1);
        local_9d0._0_8_ = auVar2._0_8_;
        local_440 = local_9d0._0_8_;
        local_9d0._8_8_ = auVar2._8_8_;
        uStack_438 = local_9d0._8_8_;
        local_450 = 0x3f8000003f800000;
        uStack_448 = 0x3f8000003f800000;
        auVar141._8_8_ = 0x3f8000003f800000;
        auVar141._0_8_ = 0x3f8000003f800000;
        local_9d0 = vpand_avx(auVar2,auVar141);
        local_660 = local_990;
        uStack_658 = uStack_988;
        local_670 = local_9d0._0_8_;
        uStack_668 = local_9d0._8_8_;
        _local_9a0 = vsubps_avx(auVar1,local_9d0);
        local_800._0_4_ = local_9a0._0_4_;
        local_800._4_4_ = local_9a0._4_4_;
        uStack_7f8._0_4_ = local_9a0._8_4_;
        uStack_7f8._4_4_ = local_9a0._12_4_;
        local_990 = CONCAT44(local_800._4_4_ * 0.6933594,(float)local_800 * 0.6933594);
        uStack_988._0_4_ = (float)uStack_7f8 * 0.6933594;
        uStack_988._4_4_ = uStack_7f8._4_4_ * 0.6933594;
        local_820 = local_9a0;
        uStack_818 = uStack_998;
        local_680 = local_980._0_8_;
        uStack_678 = local_980._8_8_;
        local_690 = local_990;
        uStack_688 = uStack_988;
        auVar127._8_8_ = uStack_988;
        auVar127._0_8_ = local_990;
        auVar2 = vsubps_avx(auVar3,auVar127);
        local_980._0_8_ = auVar2._0_8_;
        local_6a0 = local_980._0_8_;
        local_980._8_8_ = auVar2._8_8_;
        uStack_698 = local_980._8_8_;
        local_6b0 = CONCAT44(local_800._4_4_ * -0.00021219444,(float)local_800 * -0.00021219444);
        uStack_6a8 = CONCAT44(uStack_7f8._4_4_ * -0.00021219444,(float)uStack_7f8 * -0.00021219444);
        auVar126._8_8_ = uStack_6a8;
        auVar126._0_8_ = local_6b0;
        local_980 = vsubps_avx(auVar2,auVar126);
        local_850 = local_980._0_8_;
        uStack_848 = local_980._8_8_;
        local_840._0_4_ = local_980._0_4_;
        local_840._4_4_ = local_980._4_4_;
        uStack_838._0_4_ = local_980._8_4_;
        uStack_838._4_4_ = local_980._12_4_;
        local_9e0 = (float)local_840 * (float)local_840;
        fStack_9dc = local_840._4_4_ * local_840._4_4_;
        fStack_9d8 = (float)uStack_838 * (float)uStack_838;
        fStack_9d4 = uStack_838._4_4_ * uStack_838._4_4_;
        local_860 = 0x3950696739506967;
        uStack_858 = 0x3950696739506967;
        local_870 = local_980._0_8_;
        uStack_868 = local_980._8_8_;
        local_700 = CONCAT44(local_840._4_4_ * 0.00019875691,(float)local_840 * 0.00019875691);
        uStack_6f8 = CONCAT44(uStack_838._4_4_ * 0.00019875691,(float)uStack_838 * 0.00019875691);
        local_9f0 = (float)local_840 * 0.00019875691 + 0.0013981999;
        fStack_9ec = local_840._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_9e8 = (float)uStack_838 * 0.00019875691 + 0.0013981999;
        fStack_9e4 = uStack_838._4_4_ * 0.00019875691 + 0.0013981999;
        local_880 = CONCAT44(fStack_9ec,local_9f0);
        uStack_878 = CONCAT44(fStack_9e4,fStack_9e8);
        local_890 = local_980._0_8_;
        uStack_888 = local_980._8_8_;
        local_9f0 = local_9f0 * (float)local_840;
        fStack_9ec = fStack_9ec * local_840._4_4_;
        fStack_9e8 = fStack_9e8 * (float)uStack_838;
        fStack_9e4 = fStack_9e4 * uStack_838._4_4_;
        local_720 = CONCAT44(fStack_9ec,local_9f0);
        uStack_718 = CONCAT44(fStack_9e4,fStack_9e8);
        local_9f0 = local_9f0 + 0.008333452;
        fStack_9ec = fStack_9ec + 0.008333452;
        fStack_9e8 = fStack_9e8 + 0.008333452;
        fStack_9e4 = fStack_9e4 + 0.008333452;
        local_8a0 = CONCAT44(fStack_9ec,local_9f0);
        uStack_898 = CONCAT44(fStack_9e4,fStack_9e8);
        local_8b0 = local_980._0_8_;
        uStack_8a8 = local_980._8_8_;
        local_9f0 = (float)local_840 * local_9f0;
        fStack_9ec = local_840._4_4_ * fStack_9ec;
        fStack_9e8 = (float)uStack_838 * fStack_9e8;
        fStack_9e4 = uStack_838._4_4_ * fStack_9e4;
        local_740 = CONCAT44(fStack_9ec,local_9f0);
        uStack_738 = CONCAT44(fStack_9e4,fStack_9e8);
        local_9f0 = local_9f0 + 0.041665796;
        fStack_9ec = fStack_9ec + 0.041665796;
        fStack_9e8 = fStack_9e8 + 0.041665796;
        fStack_9e4 = fStack_9e4 + 0.041665796;
        local_8c0 = CONCAT44(fStack_9ec,local_9f0);
        uStack_8b8 = CONCAT44(fStack_9e4,fStack_9e8);
        local_8d0 = local_980._0_8_;
        uStack_8c8 = local_980._8_8_;
        local_9f0 = local_9f0 * (float)local_840;
        fStack_9ec = fStack_9ec * local_840._4_4_;
        fStack_9e8 = fStack_9e8 * (float)uStack_838;
        fStack_9e4 = fStack_9e4 * uStack_838._4_4_;
        local_760 = CONCAT44(fStack_9ec,local_9f0);
        uStack_758 = CONCAT44(fStack_9e4,fStack_9e8);
        local_9f0 = local_9f0 + 0.16666666;
        fStack_9ec = fStack_9ec + 0.16666666;
        fStack_9e8 = fStack_9e8 + 0.16666666;
        fStack_9e4 = fStack_9e4 + 0.16666666;
        local_8e0 = CONCAT44(fStack_9ec,local_9f0);
        uStack_8d8 = CONCAT44(fStack_9e4,fStack_9e8);
        local_8f0 = local_980._0_8_;
        uStack_8e8 = local_980._8_8_;
        local_9f0 = local_9f0 * (float)local_840;
        fStack_9ec = fStack_9ec * local_840._4_4_;
        fStack_9e8 = fStack_9e8 * (float)uStack_838;
        fStack_9e4 = fStack_9e4 * uStack_838._4_4_;
        local_780 = CONCAT44(fStack_9ec,local_9f0);
        uStack_778 = CONCAT44(fStack_9e4,fStack_9e8);
        local_9f0 = local_9f0 + 0.5;
        fStack_9ec = fStack_9ec + 0.5;
        fStack_9e8 = fStack_9e8 + 0.5;
        fStack_9e4 = fStack_9e4 + 0.5;
        local_900 = CONCAT44(fStack_9ec,local_9f0);
        uStack_8f8 = CONCAT44(fStack_9e4,fStack_9e8);
        local_910 = CONCAT44(fStack_9dc,local_9e0);
        uStack_908 = CONCAT44(fStack_9d4,fStack_9d8);
        local_9f0 = local_9f0 * local_9e0;
        fStack_9ec = fStack_9ec * fStack_9dc;
        fStack_9e8 = fStack_9e8 * fStack_9d8;
        fStack_9e4 = fStack_9e4 * fStack_9d4;
        local_7a0 = CONCAT44(fStack_9ec,local_9f0);
        uStack_798 = CONCAT44(fStack_9e4,fStack_9e8);
        local_7b0 = local_980._0_8_;
        uStack_7a8 = local_980._8_8_;
        local_9f0 = local_9f0 + (float)local_840;
        fStack_9ec = fStack_9ec + local_840._4_4_;
        fStack_9e8 = fStack_9e8 + (float)uStack_838;
        fStack_9e4 = fStack_9e4 + uStack_838._4_4_;
        local_7c0 = CONCAT44(fStack_9ec,local_9f0);
        uStack_7b8 = CONCAT44(fStack_9e4,fStack_9e8);
        local_7d0 = 0x3f8000003f800000;
        uStack_7c8 = 0x3f8000003f800000;
        local_9f0 = local_9f0 + 1.0;
        fStack_9ec = fStack_9ec + 1.0;
        fStack_9e8 = fStack_9e8 + 1.0;
        fStack_9e4 = fStack_9e4 + 1.0;
        local_170 = local_9a0;
        uStack_168 = uStack_998;
        local_9b0._4_4_ = (int)local_800._4_4_;
        local_9b0._0_4_ = (int)(float)local_800;
        local_9b0._8_4_ = (int)(float)uStack_7f8;
        local_9b0._12_4_ = (int)uStack_7f8._4_4_;
        local_960 = local_9b0._0_8_;
        uStack_958 = local_9b0._8_8_;
        auVar125._8_8_ = local_9b0._8_8_;
        auVar125._0_8_ = local_9b0._0_8_;
        auVar124._8_8_ = 0x7f0000007f;
        auVar124._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar125,auVar124);
        local_9b0._0_8_ = auVar2._0_8_;
        local_940 = local_9b0._0_8_;
        local_9b0._8_8_ = auVar2._8_8_;
        uStack_938 = local_9b0._8_8_;
        local_944 = 0x17;
        local_9b0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_70 = local_9b0._0_8_;
        uStack_68 = local_9b0._8_8_;
        local_a00 = local_9b0._0_8_;
        uStack_9f8 = local_9b0._8_8_;
        local_920._4_4_ = fStack_9ec;
        local_920._0_4_ = local_9f0;
        local_920._8_4_ = fStack_9e8;
        local_920._12_4_ = fStack_9e4;
        local_930._0_4_ = local_9b0._0_4_;
        local_930._4_4_ = local_9b0._4_4_;
        uStack_928._0_4_ = local_9b0._8_4_;
        uStack_928._4_4_ = local_9b0._12_4_;
        local_9f0 = local_9f0 * (float)local_930;
        fStack_9ec = fStack_9ec * local_930._4_4_;
        fStack_9e8 = fStack_9e8 * (float)uStack_928;
        fStack_9e4 = fStack_9e4 * uStack_928._4_4_;
        local_a20 = CONCAT44(fStack_9ec,local_9f0);
        uStack_a18 = CONCAT44(fStack_9e4,fStack_9e8);
        local_630 = local_9f0 + 1.0;
        fStack_62c = fStack_9ec + 1.0;
        fStack_628 = fStack_9e8 + 1.0;
        fStack_624 = fStack_9e4 + 1.0;
        auVar129._4_4_ = fStack_62c;
        auVar129._0_4_ = local_630;
        auVar129._8_4_ = fStack_628;
        auVar129._12_4_ = fStack_624;
        _local_2070 = vdivps_avx(local_a10,auVar129);
        local_e60._0_4_ = (float)local_2070._0_4_ * 2.0;
        local_e60._4_4_ = (float)local_2070._4_4_ * 2.0;
        local_e60._8_4_ = fStack_2068 * 2.0;
        local_e60._12_4_ = fStack_2064 * 2.0;
        auVar118._8_8_ = 0x3f8000003f800000;
        auVar118._0_8_ = 0x3f8000003f800000;
        _local_20f0 = vsubps_avx(local_e60,auVar118);
        local_20e0._0_4_ = (float)local_6ab0;
        local_20e0._4_4_ = (float)((ulong)local_6ab0 >> 0x20);
        uStack_20d8._0_4_ = (float)uStack_6aa8;
        uStack_20d8._4_4_ = (float)((ulong)uStack_6aa8 >> 0x20);
        local_6cd0 = CONCAT44(local_20e0._4_4_ * (float)local_20f0._4_4_,
                              (float)local_20e0 * (float)local_20f0._0_4_);
        uStack_6cc8 = CONCAT44(uStack_20d8._4_4_ * fStack_20e4,(float)uStack_20d8 * fStack_20e8);
        local_6a68 = local_6c70;
        local_6a80 = local_6cd0;
        uStack_6a78 = uStack_6cc8;
        auVar33._8_8_ = uStack_6cc8;
        auVar33._0_8_ = local_6cd0;
        *local_6c70 = auVar33;
        local_6c70 = local_6c70 + 1;
        local_20e0 = local_6ab0;
        uStack_20d8 = uStack_6aa8;
        local_2080 = local_20b0;
        uStack_2078 = uStack_20a8;
        local_2060 = local_20b0;
        uStack_2058 = uStack_20a8;
        local_2050 = local_1f50;
        uStack_2048 = uStack_1f48;
        local_1eb0 = local_1f90;
        uStack_1ea8 = uStack_1f88;
        local_1d50 = local_1d60;
        uStack_1d48 = uStack_1d58;
        local_18f0 = local_1fd0;
        uStack_18e8 = uStack_1fc8;
        local_17b0 = uVar13;
        uStack_17a8 = uVar14;
        local_17a0 = uVar11;
        uStack_1798 = uVar12;
        local_1780 = uVar9;
        uStack_1778 = uVar10;
        local_16f0 = local_1f70;
        uStack_16e8 = uStack_1f68;
        local_16a0 = local_1f20;
        uStack_1698 = uStack_1f18;
        local_1660 = local_16e0._0_8_;
        uStack_1658 = local_16e0._8_8_;
        local_1570 = local_1580;
        uStack_1568 = uStack_1578;
        local_1560 = local_1ec0;
        uStack_1558 = uStack_1eb8;
        local_1540 = local_1f00;
        uStack_1538 = uStack_1ef8;
        local_1530 = local_16d0;
        uStack_1528 = uStack_16c8;
        local_1510 = uVar7;
        uStack_1508 = uVar8;
        local_14c0 = local_1ee0;
        uStack_14b8 = uStack_1ed8;
        local_1420 = local_1ee0;
        uStack_1418 = uStack_1ed8;
        uStack_108c = local_1090;
        uStack_1088 = local_1090;
        uStack_1084 = local_1090;
        uStack_106c = local_1070;
        uStack_1068 = local_1070;
        uStack_1064 = local_1070;
        uStack_104c = local_1050;
        uStack_1048 = local_1050;
        uStack_1044 = local_1050;
        local_e70 = local_20a0;
        uStack_e68 = uStack_2098;
        local_9c0 = local_1f70;
        uStack_9b8 = uStack_1f68;
        local_930 = local_9b0._0_8_;
        uStack_928 = local_9b0._8_8_;
        local_840 = local_850;
        uStack_838 = uStack_848;
        local_830 = local_1ec0;
        uStack_828 = uStack_1eb8;
        local_810 = local_1f00;
        uStack_808 = uStack_1ef8;
        local_800 = local_9a0;
        uStack_7f8 = uStack_998;
        local_7f0 = local_1520;
        uStack_7e8 = uStack_1518;
        local_7e0 = uVar15;
        uStack_7d8 = uVar16;
        local_790 = local_1ee0;
        uStack_788 = uStack_1ed8;
        local_770 = local_14a0;
        uStack_768 = uStack_1498;
        local_750 = local_1480;
        uStack_748 = uStack_1478;
        local_730 = local_1460;
        uStack_728 = uStack_1458;
        local_710 = local_1440;
        uStack_708 = uStack_1438;
        local_6f0 = local_1ee0;
        uStack_6e8 = uStack_1ed8;
        uStack_6cc = local_6d0;
        uStack_6c8 = local_6d0;
        uStack_6c4 = local_6d0;
        local_620 = local_a10;
        local_5a0 = local_5e0;
        local_580 = local_5e0;
        local_4d0 = local_530;
        uStack_4c8 = uStack_528;
        local_2b0 = local_1ee0;
        uStack_2a8 = uStack_1ed8;
        local_190 = local_1f0;
        uStack_188 = uStack_1e8;
        local_180 = local_6ab0;
        uStack_178 = uStack_6aa8;
      }
    }
  }
  else {
    for (local_6cd4 = 0; local_6cd4 < local_6bbc; local_6cd4 = local_6cd4 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffff9130._0_8_,
                         (int)((ulong)in_stack_ffffffffffff9128 >> 0x20));
      pauVar173 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_6d28);
      ncnn::Mat::~Mat((Mat *)0x8f97b0);
      local_6ce0 = pauVar173;
      for (local_6d2c = 0; local_6d2c + 7 < local_6bc0; local_6d2c = local_6d2c + 8) {
        local_6b90 = local_6ce0;
        local_6b80 = *(undefined8 *)*local_6ce0;
        uStack_6b78 = *(undefined8 *)(*local_6ce0 + 8);
        uStack_6b70 = *(undefined8 *)(*local_6ce0 + 0x10);
        auVar167 = *(undefined1 (*) [24])*local_6ce0;
        uStack_6b68 = *(undefined8 *)(*local_6ce0 + 0x18);
        local_3880 = ZEXT832(0) << 0x20;
        local_62c0 = 0x3f8000003f800000;
        uStack_62b8 = 0x3f8000003f800000;
        uStack_62b0 = 0x3f8000003f800000;
        uStack_62a8 = 0x3f8000003f800000;
        local_5100._0_8_ = auVar167._0_8_;
        local_2d60 = local_5100._0_8_;
        local_5100._8_8_ = auVar167._8_8_;
        uStack_2d58 = local_5100._8_8_;
        local_5100._16_8_ = auVar167._16_8_;
        uStack_2d50 = local_5100._16_8_;
        local_2dc0 = 0x42b0c0a542b0c0a5;
        uStack_2db8 = 0x42b0c0a542b0c0a5;
        uStack_2db0 = 0x42b0c0a542b0c0a5;
        uStack_2da8 = 0x42b0c0a542b0c0a5;
        auVar82._8_8_ = 0x42b0c0a542b0c0a5;
        auVar82._0_8_ = 0x42b0c0a542b0c0a5;
        auVar82._16_8_ = 0x42b0c0a542b0c0a5;
        auVar82._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(*local_6ce0,auVar82);
        local_5100._0_8_ = auVar5._0_8_;
        local_3760 = local_5100._0_8_;
        local_5100._8_8_ = auVar5._8_8_;
        uStack_3758 = local_5100._8_8_;
        local_5100._16_8_ = auVar5._16_8_;
        uStack_3750 = local_5100._16_8_;
        local_5100._24_8_ = auVar5._24_8_;
        uStack_3748 = local_5100._24_8_;
        local_37c0 = 0xc2b0c0a5c2b0c0a5;
        uStack_37b8 = 0xc2b0c0a5c2b0c0a5;
        uStack_37b0 = 0xc2b0c0a5c2b0c0a5;
        uStack_37a8 = 0xc2b0c0a5c2b0c0a5;
        auVar58._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar58._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar58._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar58._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar58);
        local_5100._0_8_ = auVar4._0_8_;
        uVar7 = local_5100._0_8_;
        local_5100._8_8_ = auVar4._8_8_;
        uVar8 = local_5100._8_8_;
        local_5100._16_8_ = auVar4._16_8_;
        uVar9 = local_5100._16_8_;
        local_5100._24_8_ = auVar4._24_8_;
        uVar10 = local_5100._24_8_;
        local_4e60 = 0x3fb8aa3b3fb8aa3b;
        uStack_4e58 = 0x3fb8aa3b3fb8aa3b;
        uStack_4e50 = 0x3fb8aa3b3fb8aa3b;
        uStack_4e48 = 0x3fb8aa3b3fb8aa3b;
        local_4e40._0_4_ = auVar4._0_4_;
        local_4e40._4_4_ = auVar4._4_4_;
        uStack_4e38._0_4_ = auVar4._8_4_;
        uStack_4e38._4_4_ = auVar4._12_4_;
        uStack_4e30._0_4_ = auVar4._16_4_;
        uStack_4e30._4_4_ = auVar4._20_4_;
        uStack_4e28._0_4_ = auVar4._24_4_;
        uStack_4e28._4_4_ = auVar4._28_4_;
        local_5140._4_4_ = local_4e40._4_4_ * 1.442695;
        local_5140._0_4_ = (float)local_4e40 * 1.442695;
        uStack_5138._0_4_ = (float)uStack_4e38 * 1.442695;
        uStack_5138._4_4_ = uStack_4e38._4_4_ * 1.442695;
        uStack_5130._0_4_ = (float)uStack_4e30 * 1.442695;
        uStack_5130._4_4_ = uStack_4e30._4_4_ * 1.442695;
        auVar167 = _local_5140;
        uStack_5128._0_4_ = (float)uStack_4e28 * 1.442695;
        uStack_5128._4_4_ = uStack_4e28._4_4_;
        auVar5 = _local_5140;
        local_4c40 = local_5140;
        uStack_4c38 = uStack_5138;
        uStack_5130 = auVar167._16_8_;
        uStack_4c30 = uStack_5130;
        uStack_5128 = auVar5._24_8_;
        uStack_4c28 = uStack_5128;
        local_6220 = 0x3f0000003f000000;
        uStack_6218 = 0x3f0000003f000000;
        uStack_6210 = 0x3f0000003f000000;
        uStack_6208 = 0x3f0000003f000000;
        local_5140._4_4_ = local_4e40._4_4_ * 1.442695 + 0.5;
        local_5140._0_4_ = (float)local_4e40 * 1.442695 + 0.5;
        uStack_5138._0_4_ = (float)uStack_4e38 * 1.442695 + 0.5;
        uStack_5138._4_4_ = uStack_4e38._4_4_ * 1.442695 + 0.5;
        uStack_5130._0_4_ = (float)uStack_4e30 * 1.442695 + 0.5;
        uStack_5130._4_4_ = uStack_4e30._4_4_ * 1.442695 + 0.5;
        uStack_5128._0_4_ = (float)uStack_4e28 * 1.442695 + 0.5;
        uStack_5128._4_4_ = uStack_4e28._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_5140,1);
        auVar5 = vcmpps_avx(_local_5140,auVar6,1);
        local_51a0._0_8_ = auVar5._0_8_;
        local_3420 = local_51a0._0_8_;
        local_51a0._8_8_ = auVar5._8_8_;
        uStack_3418 = local_51a0._8_8_;
        local_51a0._16_8_ = auVar5._16_8_;
        uStack_3410 = local_51a0._16_8_;
        local_51a0._24_8_ = auVar5._24_8_;
        uStack_3408 = local_51a0._24_8_;
        local_3440 = 0x3f8000003f800000;
        uStack_3438 = 0x3f8000003f800000;
        uStack_3430 = 0x3f8000003f800000;
        uStack_3428 = 0x3f8000003f800000;
        auVar66._8_8_ = 0x3f8000003f800000;
        auVar66._0_8_ = 0x3f8000003f800000;
        auVar66._16_8_ = 0x3f8000003f800000;
        auVar66._24_8_ = 0x3f8000003f800000;
        local_51a0 = vandps_avx(auVar5,auVar66);
        local_5120 = auVar6._0_8_;
        local_4b60 = local_5120;
        uStack_5118 = auVar6._8_8_;
        uStack_4b58 = uStack_5118;
        uStack_5110 = auVar6._16_8_;
        uStack_4b50 = uStack_5110;
        uStack_5108 = auVar6._24_8_;
        uStack_4b48 = uStack_5108;
        local_4b80 = local_51a0._0_8_;
        uStack_4b78 = local_51a0._8_8_;
        uStack_4b70 = local_51a0._16_8_;
        uStack_4b68 = local_51a0._24_8_;
        _local_5140 = vsubps_avx(auVar6,local_51a0);
        local_6260 = 0x3f3180003f318000;
        uStack_6258 = 0x3f3180003f318000;
        uStack_6250 = 0x3f3180003f318000;
        uStack_6248 = 0x3f3180003f318000;
        local_4e80._0_4_ = local_5140._0_4_;
        local_4e80._4_4_ = local_5140._4_4_;
        uStack_4e78._0_4_ = local_5140._8_4_;
        uStack_4e78._4_4_ = local_5140._12_4_;
        uStack_4e70._0_4_ = local_5140._16_4_;
        uStack_4e70._4_4_ = local_5140._20_4_;
        uStack_4e68._0_4_ = local_5140._24_4_;
        uStack_4e68._4_4_ = local_5140._28_4_;
        local_5120._4_4_ = local_4e80._4_4_ * 0.6933594;
        local_5120._0_4_ = (float)local_4e80 * 0.6933594;
        uStack_5118._0_4_ = (float)uStack_4e78 * 0.6933594;
        uStack_5118._4_4_ = uStack_4e78._4_4_ * 0.6933594;
        uStack_5110._0_4_ = (float)uStack_4e70 * 0.6933594;
        uStack_5110._4_4_ = uStack_4e70._4_4_ * 0.6933594;
        auVar167 = _local_5120;
        uStack_5108._0_4_ = (float)uStack_4e68 * 0.6933594;
        uStack_5108._4_4_ = uStack_4e68._4_4_;
        auVar58 = _local_5120;
        local_4ec0 = local_5140;
        uStack_4eb8 = uStack_5138;
        uStack_4eb0 = uStack_5130;
        uStack_4ea8 = uStack_5128;
        local_61e0 = 0xb95e8083b95e8083;
        uStack_61d8 = 0xb95e8083b95e8083;
        uStack_61d0 = 0xb95e8083b95e8083;
        uStack_61c8 = 0xb95e8083b95e8083;
        local_4ba0 = local_5100._0_8_;
        uStack_4b98 = local_5100._8_8_;
        uStack_4b90 = local_5100._16_8_;
        uStack_4b88 = local_5100._24_8_;
        local_4bc0 = local_5120;
        uStack_4bb8 = uStack_5118;
        uStack_5110 = auVar167._16_8_;
        uStack_4bb0 = uStack_5110;
        uStack_5108 = auVar58._24_8_;
        uStack_4ba8 = uStack_5108;
        auVar6._16_8_ = uStack_5110;
        auVar6._0_16_ = _local_5120;
        auVar6._24_8_ = uStack_5108;
        auVar5 = vsubps_avx(auVar4,auVar6);
        local_5100._0_8_ = auVar5._0_8_;
        local_4be0 = local_5100._0_8_;
        local_5100._8_8_ = auVar5._8_8_;
        uStack_4bd8 = local_5100._8_8_;
        local_5100._16_8_ = auVar5._16_8_;
        uStack_4bd0 = local_5100._16_8_;
        local_5100._24_8_ = auVar5._24_8_;
        uStack_4bc8 = local_5100._24_8_;
        local_4c00 = CONCAT44(local_4e80._4_4_ * -0.00021219444,(float)local_4e80 * -0.00021219444);
        uStack_4bf8 = CONCAT44(uStack_4e78._4_4_ * -0.00021219444,
                               (float)uStack_4e78 * -0.00021219444);
        uStack_4bf0 = CONCAT44(uStack_4e70._4_4_ * -0.00021219444,
                               (float)uStack_4e70 * -0.00021219444);
        uStack_4be8 = CONCAT44(uStack_4e68._4_4_,(float)uStack_4e68 * -0.00021219444);
        auVar4._8_8_ = uStack_4bf8;
        auVar4._0_8_ = local_4c00;
        auVar4._16_8_ = uStack_4bf0;
        auVar4._24_8_ = uStack_4be8;
        local_5100 = vsubps_avx(auVar5,auVar4);
        local_4f20 = local_5100._0_8_;
        uStack_4f18 = local_5100._8_8_;
        uStack_4f10 = local_5100._16_8_;
        uStack_4f08 = local_5100._24_8_;
        local_4f00._0_4_ = local_5100._0_4_;
        local_4f00._4_4_ = local_5100._4_4_;
        uStack_4ef8._0_4_ = local_5100._8_4_;
        uStack_4ef8._4_4_ = local_5100._12_4_;
        uStack_4ef0._0_4_ = local_5100._16_4_;
        uStack_4ef0._4_4_ = local_5100._20_4_;
        uStack_4ee8._0_4_ = local_5100._24_4_;
        uStack_4ee8._4_4_ = local_5100._28_4_;
        fStack_51a4 = uStack_4ee8._4_4_;
        local_51c0 = (float)local_4f00 * (float)local_4f00;
        fStack_51bc = local_4f00._4_4_ * local_4f00._4_4_;
        fStack_51b8 = (float)uStack_4ef8 * (float)uStack_4ef8;
        fStack_51b4 = uStack_4ef8._4_4_ * uStack_4ef8._4_4_;
        fStack_51b0 = (float)uStack_4ef0 * (float)uStack_4ef0;
        fStack_51ac = uStack_4ef0._4_4_ * uStack_4ef0._4_4_;
        fStack_51a8 = (float)uStack_4ee8 * (float)uStack_4ee8;
        local_4f40 = 0x3950696739506967;
        uStack_4f38 = 0x3950696739506967;
        uStack_4f30 = 0x3950696739506967;
        uStack_4f28 = 0x3950696739506967;
        local_4f60 = local_5100._0_8_;
        uStack_4f58 = local_5100._8_8_;
        uStack_4f50 = local_5100._16_8_;
        uStack_4f48 = local_5100._24_8_;
        local_51e0 = CONCAT44(local_4f00._4_4_ * 0.00019875691,(float)local_4f00 * 0.00019875691);
        uStack_51d8 = CONCAT44(uStack_4ef8._4_4_ * 0.00019875691,(float)uStack_4ef8 * 0.00019875691)
        ;
        uStack_51d0 = CONCAT44(uStack_4ef0._4_4_ * 0.00019875691,(float)uStack_4ef0 * 0.00019875691)
        ;
        uStack_51c8 = CONCAT44(0x39506967,(float)uStack_4ee8 * 0.00019875691);
        local_4c80 = local_51e0;
        uStack_4c78 = uStack_51d8;
        uStack_4c70 = uStack_51d0;
        uStack_4c68 = uStack_51c8;
        local_4ca0 = 0x3ab743ce3ab743ce;
        uStack_4c98 = 0x3ab743ce3ab743ce;
        uStack_4c90 = 0x3ab743ce3ab743ce;
        uStack_4c88 = 0x3ab743ce3ab743ce;
        fVar175 = (float)local_4f00 * 0.00019875691 + 0.0013981999;
        fVar177 = local_4f00._4_4_ * 0.00019875691 + 0.0013981999;
        fVar178 = (float)uStack_4ef8 * 0.00019875691 + 0.0013981999;
        fVar179 = uStack_4ef8._4_4_ * 0.00019875691 + 0.0013981999;
        fVar180 = (float)uStack_4ef0 * 0.00019875691 + 0.0013981999;
        fVar181 = uStack_4ef0._4_4_ * 0.00019875691 + 0.0013981999;
        fVar182 = (float)uStack_4ee8 * 0.00019875691 + 0.0013981999;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3ad150fb,fVar182);
        local_4f80 = local_51e0;
        uStack_4f78 = uStack_51d8;
        uStack_4f70 = uStack_51d0;
        uStack_4f68 = uStack_51c8;
        local_4fa0 = local_5100._0_8_;
        uStack_4f98 = local_5100._8_8_;
        uStack_4f90 = local_5100._16_8_;
        uStack_4f88 = local_5100._24_8_;
        fVar175 = fVar175 * (float)local_4f00;
        fVar177 = fVar177 * local_4f00._4_4_;
        fVar178 = fVar178 * (float)uStack_4ef8;
        fVar179 = fVar179 * uStack_4ef8._4_4_;
        fVar180 = fVar180 * (float)uStack_4ef0;
        fVar181 = fVar181 * uStack_4ef0._4_4_;
        fVar182 = fVar182 * (float)uStack_4ee8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3ad150fb,fVar182);
        local_4cc0 = local_51e0;
        uStack_4cb8 = uStack_51d8;
        uStack_4cb0 = uStack_51d0;
        uStack_4ca8 = uStack_51c8;
        local_4ce0 = 0x3c0889083c088908;
        uStack_4cd8 = 0x3c0889083c088908;
        uStack_4cd0 = 0x3c0889083c088908;
        uStack_4cc8 = 0x3c0889083c088908;
        fVar175 = fVar175 + 0.008333452;
        fVar177 = fVar177 + 0.008333452;
        fVar178 = fVar178 + 0.008333452;
        fVar179 = fVar179 + 0.008333452;
        fVar180 = fVar180 + 0.008333452;
        fVar181 = fVar181 + 0.008333452;
        fVar182 = fVar182 + 0.008333452;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3c22b327,fVar182);
        local_4fc0 = local_51e0;
        uStack_4fb8 = uStack_51d8;
        uStack_4fb0 = uStack_51d0;
        uStack_4fa8 = uStack_51c8;
        local_4fe0 = local_5100._0_8_;
        uStack_4fd8 = local_5100._8_8_;
        uStack_4fd0 = local_5100._16_8_;
        uStack_4fc8 = local_5100._24_8_;
        fVar175 = fVar175 * (float)local_4f00;
        fVar177 = fVar177 * local_4f00._4_4_;
        fVar178 = fVar178 * (float)uStack_4ef8;
        fVar179 = fVar179 * uStack_4ef8._4_4_;
        fVar180 = fVar180 * (float)uStack_4ef0;
        fVar181 = fVar181 * uStack_4ef0._4_4_;
        fVar182 = fVar182 * (float)uStack_4ee8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3c22b327,fVar182);
        local_4d00 = local_51e0;
        uStack_4cf8 = uStack_51d8;
        uStack_4cf0 = uStack_51d0;
        uStack_4ce8 = uStack_51c8;
        local_4d20 = 0x3d2aa9c13d2aa9c1;
        uStack_4d18 = 0x3d2aa9c13d2aa9c1;
        uStack_4d10 = 0x3d2aa9c13d2aa9c1;
        uStack_4d08 = 0x3d2aa9c13d2aa9c1;
        fVar175 = fVar175 + 0.041665796;
        fVar177 = fVar177 + 0.041665796;
        fVar178 = fVar178 + 0.041665796;
        fVar179 = fVar179 + 0.041665796;
        fVar180 = fVar180 + 0.041665796;
        fVar181 = fVar181 + 0.041665796;
        fVar182 = fVar182 + 0.041665796;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3d53568b,fVar182);
        local_5000 = local_51e0;
        uStack_4ff8 = uStack_51d8;
        uStack_4ff0 = uStack_51d0;
        uStack_4fe8 = uStack_51c8;
        local_5020 = local_5100._0_8_;
        uStack_5018 = local_5100._8_8_;
        uStack_5010 = local_5100._16_8_;
        uStack_5008 = local_5100._24_8_;
        fVar175 = fVar175 * (float)local_4f00;
        fVar177 = fVar177 * local_4f00._4_4_;
        fVar178 = fVar178 * (float)uStack_4ef8;
        fVar179 = fVar179 * uStack_4ef8._4_4_;
        fVar180 = fVar180 * (float)uStack_4ef0;
        fVar181 = fVar181 * uStack_4ef0._4_4_;
        fVar182 = fVar182 * (float)uStack_4ee8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3d53568b,fVar182);
        local_4d40 = local_51e0;
        uStack_4d38 = uStack_51d8;
        uStack_4d30 = uStack_51d0;
        uStack_4d28 = uStack_51c8;
        local_4d60 = 0x3e2aaaaa3e2aaaaa;
        uStack_4d58 = 0x3e2aaaaa3e2aaaaa;
        uStack_4d50 = 0x3e2aaaaa3e2aaaaa;
        uStack_4d48 = 0x3e2aaaaa3e2aaaaa;
        fVar175 = fVar175 + 0.16666666;
        fVar177 = fVar177 + 0.16666666;
        fVar178 = fVar178 + 0.16666666;
        fVar179 = fVar179 + 0.16666666;
        fVar180 = fVar180 + 0.16666666;
        fVar181 = fVar181 + 0.16666666;
        fVar182 = fVar182 + 0.16666666;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3e5f804d,fVar182);
        local_5040 = local_51e0;
        uStack_5038 = uStack_51d8;
        uStack_5030 = uStack_51d0;
        uStack_5028 = uStack_51c8;
        local_5060 = local_5100._0_8_;
        uStack_5058 = local_5100._8_8_;
        uStack_5050 = local_5100._16_8_;
        uStack_5048 = local_5100._24_8_;
        fVar175 = fVar175 * (float)local_4f00;
        fVar177 = fVar177 * local_4f00._4_4_;
        fVar178 = fVar178 * (float)uStack_4ef8;
        fVar179 = fVar179 * uStack_4ef8._4_4_;
        fVar180 = fVar180 * (float)uStack_4ef0;
        fVar181 = fVar181 * uStack_4ef0._4_4_;
        fVar182 = fVar182 * (float)uStack_4ee8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3e5f804d,fVar182);
        local_4d80 = local_51e0;
        uStack_4d78 = uStack_51d8;
        uStack_4d70 = uStack_51d0;
        uStack_4d68 = uStack_51c8;
        fVar175 = fVar175 + 0.5;
        fVar177 = fVar177 + 0.5;
        fVar178 = fVar178 + 0.5;
        fVar179 = fVar179 + 0.5;
        fVar180 = fVar180 + 0.5;
        fVar181 = fVar181 + 0.5;
        fVar182 = fVar182 + 0.5;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3f37e013,fVar182);
        local_5080 = local_51e0;
        uStack_5078 = uStack_51d8;
        uStack_5070 = uStack_51d0;
        uStack_5068 = uStack_51c8;
        local_50a0 = CONCAT44(fStack_51bc,local_51c0);
        uStack_5098 = CONCAT44(fStack_51b4,fStack_51b8);
        uStack_5090 = CONCAT44(fStack_51ac,fStack_51b0);
        uStack_5088 = CONCAT44(uStack_4ee8._4_4_,fStack_51a8);
        fVar175 = fVar175 * local_51c0;
        fVar177 = fVar177 * fStack_51bc;
        fVar178 = fVar178 * fStack_51b8;
        fVar179 = fVar179 * fStack_51b4;
        fVar180 = fVar180 * fStack_51b0;
        fVar181 = fVar181 * fStack_51ac;
        fVar182 = fVar182 * fStack_51a8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(0x3f37e013,fVar182);
        local_4dc0 = local_51e0;
        uStack_4db8 = uStack_51d8;
        uStack_4db0 = uStack_51d0;
        uStack_4da8 = uStack_51c8;
        local_4de0 = local_5100._0_8_;
        uStack_4dd8 = local_5100._8_8_;
        uStack_4dd0 = local_5100._16_8_;
        uStack_4dc8 = local_5100._24_8_;
        fVar175 = fVar175 + (float)local_4f00;
        fVar177 = fVar177 + local_4f00._4_4_;
        fVar178 = fVar178 + (float)uStack_4ef8;
        fVar179 = fVar179 + uStack_4ef8._4_4_;
        fVar180 = fVar180 + (float)uStack_4ef0;
        fVar181 = fVar181 + uStack_4ef0._4_4_;
        fVar182 = fVar182 + (float)uStack_4ee8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(uStack_4ee8._4_4_ + 0.71826285,fVar182);
        local_4e00 = local_51e0;
        uStack_4df8 = uStack_51d8;
        uStack_4df0 = uStack_51d0;
        uStack_4de8 = uStack_51c8;
        local_4e20 = 0x3f8000003f800000;
        uStack_4e18 = 0x3f8000003f800000;
        uStack_4e10 = 0x3f8000003f800000;
        uStack_4e08 = 0x3f8000003f800000;
        fVar175 = fVar175 + 1.0;
        fVar177 = fVar177 + 1.0;
        fVar178 = fVar178 + 1.0;
        fVar179 = fVar179 + 1.0;
        fVar180 = fVar180 + 1.0;
        fVar181 = fVar181 + 1.0;
        fVar182 = fVar182 + 1.0;
        fVar183 = uStack_4ee8._4_4_ + 0.71826285 + 1.0;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(fVar183,fVar182);
        local_2cc0 = local_5140;
        uStack_2cb8 = uStack_5138;
        uStack_2cb0 = uStack_5130;
        uStack_2ca8 = uStack_5128;
        local_5160 = CONCAT44((int)local_4e80._4_4_,(int)(float)local_4e80);
        uStack_5158 = CONCAT44((int)uStack_4e78._4_4_,(int)(float)uStack_4e78);
        uStack_5150 = CONCAT44((int)uStack_4e70._4_4_,(int)(float)uStack_4e70);
        uStack_5148 = CONCAT44((int)uStack_4e68._4_4_,(int)(float)uStack_4e68);
        local_29a0 = local_5160;
        uStack_2998 = uStack_5158;
        uStack_2990 = uStack_5150;
        uStack_2988 = uStack_5148;
        local_29c0 = 0x7f0000007f;
        uStack_29b8 = 0x7f0000007f;
        uStack_29b0 = 0x7f0000007f;
        uStack_29a8 = 0x7f0000007f;
        local_2a40 = local_5160;
        uStack_2a38 = uStack_5158;
        uStack_2a30 = uStack_5150;
        uStack_2a28 = uStack_5148;
        local_2a60 = 0x7f0000007f;
        uStack_2a58 = 0x7f0000007f;
        uStack_2a50 = 0x7f0000007f;
        uStack_2a48 = 0x7f0000007f;
        local_29f0 = 0x7f0000007f;
        uStack_29e8 = 0x7f0000007f;
        local_2a00 = 0x7f0000007f;
        uStack_29f8 = 0x7f0000007f;
        local_2490 = local_5160;
        uStack_2488 = uStack_5158;
        local_24a0 = 0x7f0000007f;
        uStack_2498 = 0x7f0000007f;
        auVar90._8_8_ = uStack_5158;
        auVar90._0_8_ = local_5160;
        auVar89._8_8_ = 0x7f0000007f;
        auVar89._0_8_ = 0x7f0000007f;
        local_29d0 = vpaddd_avx(auVar90,auVar89);
        local_24b0 = uStack_5150;
        uStack_24a8 = uStack_5148;
        local_24c0 = 0x7f0000007f;
        uStack_24b8 = 0x7f0000007f;
        auVar88._8_8_ = uStack_5148;
        auVar88._0_8_ = uStack_5150;
        auVar3._8_8_ = 0x7f0000007f;
        auVar3._0_8_ = 0x7f0000007f;
        local_29e0 = vpaddd_avx(auVar88,auVar3);
        local_2a80 = local_29d0._0_8_;
        uStack_2a78 = local_29d0._8_8_;
        uStack_2a70 = local_29e0._0_8_;
        uStack_2a68 = local_29e0._8_8_;
        local_2a20 = local_29d0._0_8_;
        uStack_2a18 = local_29d0._8_8_;
        uStack_2a10 = local_29e0._0_8_;
        uStack_2a08 = local_29e0._8_8_;
        local_2660 = local_29d0._0_8_;
        uStack_2658 = local_29d0._8_8_;
        uStack_2650 = local_29e0._0_8_;
        uStack_2648 = local_29e0._8_8_;
        local_2664 = 0x17;
        local_26e0 = local_29d0._0_8_;
        uStack_26d8 = local_29d0._8_8_;
        uStack_26d0 = local_29e0._0_8_;
        uStack_26c8 = local_29e0._8_8_;
        local_2390 = local_29d0._0_8_;
        uStack_2388 = local_29d0._8_8_;
        local_2394 = 0x17;
        local_2680 = vpslld_avx(local_29d0,ZEXT416(0x17));
        local_23b0 = local_29e0._0_8_;
        uStack_23a8 = local_29e0._8_8_;
        local_23b4 = 0x17;
        local_2690 = vpslld_avx(local_29e0,ZEXT416(0x17));
        local_2700 = local_2680._0_8_;
        uStack_26f8 = local_2680._8_8_;
        uStack_26f0 = local_2690._0_8_;
        uStack_26e8 = local_2690._8_8_;
        local_26c0 = local_2680._0_8_;
        uStack_26b8 = local_2680._8_8_;
        uStack_26b0 = local_2690._0_8_;
        uStack_26a8 = local_2690._8_8_;
        local_5160 = local_2680._0_8_;
        uStack_5158 = local_2680._8_8_;
        uStack_5150 = local_2690._0_8_;
        uStack_5148 = local_2690._8_8_;
        local_2540 = local_2680._0_8_;
        uStack_2538 = local_2680._8_8_;
        uStack_2530 = local_2690._0_8_;
        uStack_2528 = local_2690._8_8_;
        local_5200 = local_2680._0_8_;
        uStack_51f8 = local_2680._8_8_;
        uStack_51f0 = local_2690._0_8_;
        uStack_51e8 = local_2690._8_8_;
        local_50c0 = local_51e0;
        uStack_50b8 = uStack_51d8;
        uStack_50b0 = uStack_51d0;
        uStack_50a8 = uStack_51c8;
        local_50e0._0_4_ = local_2680._0_4_;
        local_50e0._4_4_ = local_2680._4_4_;
        uStack_50d8._0_4_ = local_2680._8_4_;
        uStack_50d8._4_4_ = local_2680._12_4_;
        uStack_50d0._0_4_ = local_2690._0_4_;
        uStack_50d0._4_4_ = local_2690._4_4_;
        uStack_50c8._0_4_ = local_2690._8_4_;
        fVar175 = fVar175 * (float)local_50e0;
        fVar177 = fVar177 * local_50e0._4_4_;
        fVar178 = fVar178 * (float)uStack_50d8;
        fVar179 = fVar179 * uStack_50d8._4_4_;
        fVar180 = fVar180 * (float)uStack_50d0;
        fVar181 = fVar181 * uStack_50d0._4_4_;
        fVar182 = fVar182 * (float)uStack_50c8;
        local_51e0 = CONCAT44(fVar177,fVar175);
        uStack_51d8 = CONCAT44(fVar179,fVar178);
        uStack_51d0 = CONCAT44(fVar181,fVar180);
        uStack_51c8 = CONCAT44(fVar183,fVar182);
        local_5800 = local_51e0;
        uStack_57f8 = uStack_51d8;
        uStack_57f0 = uStack_51d0;
        uStack_57e8 = uStack_51c8;
        local_4c04 = 0x3f800000;
        local_2260 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2280 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2270 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_3080 = 0x7f0000007f;
        uStack_3078 = 0x7f0000007f;
        uStack_3070 = 0x7f0000007f;
        uStack_3068 = 0x7f0000007f;
        local_38a0 = 0;
        uStack_6e78 = SUB328(ZEXT832(0),4);
        uStack_3898 = uStack_6e78;
        uStack_3890 = 0;
        uStack_3888 = 0;
        local_5820._0_4_ = local_2280._0_4_;
        local_5820._4_4_ = local_2280._4_4_;
        uStack_5818._0_4_ = local_2280._8_4_;
        uStack_5818._4_4_ = local_2280._12_4_;
        uStack_5810._0_4_ = auStack_2270._0_4_;
        uStack_5810._4_4_ = auStack_2270._4_4_;
        uStack_5808._0_4_ = auStack_2270._8_4_;
        uStack_5808._4_4_ = auStack_2270._12_4_;
        local_6280._4_4_ = fVar177 + local_5820._4_4_;
        local_6280._0_4_ = fVar175 + (float)local_5820;
        uStack_6278._0_4_ = fVar178 + (float)uStack_5818;
        uStack_6278._4_4_ = fVar179 + uStack_5818._4_4_;
        uStack_6270._0_4_ = fVar180 + (float)uStack_5810;
        uStack_6270._4_4_ = fVar181 + uStack_5810._4_4_;
        auVar167 = _local_6280;
        uStack_6268._0_4_ = fVar182 + (float)uStack_5808;
        uStack_6268._4_4_ = fVar183 + uStack_5808._4_4_;
        auVar5 = _local_6280;
        local_62e0 = vcmpps_avx(_local_6280,ZEXT832(uStack_6e78) << 0x40,2);
        local_36e0 = local_6280;
        uStack_36d8 = uStack_6278;
        uStack_6270 = auVar167._16_8_;
        uStack_36d0 = uStack_6270;
        uStack_6268 = auVar5._24_8_;
        uStack_36c8 = uStack_6268;
        local_3700 = 0x80000000800000;
        uStack_36f8 = 0x80000000800000;
        uStack_36f0 = 0x80000000800000;
        uStack_36e8 = 0x80000000800000;
        auVar61._16_8_ = uStack_6270;
        auVar61._0_16_ = _local_6280;
        auVar61._24_8_ = uStack_6268;
        auVar60._8_8_ = 0x80000000800000;
        auVar60._0_8_ = 0x80000000800000;
        auVar60._16_8_ = 0x80000000800000;
        auVar60._24_8_ = 0x80000000800000;
        auVar5 = vmaxps_avx(auVar61,auVar60);
        local_6280 = auVar5._0_8_;
        local_3500 = local_6280;
        uStack_6278 = auVar5._8_8_;
        uStack_34f8 = uStack_6278;
        uStack_6270 = auVar5._16_8_;
        uStack_34f0 = uStack_6270;
        uStack_6268 = auVar5._24_8_;
        uStack_34e8 = uStack_6268;
        local_35e0 = local_6280;
        uStack_35d8 = uStack_6278;
        uStack_35d0 = uStack_6270;
        uStack_35c8 = uStack_6268;
        local_35e4 = 0x17;
        local_3660 = local_6280;
        uStack_3658 = uStack_6278;
        uStack_3650 = uStack_6270;
        uStack_3648 = uStack_6268;
        local_2e90 = local_6280;
        uStack_2e88 = uStack_6278;
        local_2e94 = 0x17;
        local_3600 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
        local_2eb0 = uStack_6270;
        uStack_2ea8 = uStack_6268;
        local_2eb4 = 0x17;
        local_3610 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
        local_3680 = local_3600._0_8_;
        uStack_3678 = local_3600._8_8_;
        uStack_3670 = local_3610._0_8_;
        uStack_3668 = local_3610._8_8_;
        local_3640 = local_3600._0_8_;
        uStack_3638 = local_3600._8_8_;
        uStack_3630 = local_3610._0_8_;
        uStack_3628 = local_3610._8_8_;
        local_3320 = local_6280;
        uStack_3318 = uStack_6278;
        uStack_3310 = uStack_6270;
        uStack_3308 = uStack_6268;
        local_3340 = 0x807fffff807fffff;
        uStack_3338 = 0x807fffff807fffff;
        uStack_3330 = 0x807fffff807fffff;
        uStack_3328 = 0x807fffff807fffff;
        auVar69._8_8_ = 0x807fffff807fffff;
        auVar69._0_8_ = 0x807fffff807fffff;
        auVar69._16_8_ = 0x807fffff807fffff;
        auVar69._24_8_ = 0x807fffff807fffff;
        auVar5 = vandps_avx(auVar5,auVar69);
        local_6280 = auVar5._0_8_;
        local_31e0 = local_6280;
        uStack_6278 = auVar5._8_8_;
        uStack_31d8 = uStack_6278;
        uStack_6270 = auVar5._16_8_;
        uStack_31d0 = uStack_6270;
        uStack_6268 = auVar5._24_8_;
        uStack_31c8 = uStack_6268;
        auVar73._8_8_ = 0x3f0000003f000000;
        auVar73._0_8_ = 0x3f0000003f000000;
        auVar73._16_8_ = 0x3f0000003f000000;
        auVar73._24_8_ = 0x3f0000003f000000;
        auVar4 = vorps_avx(auVar5,auVar73);
        local_3060 = local_3600._0_8_;
        uStack_3058 = local_3600._8_8_;
        uStack_3050 = local_3610._0_8_;
        uStack_3048 = local_3610._8_8_;
        local_3100 = local_3600._0_8_;
        uStack_30f8 = local_3600._8_8_;
        uStack_30f0 = local_3610._0_8_;
        uStack_30e8 = local_3610._8_8_;
        local_3120 = 0x7f0000007f;
        uStack_3118 = 0x7f0000007f;
        uStack_3110 = 0x7f0000007f;
        uStack_3108 = 0x7f0000007f;
        local_30b0 = 0x7f0000007f;
        uStack_30a8 = 0x7f0000007f;
        local_30c0 = 0x7f0000007f;
        uStack_30b8 = 0x7f0000007f;
        local_2e10 = local_3600._0_8_;
        uStack_2e08 = local_3600._8_8_;
        local_2e20 = 0x7f0000007f;
        uStack_2e18 = 0x7f0000007f;
        auVar1._8_8_ = 0x7f0000007f;
        auVar1._0_8_ = 0x7f0000007f;
        local_3090 = vpsubd_avx(local_3600,auVar1);
        local_2e30 = local_3610._0_8_;
        uStack_2e28 = local_3610._8_8_;
        local_2e40 = 0x7f0000007f;
        uStack_2e38 = 0x7f0000007f;
        auVar2._8_8_ = 0x7f0000007f;
        auVar2._0_8_ = 0x7f0000007f;
        local_30a0 = vpsubd_avx(local_3610,auVar2);
        local_3140 = local_3090._0_8_;
        uStack_3138 = local_3090._8_8_;
        uStack_3130 = local_30a0._0_8_;
        uStack_3128 = local_30a0._8_8_;
        local_30e0 = local_3090._0_8_;
        uStack_30d8 = local_3090._8_8_;
        uStack_30d0 = local_30a0._0_8_;
        uStack_30c8 = local_30a0._8_8_;
        local_62a0 = local_3090._0_8_;
        uStack_6298 = local_3090._8_8_;
        uStack_6290 = local_30a0._0_8_;
        uStack_6288 = local_30a0._8_8_;
        local_2f40 = local_3090._0_8_;
        uStack_2f38 = local_3090._8_8_;
        uStack_2f30 = local_30a0._0_8_;
        uStack_2f28 = local_30a0._8_8_;
        auVar76._16_8_ = local_30a0._0_8_;
        auVar76._0_16_ = local_3090;
        auVar76._24_8_ = local_30a0._8_8_;
        auVar5 = vcvtdq2ps_avx(auVar76);
        local_6300 = auVar5._0_8_;
        uVar11 = local_6300;
        uStack_62f8 = auVar5._8_8_;
        uVar12 = uStack_62f8;
        uStack_62f0 = auVar5._16_8_;
        uVar13 = uStack_62f0;
        uStack_62e8 = auVar5._24_8_;
        uVar14 = uStack_62e8;
        local_5be0 = 0x3f8000003f800000;
        uStack_5bd8 = 0x3f8000003f800000;
        uStack_5bd0 = 0x3f8000003f800000;
        uStack_5bc8 = 0x3f8000003f800000;
        local_5bc0._0_4_ = auVar5._0_4_;
        local_5bc0._4_4_ = auVar5._4_4_;
        uStack_5bb8._0_4_ = auVar5._8_4_;
        uStack_5bb8._4_4_ = auVar5._12_4_;
        uStack_5bb0._0_4_ = auVar5._16_4_;
        uStack_5bb0._4_4_ = auVar5._20_4_;
        uStack_5ba8._0_4_ = auVar5._24_4_;
        uStack_5ba8._4_4_ = auVar5._28_4_;
        local_6300._4_4_ = local_5bc0._4_4_ + 1.0;
        local_6300._0_4_ = (float)local_5bc0 + 1.0;
        uStack_62f8._0_4_ = (float)uStack_5bb8 + 1.0;
        uStack_62f8._4_4_ = uStack_5bb8._4_4_ + 1.0;
        uStack_62f0._0_4_ = (float)uStack_5bb0 + 1.0;
        uStack_62f0._4_4_ = uStack_5bb0._4_4_ + 1.0;
        auVar167 = _local_6300;
        uStack_62e8._0_4_ = (float)uStack_5ba8 + 1.0;
        uStack_62e8._4_4_ = uStack_5ba8._4_4_ + 1.0;
        auVar6 = _local_6300;
        local_6320 = vcmpps_avx(auVar4,_DAT_00954c00,1);
        local_6280 = auVar4._0_8_;
        local_3360 = local_6280;
        uStack_6278 = auVar4._8_8_;
        uStack_3358 = uStack_6278;
        uStack_6270 = auVar4._16_8_;
        uStack_3350 = uStack_6270;
        uStack_6268 = auVar4._24_8_;
        uStack_3348 = uStack_6268;
        local_3380 = local_6320._0_8_;
        uStack_3378 = local_6320._8_8_;
        uStack_3370 = local_6320._16_8_;
        uStack_3368 = local_6320._24_8_;
        auVar5 = vandps_avx(auVar4,local_6320);
        local_49e0 = local_6280;
        uStack_49d8 = uStack_6278;
        uStack_49d0 = uStack_6270;
        uStack_49c8 = uStack_6268;
        local_4a00 = 0x3f8000003f800000;
        uStack_49f8 = 0x3f8000003f800000;
        uStack_49f0 = 0x3f8000003f800000;
        uStack_49e8 = 0x3f8000003f800000;
        auVar39._8_8_ = 0x3f8000003f800000;
        auVar39._0_8_ = 0x3f8000003f800000;
        auVar39._16_8_ = 0x3f8000003f800000;
        auVar39._24_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar4,auVar39);
        local_4a20 = local_6300;
        uStack_4a18 = uStack_62f8;
        uStack_62f0 = auVar167._16_8_;
        uStack_4a10 = uStack_62f0;
        uStack_62e8 = auVar6._24_8_;
        uStack_4a08 = uStack_62e8;
        local_33a0 = 0x3f8000003f800000;
        uStack_3398 = 0x3f8000003f800000;
        uStack_3390 = 0x3f8000003f800000;
        uStack_3388 = 0x3f8000003f800000;
        local_33c0 = local_6320._0_8_;
        uStack_33b8 = local_6320._8_8_;
        uStack_33b0 = local_6320._16_8_;
        uStack_33a8 = local_6320._24_8_;
        auVar68._8_8_ = 0x3f8000003f800000;
        auVar68._0_8_ = 0x3f8000003f800000;
        auVar68._16_8_ = 0x3f8000003f800000;
        auVar68._24_8_ = 0x3f8000003f800000;
        local_4a40 = vandps_avx(auVar68,local_6320);
        auVar38._16_8_ = uStack_62f0;
        auVar38._0_16_ = _local_6300;
        auVar38._24_8_ = uStack_62e8;
        _local_6300 = vsubps_avx(auVar38,local_4a40);
        local_6280 = auVar4._0_8_;
        uVar15 = local_6280;
        uStack_6278 = auVar4._8_8_;
        uVar16 = uStack_6278;
        uStack_6270 = auVar4._16_8_;
        uVar17 = uStack_6270;
        uStack_6268 = auVar4._24_8_;
        uVar18 = uStack_6268;
        local_6340 = auVar5._0_8_;
        uVar19 = local_6340;
        uStack_6338 = auVar5._8_8_;
        uVar20 = uStack_6338;
        uStack_6330 = auVar5._16_8_;
        uVar21 = uStack_6330;
        uStack_6328 = auVar5._24_8_;
        uVar22 = uStack_6328;
        local_5c00._0_4_ = auVar4._0_4_;
        local_5c00._4_4_ = auVar4._4_4_;
        uStack_5bf8._0_4_ = auVar4._8_4_;
        uStack_5bf8._4_4_ = auVar4._12_4_;
        uStack_5bf0._0_4_ = auVar4._16_4_;
        uStack_5bf0._4_4_ = auVar4._20_4_;
        uStack_5be8._0_4_ = auVar4._24_4_;
        uStack_5be8._4_4_ = auVar4._28_4_;
        local_5c20._0_4_ = auVar5._0_4_;
        local_5c20._4_4_ = auVar5._4_4_;
        uStack_5c18._0_4_ = auVar5._8_4_;
        uStack_5c18._4_4_ = auVar5._12_4_;
        uStack_5c10._0_4_ = auVar5._16_4_;
        uStack_5c10._4_4_ = auVar5._20_4_;
        uStack_5c08._0_4_ = auVar5._24_4_;
        uStack_5c08._4_4_ = auVar5._28_4_;
        local_5c00._0_4_ = (float)local_5c00 + (float)local_5c20;
        local_5c00._4_4_ = local_5c00._4_4_ + local_5c20._4_4_;
        uStack_5bf8._0_4_ = (float)uStack_5bf8 + (float)uStack_5c18;
        uStack_5bf8._4_4_ = uStack_5bf8._4_4_ + uStack_5c18._4_4_;
        uStack_5bf0._0_4_ = (float)uStack_5bf0 + (float)uStack_5c10;
        uStack_5bf0._4_4_ = uStack_5bf0._4_4_ + uStack_5c10._4_4_;
        uStack_5be8._0_4_ = (float)uStack_5be8 + (float)uStack_5c08;
        fStack_6344 = uStack_5be8._4_4_ + uStack_5c08._4_4_;
        local_6280._4_4_ = local_5c00._4_4_;
        local_6280._0_4_ = (float)local_5c00;
        uStack_6278._0_4_ = (float)uStack_5bf8;
        uStack_6278._4_4_ = uStack_5bf8._4_4_;
        uStack_6270._0_4_ = (float)uStack_5bf0;
        uStack_6270._4_4_ = uStack_5bf0._4_4_;
        auVar167 = _local_6280;
        uStack_6268._0_4_ = (float)uStack_5be8;
        uStack_6268._4_4_ = fStack_6344;
        auVar5 = _local_6280;
        local_5f20 = local_6280;
        uStack_5f18 = uStack_6278;
        uStack_6270 = auVar167._16_8_;
        uStack_5f10 = uStack_6270;
        uStack_6268 = auVar5._24_8_;
        uStack_5f08 = uStack_6268;
        local_6360 = (float)local_5c00 * (float)local_5c00;
        fStack_635c = local_5c00._4_4_ * local_5c00._4_4_;
        fStack_6358 = (float)uStack_5bf8 * (float)uStack_5bf8;
        fStack_6354 = uStack_5bf8._4_4_ * uStack_5bf8._4_4_;
        fStack_6350 = (float)uStack_5bf0 * (float)uStack_5bf0;
        fStack_634c = uStack_5bf0._4_4_ * uStack_5bf0._4_4_;
        fStack_6348 = (float)uStack_5be8 * (float)uStack_5be8;
        local_5f40 = 0x3d9021bb3d9021bb;
        uStack_5f38 = 0x3d9021bb3d9021bb;
        uStack_5f30 = 0x3d9021bb3d9021bb;
        uStack_5f28 = 0x3d9021bb3d9021bb;
        local_5f60 = local_6280;
        uStack_5f58 = uStack_6278;
        uStack_5f50 = uStack_6270;
        uStack_5f48 = uStack_6268;
        local_6380._4_4_ = local_5c00._4_4_ * 0.070376836;
        local_6380._0_4_ = (float)local_5c00 * 0.070376836;
        uStack_6378._0_4_ = (float)uStack_5bf8 * 0.070376836;
        uStack_6378._4_4_ = uStack_5bf8._4_4_ * 0.070376836;
        uStack_6370._0_4_ = (float)uStack_5bf0 * 0.070376836;
        uStack_6370._4_4_ = uStack_5bf0._4_4_ * 0.070376836;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = (float)uStack_5be8 * 0.070376836;
        uStack_6368._4_4_ = 0x3d9021bb;
        auVar5 = _local_6380;
        local_5c40 = local_6380;
        uStack_5c38 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5c30 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5c28 = uStack_6368;
        local_5c60 = 0xbdebd1b8bdebd1b8;
        uStack_5c58 = 0xbdebd1b8bdebd1b8;
        uStack_5c50 = 0xbdebd1b8bdebd1b8;
        uStack_5c48 = 0xbdebd1b8bdebd1b8;
        local_6380._0_4_ = (float)local_5c00 * 0.070376836 + -0.1151461;
        local_6380._4_4_ = local_5c00._4_4_ * 0.070376836 + -0.1151461;
        fVar175 = (float)uStack_5bf8 * 0.070376836 + -0.1151461;
        fVar177 = uStack_5bf8._4_4_ * 0.070376836 + -0.1151461;
        fVar178 = (float)uStack_5bf0 * 0.070376836 + -0.1151461;
        fVar179 = uStack_5bf0._4_4_ * 0.070376836 + -0.1151461;
        fVar180 = (float)uStack_5be8 * 0.070376836 + -0.1151461;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbd375ffa;
        auVar5 = _local_6380;
        local_5f80 = local_6380;
        uStack_5f78 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5f70 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5f68 = uStack_6368;
        local_5fa0 = local_6280;
        uStack_5f98 = uStack_6278;
        uStack_5f90 = uStack_6270;
        uStack_5f88 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbd375ffa;
        auVar5 = _local_6380;
        local_5c80 = local_6380;
        uStack_5c78 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5c70 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5c68 = uStack_6368;
        local_5ca0 = 0x3def251a3def251a;
        uStack_5c98 = 0x3def251a3def251a;
        uStack_5c90 = 0x3def251a3def251a;
        uStack_5c88 = 0x3def251a3def251a;
        local_6380._0_4_ = (float)local_6380._0_4_ + 0.116769984;
        local_6380._4_4_ = (float)local_6380._4_4_ + 0.116769984;
        fVar175 = fVar175 + 0.116769984;
        fVar177 = fVar177 + 0.116769984;
        fVar178 = fVar178 + 0.116769984;
        fVar179 = fVar179 + 0.116769984;
        fVar180 = fVar180 + 0.116769984;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3d93751d;
        auVar5 = _local_6380;
        local_5fc0 = local_6380;
        uStack_5fb8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5fb0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5fa8 = uStack_6368;
        local_5fe0 = local_6280;
        uStack_5fd8 = uStack_6278;
        uStack_5fd0 = uStack_6270;
        uStack_5fc8 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3d93751d;
        auVar5 = _local_6380;
        local_5cc0 = local_6380;
        uStack_5cb8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5cb0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5ca8 = uStack_6368;
        local_5ce0 = 0xbdfe5d4fbdfe5d4f;
        uStack_5cd8 = 0xbdfe5d4fbdfe5d4f;
        uStack_5cd0 = 0xbdfe5d4fbdfe5d4f;
        uStack_5cc8 = 0xbdfe5d4fbdfe5d4f;
        local_6380._0_4_ = (float)local_6380._0_4_ + -0.12420141;
        local_6380._4_4_ = (float)local_6380._4_4_ + -0.12420141;
        fVar175 = fVar175 + -0.12420141;
        fVar177 = fVar177 + -0.12420141;
        fVar178 = fVar178 + -0.12420141;
        fVar179 = fVar179 + -0.12420141;
        fVar180 = fVar180 + -0.12420141;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbd55d064;
        auVar5 = _local_6380;
        local_6000 = local_6380;
        uStack_5ff8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5ff0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5fe8 = uStack_6368;
        local_6020 = local_6280;
        uStack_6018 = uStack_6278;
        uStack_6010 = uStack_6270;
        uStack_6008 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbd55d064;
        auVar5 = _local_6380;
        local_5d00 = local_6380;
        uStack_5cf8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5cf0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5ce8 = uStack_6368;
        local_5d20 = 0x3e11e9bf3e11e9bf;
        uStack_5d18 = 0x3e11e9bf3e11e9bf;
        uStack_5d10 = 0x3e11e9bf3e11e9bf;
        uStack_5d08 = 0x3e11e9bf3e11e9bf;
        local_6380._0_4_ = (float)local_6380._0_4_ + 0.14249323;
        local_6380._4_4_ = (float)local_6380._4_4_ + 0.14249323;
        fVar175 = fVar175 + 0.14249323;
        fVar177 = fVar177 + 0.14249323;
        fVar178 = fVar178 + 0.14249323;
        fVar179 = fVar179 + 0.14249323;
        fVar180 = fVar180 + 0.14249323;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3db8eb4c;
        auVar5 = _local_6380;
        local_6040 = local_6380;
        uStack_6038 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_6030 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_6028 = uStack_6368;
        local_6060 = local_6280;
        uStack_6058 = uStack_6278;
        uStack_6050 = uStack_6270;
        uStack_6048 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3db8eb4c;
        auVar5 = _local_6380;
        local_5d40 = local_6380;
        uStack_5d38 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5d30 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5d28 = uStack_6368;
        local_5d60 = 0xbe2aae50be2aae50;
        uStack_5d58 = 0xbe2aae50be2aae50;
        uStack_5d50 = 0xbe2aae50be2aae50;
        uStack_5d48 = 0xbe2aae50be2aae50;
        local_6380._0_4_ = (float)local_6380._0_4_ + -0.16668057;
        local_6380._4_4_ = (float)local_6380._4_4_ + -0.16668057;
        fVar175 = fVar175 + -0.16668057;
        fVar177 = fVar177 + -0.16668057;
        fVar178 = fVar178 + -0.16668057;
        fVar179 = fVar179 + -0.16668057;
        fVar180 = fVar180 + -0.16668057;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbd9c7154;
        auVar5 = _local_6380;
        local_6080 = local_6380;
        uStack_6078 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_6070 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_6068 = uStack_6368;
        local_60a0 = local_6280;
        uStack_6098 = uStack_6278;
        uStack_6090 = uStack_6270;
        uStack_6088 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbd9c7154;
        auVar5 = _local_6380;
        local_5d80 = local_6380;
        uStack_5d78 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5d70 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5d68 = uStack_6368;
        local_5da0 = 0x3e4cceac3e4cceac;
        uStack_5d98 = 0x3e4cceac3e4cceac;
        uStack_5d90 = 0x3e4cceac3e4cceac;
        uStack_5d88 = 0x3e4cceac3e4cceac;
        local_6380._0_4_ = (float)local_6380._0_4_ + 0.20000714;
        local_6380._4_4_ = (float)local_6380._4_4_ + 0.20000714;
        fVar175 = fVar175 + 0.20000714;
        fVar177 = fVar177 + 0.20000714;
        fVar178 = fVar178 + 0.20000714;
        fVar179 = fVar179 + 0.20000714;
        fVar180 = fVar180 + 0.20000714;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3dfd2c04;
        auVar5 = _local_6380;
        local_60c0 = local_6380;
        uStack_60b8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_60b0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_60a8 = uStack_6368;
        local_60e0 = local_6280;
        uStack_60d8 = uStack_6278;
        uStack_60d0 = uStack_6270;
        uStack_60c8 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3dfd2c04;
        auVar5 = _local_6380;
        local_5dc0 = local_6380;
        uStack_5db8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5db0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5da8 = uStack_6368;
        local_5de0 = 0xbe7ffffcbe7ffffc;
        uStack_5dd8 = 0xbe7ffffcbe7ffffc;
        uStack_5dd0 = 0xbe7ffffcbe7ffffc;
        uStack_5dc8 = 0xbe7ffffcbe7ffffc;
        local_6380._0_4_ = (float)local_6380._0_4_ + -0.24999994;
        local_6380._4_4_ = (float)local_6380._4_4_ + -0.24999994;
        fVar175 = fVar175 + -0.24999994;
        fVar177 = fVar177 + -0.24999994;
        fVar178 = fVar178 + -0.24999994;
        fVar179 = fVar179 + -0.24999994;
        fVar180 = fVar180 + -0.24999994;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbe0169fa;
        auVar5 = _local_6380;
        local_6100 = local_6380;
        uStack_60f8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_60f0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_60e8 = uStack_6368;
        local_6120 = local_6280;
        uStack_6118 = uStack_6278;
        uStack_6110 = uStack_6270;
        uStack_6108 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0xbe0169fa;
        auVar5 = _local_6380;
        local_5e00 = local_6380;
        uStack_5df8 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5df0 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5de8 = uStack_6368;
        local_5e20 = 0x3eaaaaaa3eaaaaaa;
        uStack_5e18 = 0x3eaaaaaa3eaaaaaa;
        uStack_5e10 = 0x3eaaaaaa3eaaaaaa;
        uStack_5e08 = 0x3eaaaaaa3eaaaaaa;
        local_6380._0_4_ = (float)local_6380._0_4_ + 0.3333333;
        local_6380._4_4_ = (float)local_6380._4_4_ + 0.3333333;
        fVar175 = fVar175 + 0.3333333;
        fVar177 = fVar177 + 0.3333333;
        fVar178 = fVar178 + 0.3333333;
        fVar179 = fVar179 + 0.3333333;
        fVar180 = fVar180 + 0.3333333;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3e53eb5a;
        auVar5 = _local_6380;
        local_6140 = local_6380;
        uStack_6138 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_6130 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_6128 = uStack_6368;
        local_6160 = local_6280;
        uStack_6158 = uStack_6278;
        uStack_6150 = uStack_6270;
        uStack_6148 = uStack_6268;
        local_6380._0_4_ = (float)local_6380._0_4_ * (float)local_5c00;
        local_6380._4_4_ = (float)local_6380._4_4_ * local_5c00._4_4_;
        fVar175 = fVar175 * (float)uStack_5bf8;
        fVar177 = fVar177 * uStack_5bf8._4_4_;
        fVar178 = fVar178 * (float)uStack_5bf0;
        fVar179 = fVar179 * uStack_5bf0._4_4_;
        fVar180 = fVar180 * (float)uStack_5be8;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3e53eb5a;
        auVar5 = _local_6380;
        local_6180 = local_6380;
        uStack_6178 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_6170 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_6168 = uStack_6368;
        local_61a0 = CONCAT44(fStack_635c,local_6360);
        uStack_6198 = CONCAT44(fStack_6354,fStack_6358);
        uStack_6190 = CONCAT44(fStack_634c,fStack_6350);
        uStack_6188 = CONCAT44(fStack_6344,fStack_6348);
        local_6380._0_4_ = (float)local_6380._0_4_ * local_6360;
        local_6380._4_4_ = (float)local_6380._4_4_ * fStack_635c;
        fVar175 = fVar175 * fStack_6358;
        fVar177 = fVar177 * fStack_6354;
        fVar178 = fVar178 * fStack_6350;
        fVar179 = fVar179 * fStack_634c;
        fVar180 = fVar180 * fStack_6348;
        uStack_6378._0_4_ = fVar175;
        uStack_6378._4_4_ = fVar177;
        uStack_6370._0_4_ = fVar178;
        uStack_6370._4_4_ = fVar179;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180;
        uStack_6368._4_4_ = 0x3e53eb5a;
        auVar5 = _local_6380;
        local_61c0._0_4_ = local_6300._0_4_;
        local_61c0._4_4_ = local_6300._4_4_;
        uStack_61b8._0_4_ = local_6300._8_4_;
        uStack_61b8._4_4_ = local_6300._12_4_;
        uStack_61b0._0_4_ = local_6300._16_4_;
        uStack_61b0._4_4_ = local_6300._20_4_;
        uStack_61a8._0_4_ = local_6300._24_4_;
        uStack_61a8._4_4_ = local_6300._28_4_;
        local_6340._4_4_ = local_61c0._4_4_ * -0.00021219444;
        local_6340._0_4_ = (float)local_61c0 * -0.00021219444;
        uStack_6338._0_4_ = (float)uStack_61b8 * -0.00021219444;
        uStack_6338._4_4_ = uStack_61b8._4_4_ * -0.00021219444;
        uStack_6330._0_4_ = (float)uStack_61b0 * -0.00021219444;
        uStack_6330._4_4_ = uStack_61b0._4_4_ * -0.00021219444;
        auVar172 = _local_6340;
        uStack_6328._0_4_ = (float)uStack_61a8 * -0.00021219444;
        uStack_6328._4_4_ = uStack_61a8._4_4_;
        auVar4 = _local_6340;
        local_5e40 = local_6380;
        uStack_5e38 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_5e30 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_5e28 = uStack_6368;
        local_5e60 = local_6340;
        uStack_5e58 = uStack_6338;
        uStack_6330 = auVar172._16_8_;
        uStack_5e50 = uStack_6330;
        uStack_6328 = auVar4._24_8_;
        uStack_5e48 = uStack_6328;
        local_6380._4_4_ = (float)local_6380._4_4_ + local_61c0._4_4_ * -0.00021219444;
        local_6380._0_4_ = (float)local_6380._0_4_ + (float)local_61c0 * -0.00021219444;
        uStack_6378._0_4_ = fVar175 + (float)uStack_61b8 * -0.00021219444;
        uStack_6378._4_4_ = fVar177 + uStack_61b8._4_4_ * -0.00021219444;
        uStack_6370._0_4_ = fVar178 + (float)uStack_61b0 * -0.00021219444;
        uStack_6370._4_4_ = fVar179 + uStack_61b0._4_4_ * -0.00021219444;
        auVar167 = _local_6380;
        uStack_6368._0_4_ = fVar180 + (float)uStack_61a8 * -0.00021219444;
        uStack_6368._4_4_ = uStack_61a8._4_4_ + 0.20695248;
        auVar5 = _local_6380;
        local_6200 = CONCAT44(fStack_635c,local_6360);
        uStack_61f8 = CONCAT44(fStack_6354,fStack_6358);
        uStack_61f0 = CONCAT44(fStack_634c,fStack_6350);
        uStack_61e8 = CONCAT44(fStack_6344,fStack_6348);
        local_6340._4_4_ = fStack_635c * 0.5;
        local_6340._0_4_ = local_6360 * 0.5;
        uStack_6338._0_4_ = fStack_6358 * 0.5;
        uStack_6338._4_4_ = fStack_6354 * 0.5;
        uStack_6330._0_4_ = fStack_6350 * 0.5;
        uStack_6330._4_4_ = fStack_634c * 0.5;
        auVar172 = _local_6340;
        uStack_6328._0_4_ = fStack_6348 * 0.5;
        uStack_6328._4_4_ = fStack_6344;
        auVar4 = _local_6340;
        local_4a60 = local_6380;
        uStack_4a58 = uStack_6378;
        uStack_6370 = auVar167._16_8_;
        uStack_4a50 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uStack_4a48 = uStack_6368;
        local_4a80 = local_6340;
        uStack_4a78 = uStack_6338;
        uStack_6330 = auVar172._16_8_;
        uStack_4a70 = uStack_6330;
        uStack_6328 = auVar4._24_8_;
        uStack_4a68 = uStack_6328;
        auVar37._16_8_ = uStack_6370;
        auVar37._0_16_ = _local_6380;
        auVar37._24_8_ = uStack_6368;
        auVar36._16_8_ = uStack_6330;
        auVar36._0_16_ = _local_6340;
        auVar36._24_8_ = uStack_6328;
        auVar5 = vsubps_avx(auVar37,auVar36);
        local_6240 = local_6300;
        uStack_6238 = uStack_62f8;
        uStack_6230 = uStack_62f0;
        uStack_6228 = uStack_62e8;
        local_6340._4_4_ = local_61c0._4_4_ * 0.6933594;
        local_6340._0_4_ = (float)local_61c0 * 0.6933594;
        uStack_6338._0_4_ = (float)uStack_61b8 * 0.6933594;
        uStack_6338._4_4_ = uStack_61b8._4_4_ * 0.6933594;
        uStack_6330._0_4_ = (float)uStack_61b0 * 0.6933594;
        uStack_6330._4_4_ = uStack_61b0._4_4_ * 0.6933594;
        auVar167 = _local_6340;
        uStack_6328._0_4_ = (float)uStack_61a8 * 0.6933594;
        uStack_6328._4_4_ = uStack_61a8._4_4_;
        auVar36 = _local_6340;
        local_5e80 = local_6280;
        uStack_5e78 = uStack_6278;
        uStack_5e70 = uStack_6270;
        uStack_5e68 = uStack_6268;
        local_6380 = auVar5._0_8_;
        uVar23 = local_6380;
        uStack_6378 = auVar5._8_8_;
        uVar24 = uStack_6378;
        uStack_6370 = auVar5._16_8_;
        uVar25 = uStack_6370;
        uStack_6368 = auVar5._24_8_;
        uVar26 = uStack_6368;
        local_5ea0._0_4_ = auVar5._0_4_;
        local_5ea0._4_4_ = auVar5._4_4_;
        uStack_5e98._0_4_ = auVar5._8_4_;
        uStack_5e98._4_4_ = auVar5._12_4_;
        uStack_5e90._0_4_ = auVar5._16_4_;
        uStack_5e90._4_4_ = auVar5._20_4_;
        uStack_5e88._0_4_ = auVar5._24_4_;
        uStack_5e88._4_4_ = auVar5._28_4_;
        local_6280._4_4_ = local_5c00._4_4_ + local_5ea0._4_4_;
        local_6280._0_4_ = (float)local_5c00 + (float)local_5ea0;
        uStack_6278._0_4_ = (float)uStack_5bf8 + (float)uStack_5e98;
        uStack_6278._4_4_ = uStack_5bf8._4_4_ + uStack_5e98._4_4_;
        uStack_6270._0_4_ = (float)uStack_5bf0 + (float)uStack_5e90;
        uStack_6270._4_4_ = uStack_5bf0._4_4_ + uStack_5e90._4_4_;
        auVar172 = _local_6280;
        uStack_6268._0_4_ = (float)uStack_5be8 + (float)uStack_5e88;
        uStack_6268._4_4_ = fStack_6344 + uStack_5e88._4_4_;
        auVar5 = _local_6280;
        local_5ec0 = local_6280;
        uStack_5eb8 = uStack_6278;
        uStack_6270 = auVar172._16_8_;
        uStack_5eb0 = uStack_6270;
        uStack_6268 = auVar5._24_8_;
        uStack_5ea8 = uStack_6268;
        local_5ee0 = local_6340;
        uStack_5ed8 = uStack_6338;
        uStack_6330 = auVar167._16_8_;
        uStack_5ed0 = uStack_6330;
        uStack_6328 = auVar36._24_8_;
        uStack_5ec8 = uStack_6328;
        local_6280._4_4_ = local_5c00._4_4_ + local_5ea0._4_4_ + local_61c0._4_4_ * 0.6933594;
        local_6280._0_4_ = (float)local_5c00 + (float)local_5ea0 + (float)local_61c0 * 0.6933594;
        uStack_6278._0_4_ = (float)uStack_5bf8 + (float)uStack_5e98 + (float)uStack_61b8 * 0.6933594
        ;
        uStack_6278._4_4_ = uStack_5bf8._4_4_ + uStack_5e98._4_4_ + uStack_61b8._4_4_ * 0.6933594;
        uStack_6270._0_4_ = (float)uStack_5bf0 + (float)uStack_5e90 + (float)uStack_61b0 * 0.6933594
        ;
        uStack_6270._4_4_ = uStack_5bf0._4_4_ + uStack_5e90._4_4_ + uStack_61b0._4_4_ * 0.6933594;
        auVar167 = _local_6280;
        uStack_6268._0_4_ = (float)uStack_5be8 + (float)uStack_5e88 + (float)uStack_61a8 * 0.6933594
        ;
        uStack_6268._4_4_ = fStack_6344 + uStack_5e88._4_4_ + uStack_61a8._4_4_;
        auVar37 = _local_6280;
        local_3220 = local_6280;
        uStack_3218 = uStack_6278;
        uStack_6270 = auVar167._16_8_;
        uStack_3210 = uStack_6270;
        uStack_6268 = auVar37._24_8_;
        uStack_3208 = uStack_6268;
        local_3240 = local_62e0._0_8_;
        uStack_3238 = local_62e0._8_8_;
        uStack_3230 = local_62e0._16_8_;
        uStack_3228 = local_62e0._24_8_;
        auVar72._16_8_ = uStack_6270;
        auVar72._0_16_ = _local_6280;
        auVar72._24_8_ = uStack_6268;
        _local_6380 = vorps_avx(auVar72,local_62e0);
        local_68c0 = local_6380;
        uStack_68b8 = uStack_6378;
        uStack_68b0 = uStack_6370;
        uStack_68a8 = uStack_6368;
        local_4c14 = 0x3f800000;
        local_2160 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_2180 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2170 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_68e0 = local_2180._0_8_;
        uStack_68d8 = local_2180._8_8_;
        uStack_68d0 = auStack_2170._0_8_;
        uStack_68c8 = auStack_2170._8_8_;
        local_4c18 = 0x40000000;
        local_2110 = 0x40000000;
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        local_2140 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
        auStack_2130 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
        local_6900 = local_2140._0_8_;
        uStack_68f8 = local_2140._8_8_;
        uStack_68f0 = auStack_2130._0_8_;
        uStack_68e8 = auStack_2130._8_8_;
        local_6840._0_4_ = local_6380._0_4_;
        local_6840._4_4_ = local_6380._4_4_;
        uStack_6838._0_4_ = local_6380._8_4_;
        uStack_6838._4_4_ = local_6380._12_4_;
        uStack_6830._0_4_ = local_6380._16_4_;
        uStack_6830._4_4_ = local_6380._20_4_;
        uStack_6828._0_4_ = local_6380._24_4_;
        uStack_6828._4_4_ = local_6380._28_4_;
        uStack_4844 = uStack_6828._4_4_;
        local_6860._0_4_ = local_2140._0_4_;
        local_6860._4_4_ = local_2140._4_4_;
        uStack_6858._0_4_ = local_2140._8_4_;
        uStack_6858._4_4_ = local_2140._12_4_;
        uStack_6850._0_4_ = auStack_2130._0_4_;
        uStack_6850._4_4_ = auStack_2130._4_4_;
        uStack_6848._0_4_ = auStack_2130._8_4_;
        local_4860 = (float)local_6840 * (float)local_6860;
        fStack_485c = local_6840._4_4_ * local_6860._4_4_;
        fStack_4858 = (float)uStack_6838 * (float)uStack_6858;
        fStack_4854 = uStack_6838._4_4_ * uStack_6858._4_4_;
        fStack_4850 = (float)uStack_6830 * (float)uStack_6850;
        fStack_484c = uStack_6830._4_4_ * uStack_6850._4_4_;
        fStack_4848 = (float)uStack_6828 * (float)uStack_6848;
        local_4204 = 0x3f800000;
        local_22a0 = 0x3f800000;
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        local_22c0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_22b0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_4880 = local_22c0._0_8_;
        uStack_4878 = local_22c0._8_8_;
        uStack_4870 = auStack_22b0._0_8_;
        uStack_4868 = auStack_22b0._8_8_;
        local_3920._16_8_ = auStack_22b0._0_8_;
        local_3920._0_16_ = local_22c0;
        local_3920._24_8_ = auStack_22b0._8_8_;
        local_4120 = 0;
        uStack_4118 = uStack_6e78;
        uStack_4110 = 0;
        uStack_4108 = 0;
        local_4140 = CONCAT44(fStack_485c,local_4860);
        uStack_4138 = CONCAT44(fStack_4854,fStack_4858);
        uStack_4130 = CONCAT44(fStack_484c,fStack_4850);
        uStack_4128 = CONCAT44(uStack_6828._4_4_,fStack_4848);
        auVar49._8_8_ = uStack_4138;
        auVar49._0_8_ = local_4140;
        auVar49._16_8_ = uStack_4130;
        auVar49._24_8_ = uStack_4128;
        auVar5 = vsubps_avx(ZEXT832(uStack_6e78) << 0x40,auVar49);
        local_38c0 = 0;
        uStack_38b8 = uStack_6e78;
        uStack_38b0 = 0;
        uStack_38a8 = 0;
        local_2ac0 = 0x7f0000007f;
        uStack_2ab8 = 0x7f0000007f;
        uStack_2ab0 = 0x7f0000007f;
        uStack_2aa8 = 0x7f0000007f;
        local_4700._0_8_ = auVar5._0_8_;
        local_2da0 = local_4700._0_8_;
        local_4700._8_8_ = auVar5._8_8_;
        uStack_2d98 = local_4700._8_8_;
        local_4700._16_8_ = auVar5._16_8_;
        uStack_2d90 = local_4700._16_8_;
        local_4700._24_8_ = auVar5._24_8_;
        uStack_2d88 = local_4700._24_8_;
        auVar81._8_8_ = 0x42b0c0a542b0c0a5;
        auVar81._0_8_ = 0x42b0c0a542b0c0a5;
        auVar81._16_8_ = 0x42b0c0a542b0c0a5;
        auVar81._24_8_ = 0x42b0c0a542b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar81);
        local_4700._0_8_ = auVar5._0_8_;
        local_37a0 = local_4700._0_8_;
        local_4700._8_8_ = auVar5._8_8_;
        uStack_3798 = local_4700._8_8_;
        local_4700._16_8_ = auVar5._16_8_;
        uStack_3790 = local_4700._16_8_;
        local_4700._24_8_ = auVar5._24_8_;
        uStack_3788 = local_4700._24_8_;
        auVar57._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar57._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar57._16_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar57._24_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar57);
        local_4700._0_8_ = auVar4._0_8_;
        uVar27 = local_4700._0_8_;
        local_4700._8_8_ = auVar4._8_8_;
        uVar28 = local_4700._8_8_;
        local_4700._16_8_ = auVar4._16_8_;
        uVar29 = local_4700._16_8_;
        local_4700._24_8_ = auVar4._24_8_;
        uVar30 = local_4700._24_8_;
        local_4440._0_4_ = auVar4._0_4_;
        local_4440._4_4_ = auVar4._4_4_;
        uStack_4438._0_4_ = auVar4._8_4_;
        uStack_4438._4_4_ = auVar4._12_4_;
        uStack_4430._0_4_ = auVar4._16_4_;
        uStack_4430._4_4_ = auVar4._20_4_;
        uStack_4428._0_4_ = auVar4._24_4_;
        uStack_4428._4_4_ = auVar4._28_4_;
        local_4740._4_4_ = local_4440._4_4_ * 1.442695;
        local_4740._0_4_ = (float)local_4440 * 1.442695;
        uStack_4738._0_4_ = (float)uStack_4438 * 1.442695;
        uStack_4738._4_4_ = uStack_4438._4_4_ * 1.442695;
        uStack_4730._0_4_ = (float)uStack_4430 * 1.442695;
        uStack_4730._4_4_ = uStack_4430._4_4_ * 1.442695;
        auVar167 = _local_4740;
        uStack_4728._0_4_ = (float)uStack_4428 * 1.442695;
        uStack_4728._4_4_ = uStack_4428._4_4_;
        auVar5 = _local_4740;
        local_4240 = local_4740;
        uStack_4238 = uStack_4738;
        uStack_4730 = auVar167._16_8_;
        uStack_4230 = uStack_4730;
        uStack_4728 = auVar5._24_8_;
        uStack_4228 = uStack_4728;
        local_4740._4_4_ = local_4440._4_4_ * 1.442695 + 0.5;
        local_4740._0_4_ = (float)local_4440 * 1.442695 + 0.5;
        uStack_4738._0_4_ = (float)uStack_4438 * 1.442695 + 0.5;
        uStack_4738._4_4_ = uStack_4438._4_4_ * 1.442695 + 0.5;
        uStack_4730._0_4_ = (float)uStack_4430 * 1.442695 + 0.5;
        uStack_4730._4_4_ = uStack_4430._4_4_ * 1.442695 + 0.5;
        uStack_4728._0_4_ = (float)uStack_4428 * 1.442695 + 0.5;
        uStack_4728._4_4_ = uStack_4428._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_4740,1);
        auVar5 = vcmpps_avx(_local_4740,auVar6,1);
        local_47a0._0_8_ = auVar5._0_8_;
        local_3460 = local_47a0._0_8_;
        local_47a0._8_8_ = auVar5._8_8_;
        uStack_3458 = local_47a0._8_8_;
        local_47a0._16_8_ = auVar5._16_8_;
        uStack_3450 = local_47a0._16_8_;
        local_47a0._24_8_ = auVar5._24_8_;
        uStack_3448 = local_47a0._24_8_;
        local_3480 = 0x3f8000003f800000;
        uStack_3478 = 0x3f8000003f800000;
        uStack_3470 = 0x3f8000003f800000;
        uStack_3468 = 0x3f8000003f800000;
        auVar65._8_8_ = 0x3f8000003f800000;
        auVar65._0_8_ = 0x3f8000003f800000;
        auVar65._16_8_ = 0x3f8000003f800000;
        auVar65._24_8_ = 0x3f8000003f800000;
        local_47a0 = vandps_avx(auVar5,auVar65);
        local_4720 = auVar6._0_8_;
        local_4160 = local_4720;
        uStack_4718 = auVar6._8_8_;
        uStack_4158 = uStack_4718;
        uStack_4710 = auVar6._16_8_;
        uStack_4150 = uStack_4710;
        uStack_4708 = auVar6._24_8_;
        uStack_4148 = uStack_4708;
        local_4180 = local_47a0._0_8_;
        uStack_4178 = local_47a0._8_8_;
        uStack_4170 = local_47a0._16_8_;
        uStack_4168 = local_47a0._24_8_;
        _local_4740 = vsubps_avx(auVar6,local_47a0);
        local_4480._0_4_ = local_4740._0_4_;
        local_4480._4_4_ = local_4740._4_4_;
        uStack_4478._0_4_ = local_4740._8_4_;
        uStack_4478._4_4_ = local_4740._12_4_;
        uStack_4470._0_4_ = local_4740._16_4_;
        uStack_4470._4_4_ = local_4740._20_4_;
        uStack_4468._0_4_ = local_4740._24_4_;
        uStack_4468._4_4_ = local_4740._28_4_;
        local_4720._4_4_ = local_4480._4_4_ * 0.6933594;
        local_4720._0_4_ = (float)local_4480 * 0.6933594;
        uStack_4718._0_4_ = (float)uStack_4478 * 0.6933594;
        uStack_4718._4_4_ = uStack_4478._4_4_ * 0.6933594;
        uStack_4710._0_4_ = (float)uStack_4470 * 0.6933594;
        uStack_4710._4_4_ = uStack_4470._4_4_ * 0.6933594;
        auVar167 = _local_4720;
        uStack_4708._0_4_ = (float)uStack_4468 * 0.6933594;
        uStack_4708._4_4_ = uStack_4468._4_4_;
        auVar6 = _local_4720;
        local_44c0 = local_4740;
        uStack_44b8 = uStack_4738;
        uStack_44b0 = uStack_4730;
        uStack_44a8 = uStack_4728;
        local_41a0 = local_4700._0_8_;
        uStack_4198 = local_4700._8_8_;
        uStack_4190 = local_4700._16_8_;
        uStack_4188 = local_4700._24_8_;
        local_41c0 = local_4720;
        uStack_41b8 = uStack_4718;
        uStack_4710 = auVar167._16_8_;
        uStack_41b0 = uStack_4710;
        uStack_4708 = auVar6._24_8_;
        uStack_41a8 = uStack_4708;
        auVar48._16_8_ = uStack_4710;
        auVar48._0_16_ = _local_4720;
        auVar48._24_8_ = uStack_4708;
        auVar5 = vsubps_avx(auVar4,auVar48);
        local_4700._0_8_ = auVar5._0_8_;
        local_41e0 = local_4700._0_8_;
        local_4700._8_8_ = auVar5._8_8_;
        uStack_41d8 = local_4700._8_8_;
        local_4700._16_8_ = auVar5._16_8_;
        uStack_41d0 = local_4700._16_8_;
        local_4700._24_8_ = auVar5._24_8_;
        uStack_41c8 = local_4700._24_8_;
        local_4200 = CONCAT44(local_4480._4_4_ * -0.00021219444,(float)local_4480 * -0.00021219444);
        uStack_41f8 = CONCAT44(uStack_4478._4_4_ * -0.00021219444,
                               (float)uStack_4478 * -0.00021219444);
        uStack_41f0 = CONCAT44(uStack_4470._4_4_ * -0.00021219444,
                               (float)uStack_4470 * -0.00021219444);
        uStack_41e8 = CONCAT44(uStack_4468._4_4_,(float)uStack_4468 * -0.00021219444);
        auVar47._8_8_ = uStack_41f8;
        auVar47._0_8_ = local_4200;
        auVar47._16_8_ = uStack_41f0;
        auVar47._24_8_ = uStack_41e8;
        local_4700 = vsubps_avx(auVar5,auVar47);
        local_4520 = local_4700._0_8_;
        uStack_4518 = local_4700._8_8_;
        uStack_4510 = local_4700._16_8_;
        uStack_4508 = local_4700._24_8_;
        local_4500._0_4_ = local_4700._0_4_;
        local_4500._4_4_ = local_4700._4_4_;
        uStack_44f8._0_4_ = local_4700._8_4_;
        uStack_44f8._4_4_ = local_4700._12_4_;
        uStack_44f0._0_4_ = local_4700._16_4_;
        uStack_44f0._4_4_ = local_4700._20_4_;
        uStack_44e8._0_4_ = local_4700._24_4_;
        uStack_44e8._4_4_ = local_4700._28_4_;
        fStack_47a4 = uStack_44e8._4_4_;
        local_47c0 = (float)local_4500 * (float)local_4500;
        fStack_47bc = local_4500._4_4_ * local_4500._4_4_;
        fStack_47b8 = (float)uStack_44f8 * (float)uStack_44f8;
        fStack_47b4 = uStack_44f8._4_4_ * uStack_44f8._4_4_;
        fStack_47b0 = (float)uStack_44f0 * (float)uStack_44f0;
        fStack_47ac = uStack_44f0._4_4_ * uStack_44f0._4_4_;
        fStack_47a8 = (float)uStack_44e8 * (float)uStack_44e8;
        local_4540 = 0x3950696739506967;
        uStack_4538 = 0x3950696739506967;
        uStack_4530 = 0x3950696739506967;
        uStack_4528 = 0x3950696739506967;
        local_4560 = local_4700._0_8_;
        uStack_4558 = local_4700._8_8_;
        uStack_4550 = local_4700._16_8_;
        uStack_4548 = local_4700._24_8_;
        local_4280 = CONCAT44(local_4500._4_4_ * 0.00019875691,(float)local_4500 * 0.00019875691);
        uStack_4278 = CONCAT44(uStack_44f8._4_4_ * 0.00019875691,(float)uStack_44f8 * 0.00019875691)
        ;
        uStack_4270 = CONCAT44(uStack_44f0._4_4_ * 0.00019875691,(float)uStack_44f0 * 0.00019875691)
        ;
        uStack_4268 = CONCAT44(0x39506967,(float)uStack_44e8 * 0.00019875691);
        local_47e0 = (float)local_4500 * 0.00019875691 + 0.0013981999;
        fStack_47dc = local_4500._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_47d8 = (float)uStack_44f8 * 0.00019875691 + 0.0013981999;
        fStack_47d4 = uStack_44f8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_47d0 = (float)uStack_44f0 * 0.00019875691 + 0.0013981999;
        fStack_47cc = uStack_44f0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_47c8 = (float)uStack_44e8 * 0.00019875691 + 0.0013981999;
        local_4580 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4578 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4570 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4568 = CONCAT44(0x3ad150fb,fStack_47c8);
        local_45a0 = local_4700._0_8_;
        uStack_4598 = local_4700._8_8_;
        uStack_4590 = local_4700._16_8_;
        uStack_4588 = local_4700._24_8_;
        local_47e0 = local_47e0 * (float)local_4500;
        fStack_47dc = fStack_47dc * local_4500._4_4_;
        fStack_47d8 = fStack_47d8 * (float)uStack_44f8;
        fStack_47d4 = fStack_47d4 * uStack_44f8._4_4_;
        fStack_47d0 = fStack_47d0 * (float)uStack_44f0;
        fStack_47cc = fStack_47cc * uStack_44f0._4_4_;
        fStack_47c8 = fStack_47c8 * (float)uStack_44e8;
        local_42c0 = CONCAT44(fStack_47dc,local_47e0);
        uStack_42b8 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_42b0 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_42a8 = CONCAT44(0x3ad150fb,fStack_47c8);
        local_47e0 = local_47e0 + 0.008333452;
        fStack_47dc = fStack_47dc + 0.008333452;
        fStack_47d8 = fStack_47d8 + 0.008333452;
        fStack_47d4 = fStack_47d4 + 0.008333452;
        fStack_47d0 = fStack_47d0 + 0.008333452;
        fStack_47cc = fStack_47cc + 0.008333452;
        fStack_47c8 = fStack_47c8 + 0.008333452;
        local_45c0 = CONCAT44(fStack_47dc,local_47e0);
        uStack_45b8 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_45b0 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_45a8 = CONCAT44(0x3c22b327,fStack_47c8);
        local_45e0 = local_4700._0_8_;
        uStack_45d8 = local_4700._8_8_;
        uStack_45d0 = local_4700._16_8_;
        uStack_45c8 = local_4700._24_8_;
        local_47e0 = (float)local_4500 * local_47e0;
        fStack_47dc = local_4500._4_4_ * fStack_47dc;
        fStack_47d8 = (float)uStack_44f8 * fStack_47d8;
        fStack_47d4 = uStack_44f8._4_4_ * fStack_47d4;
        fStack_47d0 = (float)uStack_44f0 * fStack_47d0;
        fStack_47cc = uStack_44f0._4_4_ * fStack_47cc;
        fStack_47c8 = (float)uStack_44e8 * fStack_47c8;
        local_4300 = CONCAT44(fStack_47dc,local_47e0);
        uStack_42f8 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_42f0 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_42e8 = CONCAT44(0x3c22b327,fStack_47c8);
        local_47e0 = local_47e0 + 0.041665796;
        fStack_47dc = fStack_47dc + 0.041665796;
        fStack_47d8 = fStack_47d8 + 0.041665796;
        fStack_47d4 = fStack_47d4 + 0.041665796;
        fStack_47d0 = fStack_47d0 + 0.041665796;
        fStack_47cc = fStack_47cc + 0.041665796;
        fStack_47c8 = fStack_47c8 + 0.041665796;
        local_4600 = CONCAT44(fStack_47dc,local_47e0);
        uStack_45f8 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_45f0 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_45e8 = CONCAT44(0x3d53568b,fStack_47c8);
        local_4620 = local_4700._0_8_;
        uStack_4618 = local_4700._8_8_;
        uStack_4610 = local_4700._16_8_;
        uStack_4608 = local_4700._24_8_;
        local_47e0 = local_47e0 * (float)local_4500;
        fStack_47dc = fStack_47dc * local_4500._4_4_;
        fStack_47d8 = fStack_47d8 * (float)uStack_44f8;
        fStack_47d4 = fStack_47d4 * uStack_44f8._4_4_;
        fStack_47d0 = fStack_47d0 * (float)uStack_44f0;
        fStack_47cc = fStack_47cc * uStack_44f0._4_4_;
        fStack_47c8 = fStack_47c8 * (float)uStack_44e8;
        local_4340 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4338 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4330 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4328 = CONCAT44(0x3d53568b,fStack_47c8);
        local_47e0 = local_47e0 + 0.16666666;
        fStack_47dc = fStack_47dc + 0.16666666;
        fStack_47d8 = fStack_47d8 + 0.16666666;
        fStack_47d4 = fStack_47d4 + 0.16666666;
        fStack_47d0 = fStack_47d0 + 0.16666666;
        fStack_47cc = fStack_47cc + 0.16666666;
        fStack_47c8 = fStack_47c8 + 0.16666666;
        local_4640 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4638 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4630 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4628 = CONCAT44(0x3e5f804d,fStack_47c8);
        local_4660 = local_4700._0_8_;
        uStack_4658 = local_4700._8_8_;
        uStack_4650 = local_4700._16_8_;
        uStack_4648 = local_4700._24_8_;
        local_47e0 = local_47e0 * (float)local_4500;
        fStack_47dc = fStack_47dc * local_4500._4_4_;
        fStack_47d8 = fStack_47d8 * (float)uStack_44f8;
        fStack_47d4 = fStack_47d4 * uStack_44f8._4_4_;
        fStack_47d0 = fStack_47d0 * (float)uStack_44f0;
        fStack_47cc = fStack_47cc * uStack_44f0._4_4_;
        fStack_47c8 = fStack_47c8 * (float)uStack_44e8;
        local_4380 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4378 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4370 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4368 = CONCAT44(0x3e5f804d,fStack_47c8);
        local_47e0 = local_47e0 + 0.5;
        fStack_47dc = fStack_47dc + 0.5;
        fStack_47d8 = fStack_47d8 + 0.5;
        fStack_47d4 = fStack_47d4 + 0.5;
        fStack_47d0 = fStack_47d0 + 0.5;
        fStack_47cc = fStack_47cc + 0.5;
        fStack_47c8 = fStack_47c8 + 0.5;
        local_4680 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4678 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4670 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4668 = CONCAT44(0x3f37e013,fStack_47c8);
        local_46a0 = CONCAT44(fStack_47bc,local_47c0);
        uStack_4698 = CONCAT44(fStack_47b4,fStack_47b8);
        uStack_4690 = CONCAT44(fStack_47ac,fStack_47b0);
        uStack_4688 = CONCAT44(uStack_44e8._4_4_,fStack_47a8);
        local_47e0 = local_47e0 * local_47c0;
        fStack_47dc = fStack_47dc * fStack_47bc;
        fStack_47d8 = fStack_47d8 * fStack_47b8;
        fStack_47d4 = fStack_47d4 * fStack_47b4;
        fStack_47d0 = fStack_47d0 * fStack_47b0;
        fStack_47cc = fStack_47cc * fStack_47ac;
        fStack_47c8 = fStack_47c8 * fStack_47a8;
        local_43c0 = CONCAT44(fStack_47dc,local_47e0);
        uStack_43b8 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_43b0 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_43a8 = CONCAT44(0x3f37e013,fStack_47c8);
        local_43e0 = local_4700._0_8_;
        uStack_43d8 = local_4700._8_8_;
        uStack_43d0 = local_4700._16_8_;
        uStack_43c8 = local_4700._24_8_;
        local_47e0 = local_47e0 + (float)local_4500;
        fStack_47dc = fStack_47dc + local_4500._4_4_;
        fStack_47d8 = fStack_47d8 + (float)uStack_44f8;
        fStack_47d4 = fStack_47d4 + uStack_44f8._4_4_;
        fStack_47d0 = fStack_47d0 + (float)uStack_44f0;
        fStack_47cc = fStack_47cc + uStack_44f0._4_4_;
        fStack_47c8 = fStack_47c8 + (float)uStack_44e8;
        local_4400 = CONCAT44(fStack_47dc,local_47e0);
        uStack_43f8 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_43f0 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_43e8 = CONCAT44(uStack_44e8._4_4_ + 0.71826285,fStack_47c8);
        local_4420 = 0x3f8000003f800000;
        uStack_4418 = 0x3f8000003f800000;
        uStack_4410 = 0x3f8000003f800000;
        uStack_4408 = 0x3f8000003f800000;
        local_47e0 = local_47e0 + 1.0;
        fStack_47dc = fStack_47dc + 1.0;
        fStack_47d8 = fStack_47d8 + 1.0;
        fStack_47d4 = fStack_47d4 + 1.0;
        fStack_47d0 = fStack_47d0 + 1.0;
        fStack_47cc = fStack_47cc + 1.0;
        fStack_47c8 = fStack_47c8 + 1.0;
        fStack_47c4 = uStack_44e8._4_4_ + 0.71826285 + 1.0;
        local_2ce0 = local_4740;
        uStack_2cd8 = uStack_4738;
        uStack_2cd0 = uStack_4730;
        uStack_2cc8 = uStack_4728;
        local_4760 = CONCAT44((int)local_4480._4_4_,(int)(float)local_4480);
        uStack_4758 = CONCAT44((int)uStack_4478._4_4_,(int)(float)uStack_4478);
        uStack_4750 = CONCAT44((int)uStack_4470._4_4_,(int)(float)uStack_4470);
        uStack_4748 = CONCAT44((int)uStack_4468._4_4_,(int)(float)uStack_4468);
        local_2aa0 = local_4760;
        uStack_2a98 = uStack_4758;
        uStack_2a90 = uStack_4750;
        uStack_2a88 = uStack_4748;
        local_2b40 = local_4760;
        uStack_2b38 = uStack_4758;
        uStack_2b30 = uStack_4750;
        uStack_2b28 = uStack_4748;
        local_2b60 = 0x7f0000007f;
        uStack_2b58 = 0x7f0000007f;
        uStack_2b50 = 0x7f0000007f;
        uStack_2b48 = 0x7f0000007f;
        local_2af0 = 0x7f0000007f;
        uStack_2ae8 = 0x7f0000007f;
        local_2b00 = 0x7f0000007f;
        uStack_2af8 = 0x7f0000007f;
        local_2450 = local_4760;
        uStack_2448 = uStack_4758;
        local_2460 = 0x7f0000007f;
        uStack_2458 = 0x7f0000007f;
        auVar94._8_8_ = uStack_4758;
        auVar94._0_8_ = local_4760;
        auVar93._8_8_ = 0x7f0000007f;
        auVar93._0_8_ = 0x7f0000007f;
        local_2ad0 = vpaddd_avx(auVar94,auVar93);
        local_2470 = uStack_4750;
        uStack_2468 = uStack_4748;
        local_2480 = 0x7f0000007f;
        uStack_2478 = 0x7f0000007f;
        auVar92._8_8_ = uStack_4748;
        auVar92._0_8_ = uStack_4750;
        auVar91._8_8_ = 0x7f0000007f;
        auVar91._0_8_ = 0x7f0000007f;
        local_2ae0 = vpaddd_avx(auVar92,auVar91);
        local_2b80 = local_2ad0._0_8_;
        uStack_2b78 = local_2ad0._8_8_;
        uStack_2b70 = local_2ae0._0_8_;
        uStack_2b68 = local_2ae0._8_8_;
        local_2b20 = local_2ad0._0_8_;
        uStack_2b18 = local_2ad0._8_8_;
        uStack_2b10 = local_2ae0._0_8_;
        uStack_2b08 = local_2ae0._8_8_;
        local_2720 = local_2ad0._0_8_;
        uStack_2718 = local_2ad0._8_8_;
        uStack_2710 = local_2ae0._0_8_;
        uStack_2708 = local_2ae0._8_8_;
        local_2724 = 0x17;
        local_27a0 = local_2ad0._0_8_;
        uStack_2798 = local_2ad0._8_8_;
        uStack_2790 = local_2ae0._0_8_;
        uStack_2788 = local_2ae0._8_8_;
        local_2350 = local_2ad0._0_8_;
        uStack_2348 = local_2ad0._8_8_;
        local_2354 = 0x17;
        local_2740 = vpslld_avx(local_2ad0,ZEXT416(0x17));
        local_2370 = local_2ae0._0_8_;
        uStack_2368 = local_2ae0._8_8_;
        local_2374 = 0x17;
        local_2750 = vpslld_avx(local_2ae0,ZEXT416(0x17));
        local_27c0 = local_2740._0_8_;
        uStack_27b8 = local_2740._8_8_;
        uStack_27b0 = local_2750._0_8_;
        uStack_27a8 = local_2750._8_8_;
        local_2780 = local_2740._0_8_;
        uStack_2778 = local_2740._8_8_;
        uStack_2770 = local_2750._0_8_;
        uStack_2768 = local_2750._8_8_;
        local_4760 = local_2740._0_8_;
        uStack_4758 = local_2740._8_8_;
        uStack_4750 = local_2750._0_8_;
        uStack_4748 = local_2750._8_8_;
        local_2560 = local_2740._0_8_;
        uStack_2558 = local_2740._8_8_;
        uStack_2550 = local_2750._0_8_;
        uStack_2548 = local_2750._8_8_;
        local_4800 = local_2740._0_8_;
        uStack_47f8 = local_2740._8_8_;
        uStack_47f0 = local_2750._0_8_;
        uStack_47e8 = local_2750._8_8_;
        local_46c0._4_4_ = fStack_47dc;
        local_46c0._0_4_ = local_47e0;
        local_46c0._8_4_ = fStack_47d8;
        local_46c0._12_4_ = fStack_47d4;
        local_46c0._16_4_ = fStack_47d0;
        local_46c0._20_4_ = fStack_47cc;
        local_46c0._24_4_ = fStack_47c8;
        local_46c0._28_4_ = fStack_47c4;
        local_46e0._0_4_ = local_2740._0_4_;
        local_46e0._4_4_ = local_2740._4_4_;
        uStack_46d8._0_4_ = local_2740._8_4_;
        uStack_46d8._4_4_ = local_2740._12_4_;
        uStack_46d0._0_4_ = local_2750._0_4_;
        uStack_46d0._4_4_ = local_2750._4_4_;
        uStack_46c8._0_4_ = local_2750._8_4_;
        local_47e0 = local_47e0 * (float)local_46e0;
        fStack_47dc = fStack_47dc * local_46e0._4_4_;
        fStack_47d8 = fStack_47d8 * (float)uStack_46d8;
        fStack_47d4 = fStack_47d4 * uStack_46d8._4_4_;
        fStack_47d0 = fStack_47d0 * (float)uStack_46d0;
        fStack_47cc = fStack_47cc * uStack_46d0._4_4_;
        fStack_47c8 = fStack_47c8 * (float)uStack_46c8;
        local_4840 = CONCAT44(fStack_47dc,local_47e0);
        uStack_4838 = CONCAT44(fStack_47d4,fStack_47d8);
        uStack_4830 = CONCAT44(fStack_47cc,fStack_47d0);
        uStack_4828 = CONCAT44(fStack_47c4,fStack_47c8);
        local_4820._0_4_ = local_22c0._0_4_;
        local_4820._4_4_ = local_22c0._4_4_;
        fStack_4818 = local_22c0._8_4_;
        fStack_4814 = local_22c0._12_4_;
        fStack_4810 = auStack_22b0._0_4_;
        fStack_480c = auStack_22b0._4_4_;
        fStack_4808 = auStack_22b0._8_4_;
        fStack_4804 = auStack_22b0._12_4_;
        local_3940 = (float)local_4820._0_4_ + local_47e0;
        fStack_393c = (float)local_4820._4_4_ + fStack_47dc;
        fStack_3938 = fStack_4818 + fStack_47d8;
        fStack_3934 = fStack_4814 + fStack_47d4;
        fStack_3930 = fStack_4810 + fStack_47d0;
        fStack_392c = fStack_480c + fStack_47cc;
        fStack_3928 = fStack_4808 + fStack_47c8;
        fStack_3924 = fStack_4804 + fStack_47c4;
        auVar55._4_4_ = fStack_393c;
        auVar55._0_4_ = local_3940;
        auVar55._8_4_ = fStack_3938;
        auVar55._12_4_ = fStack_3934;
        auVar55._16_4_ = fStack_3930;
        auVar55._20_4_ = fStack_392c;
        auVar55._24_4_ = fStack_3928;
        auVar55._28_4_ = fStack_3924;
        _local_6880 = vdivps_avx(local_3920,auVar55);
        local_68a0 = local_2140._0_8_;
        uStack_6898 = local_2140._8_8_;
        uStack_6890 = auStack_2130._0_8_;
        uStack_6888 = auStack_2130._8_8_;
        local_48e0._4_4_ = (float)local_6880._4_4_ * local_6860._4_4_;
        local_48e0._0_4_ = (float)local_6880._0_4_ * (float)local_6860;
        local_48e0._8_4_ = fStack_6878 * (float)uStack_6858;
        local_48e0._12_4_ = fStack_6874 * uStack_6858._4_4_;
        local_48e0._16_4_ = fStack_6870 * (float)uStack_6850;
        local_48e0._20_4_ = fStack_686c * uStack_6850._4_4_;
        local_48e0._24_4_ = fStack_6868 * (float)uStack_6848;
        local_48e0._28_4_ = local_6880._28_4_;
        local_4900 = local_2180._0_8_;
        uStack_48f8 = local_2180._8_8_;
        uStack_48f0 = auStack_2170._0_8_;
        uStack_48e8 = auStack_2170._8_8_;
        auVar44._16_8_ = auStack_2170._0_8_;
        auVar44._0_16_ = local_2180;
        auVar44._24_8_ = auStack_2170._8_8_;
        _local_6a20 = vsubps_avx(local_48e0,auVar44);
        local_6a00._0_4_ = (float)local_6b80;
        local_6a00._4_4_ = (float)((ulong)local_6b80 >> 0x20);
        uStack_69f8._0_4_ = (float)uStack_6b78;
        uStack_69f8._4_4_ = (float)((ulong)uStack_6b78 >> 0x20);
        uStack_69f0._0_4_ = (float)uStack_6b70;
        uStack_69f0._4_4_ = (float)((ulong)uStack_6b70 >> 0x20);
        uStack_69e8._0_4_ = (float)uStack_6b68;
        uStack_69e8._4_4_ = (undefined4)((ulong)uStack_6b68 >> 0x20);
        local_6d60 = CONCAT44(local_6a00._4_4_ * (float)local_6a20._4_4_,
                              (float)local_6a00 * (float)local_6a20._0_4_);
        uStack_6d58 = CONCAT44(uStack_69f8._4_4_ * fStack_6a14,(float)uStack_69f8 * fStack_6a18);
        uStack_6d50 = CONCAT44(uStack_69f0._4_4_ * fStack_6a0c,(float)uStack_69f0 * fStack_6a10);
        uStack_6d48 = CONCAT44(uStack_69e8._4_4_,(float)uStack_69e8 * fStack_6a08);
        local_6b08 = local_6ce0;
        local_6b40 = local_6d60;
        uStack_6b38 = uStack_6d58;
        uStack_6b30 = uStack_6d50;
        uStack_6b28 = uStack_6d48;
        auVar5._8_8_ = uStack_6d58;
        auVar5._0_8_ = local_6d60;
        auVar5._16_8_ = uStack_6d50;
        auVar5._24_8_ = uStack_6d48;
        *local_6ce0 = auVar5;
        local_6ce0 = local_6ce0 + 1;
        local_6a00 = local_6b80;
        uStack_69f8 = uStack_6b78;
        uStack_69f0 = uStack_6b70;
        uStack_69e8 = uStack_6b68;
        local_6860 = local_2140._0_8_;
        uStack_6858 = local_2140._8_8_;
        uStack_6850 = auStack_2130._0_8_;
        uStack_6848 = auStack_2130._8_8_;
        local_6840 = local_6380;
        uStack_6838 = uStack_6378;
        uStack_6830 = uStack_6370;
        uStack_6828 = uStack_6368;
        _local_6340 = auVar36;
        _local_6280 = auVar37;
        local_61c0 = local_6300;
        uStack_61b8 = uStack_62f8;
        uStack_61b0 = uStack_62f0;
        uStack_61a8 = uStack_62e8;
        local_5f00 = local_5f20;
        uStack_5ef8 = uStack_5f18;
        uStack_5ef0 = uStack_5f10;
        uStack_5ee8 = uStack_5f08;
        local_5ea0 = uVar23;
        uStack_5e98 = uVar24;
        uStack_5e90 = uVar25;
        uStack_5e88 = uVar26;
        local_5c20 = uVar19;
        uStack_5c18 = uVar20;
        uStack_5c10 = uVar21;
        uStack_5c08 = uVar22;
        local_5c00 = uVar15;
        uStack_5bf8 = uVar16;
        uStack_5bf0 = uVar17;
        uStack_5be8 = uVar18;
        local_5bc0 = uVar11;
        uStack_5bb8 = uVar12;
        uStack_5bb0 = uVar13;
        uStack_5ba8 = uVar14;
        local_5820 = local_2280._0_8_;
        uStack_5818 = local_2280._8_8_;
        uStack_5810 = auStack_2270._0_8_;
        uStack_5808 = auStack_2270._8_8_;
        local_5180 = local_62c0;
        uStack_5178 = uStack_62b8;
        uStack_5170 = uStack_62b0;
        uStack_5168 = uStack_62a8;
        _local_5120 = auVar58;
        local_50e0 = local_2680._0_8_;
        uStack_50d8 = local_2680._8_8_;
        uStack_50d0 = local_2690._0_8_;
        uStack_50c8 = local_2690._8_8_;
        local_4f00 = local_4f20;
        uStack_4ef8 = uStack_4f18;
        uStack_4ef0 = uStack_4f10;
        uStack_4ee8 = uStack_4f08;
        local_4ee0 = local_61e0;
        uStack_4ed8 = uStack_61d8;
        uStack_4ed0 = uStack_61d0;
        uStack_4ec8 = uStack_61c8;
        local_4ea0 = local_6260;
        uStack_4e98 = uStack_6258;
        uStack_4e90 = uStack_6250;
        uStack_4e88 = uStack_6248;
        local_4e80 = local_5140;
        uStack_4e78 = uStack_5138;
        uStack_4e70 = uStack_5130;
        uStack_4e68 = uStack_5128;
        local_4e40 = uVar7;
        uStack_4e38 = uVar8;
        uStack_4e30 = uVar9;
        uStack_4e28 = uVar10;
        local_4da0 = local_6220;
        uStack_4d98 = uStack_6218;
        uStack_4d90 = uStack_6210;
        uStack_4d88 = uStack_6208;
        local_4c60 = local_6220;
        uStack_4c58 = uStack_6218;
        uStack_4c50 = uStack_6210;
        uStack_4c48 = uStack_6208;
        _local_4820 = local_3920;
        local_4780 = local_62c0;
        uStack_4778 = uStack_62b8;
        uStack_4770 = uStack_62b0;
        uStack_4768 = uStack_62a8;
        _local_4720 = auVar6;
        local_46e0 = local_2740._0_8_;
        uStack_46d8 = local_2740._8_8_;
        uStack_46d0 = local_2750._0_8_;
        uStack_46c8 = local_2750._8_8_;
        local_4500 = local_4520;
        uStack_44f8 = uStack_4518;
        uStack_44f0 = uStack_4510;
        uStack_44e8 = uStack_4508;
        local_44e0 = local_61e0;
        uStack_44d8 = uStack_61d8;
        uStack_44d0 = uStack_61d0;
        uStack_44c8 = uStack_61c8;
        local_44a0 = local_6260;
        uStack_4498 = uStack_6258;
        uStack_4490 = uStack_6250;
        uStack_4488 = uStack_6248;
        local_4480 = local_4740;
        uStack_4478 = uStack_4738;
        uStack_4470 = uStack_4730;
        uStack_4468 = uStack_4728;
        local_4460 = local_4e60;
        uStack_4458 = uStack_4e58;
        uStack_4450 = uStack_4e50;
        uStack_4448 = uStack_4e48;
        local_4440 = uVar27;
        uStack_4438 = uVar28;
        uStack_4430 = uVar29;
        uStack_4428 = uVar30;
        local_43a0 = local_6220;
        uStack_4398 = uStack_6218;
        uStack_4390 = uStack_6210;
        uStack_4388 = uStack_6208;
        local_4360 = local_4d60;
        uStack_4358 = uStack_4d58;
        uStack_4350 = uStack_4d50;
        uStack_4348 = uStack_4d48;
        local_4320 = local_4d20;
        uStack_4318 = uStack_4d18;
        uStack_4310 = uStack_4d10;
        uStack_4308 = uStack_4d08;
        local_42e0 = local_4ce0;
        uStack_42d8 = uStack_4cd8;
        uStack_42d0 = uStack_4cd0;
        uStack_42c8 = uStack_4cc8;
        local_42a0 = local_4ca0;
        uStack_4298 = uStack_4c98;
        uStack_4290 = uStack_4c90;
        uStack_4288 = uStack_4c88;
        local_4260 = local_6220;
        uStack_4258 = uStack_6218;
        uStack_4250 = uStack_6210;
        uStack_4248 = uStack_6208;
        local_3840 = local_38a0;
        uStack_3838 = uStack_3898;
        uStack_3830 = uStack_3890;
        uStack_3828 = uStack_3888;
        local_3780 = local_37c0;
        uStack_3778 = uStack_37b8;
        uStack_3770 = uStack_37b0;
        uStack_3768 = uStack_37a8;
        local_3200 = local_6220;
        uStack_31f8 = uStack_6218;
        uStack_31f0 = uStack_6210;
        uStack_31e8 = uStack_6208;
        local_2d80 = local_2dc0;
        uStack_2d78 = uStack_2db8;
        uStack_2d70 = uStack_2db0;
        uStack_2d68 = uStack_2da8;
        uStack_2d48 = uStack_6b68;
        local_229c = local_22a0;
        local_2298 = local_22a0;
        local_2294 = local_22a0;
        local_2290 = local_22a0;
        local_228c = local_22a0;
        local_2288 = local_22a0;
        local_2284 = local_22a0;
        local_225c = local_2260;
        local_2258 = local_2260;
        local_2254 = local_2260;
        local_2250 = local_2260;
        local_224c = local_2260;
        local_2248 = local_2260;
        local_2244 = local_2260;
        local_215c = local_2160;
        local_2158 = local_2160;
        local_2154 = local_2160;
        local_2150 = local_2160;
        local_214c = local_2160;
        local_2148 = local_2160;
        local_2144 = local_2160;
        local_210c = local_2110;
        local_2108 = local_2110;
        local_2104 = local_2110;
        local_2100 = local_2110;
        local_20fc = local_2110;
        local_20f8 = local_2110;
        local_20f4 = local_2110;
      }
      for (; local_6d2c + 3 < local_6bc0; local_6d2c = local_6d2c + 4) {
        local_6ad0 = local_6ce0;
        local_6ac0 = *(undefined8 *)*local_6ce0;
        in_stack_ffffffffffff9128 = *(undefined8 *)(*local_6ce0 + 8);
        in_stack_ffffffffffff9130 = ZEXT816(0) << 0x20;
        local_1ce0 = 0x3f8000003f800000;
        uStack_1cd8 = 0x3f8000003f800000;
        local_1d0 = 0x42b0c0a542b0c0a5;
        uStack_1c8 = 0x42b0c0a542b0c0a5;
        auVar161._8_8_ = 0x42b0c0a542b0c0a5;
        auVar161._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(*(undefined1 (*) [16])*local_6ce0,auVar161);
        local_1380._0_8_ = auVar2._0_8_;
        local_4e0 = local_1380._0_8_;
        local_1380._8_8_ = auVar2._8_8_;
        uStack_4d8 = local_1380._8_8_;
        local_510 = 0xc2b0c0a5c2b0c0a5;
        uStack_508 = 0xc2b0c0a5c2b0c0a5;
        auVar135._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar135);
        local_1380._0_8_ = auVar3._0_8_;
        uVar7 = local_1380._0_8_;
        local_1380._8_8_ = auVar3._8_8_;
        uVar8 = local_1380._8_8_;
        local_11f0 = 0x3fb8aa3b3fb8aa3b;
        uStack_11e8 = 0x3fb8aa3b3fb8aa3b;
        local_11e0._0_4_ = auVar3._0_4_;
        local_11e0._4_4_ = auVar3._4_4_;
        uStack_11d8._0_4_ = auVar3._8_4_;
        uStack_11d8._4_4_ = auVar3._12_4_;
        local_13a0._4_4_ = local_11e0._4_4_ * 1.442695;
        local_13a0._0_4_ = (float)local_11e0 * 1.442695;
        uStack_1398._0_4_ = (float)uStack_11d8 * 1.442695;
        uStack_1398._4_4_ = uStack_11d8._4_4_ * 1.442695;
        local_10e0 = local_13a0;
        uStack_10d8 = uStack_1398;
        local_1c50 = 0x3f0000003f000000;
        uStack_1c48 = 0x3f0000003f000000;
        local_13a0._0_4_ = (float)local_11e0 * 1.442695 + 0.5;
        local_13a0._4_4_ = local_11e0._4_4_ * 1.442695 + 0.5;
        fVar175 = (float)uStack_11d8 * 1.442695 + 0.5;
        fVar177 = uStack_11d8._4_4_ * 1.442695 + 0.5;
        uStack_1398._0_4_ = fVar175;
        uStack_1398._4_4_ = fVar177;
        local_120 = local_13a0;
        uStack_118 = uStack_1398;
        local_13b0._4_4_ = (int)(float)local_13a0._4_4_;
        local_13b0._0_4_ = (int)(float)local_13a0._0_4_;
        local_13b0._8_4_ = (int)fVar175;
        local_13b0._12_4_ = (int)fVar177;
        local_270 = local_13b0._0_8_;
        uStack_268 = local_13b0._8_8_;
        auVar155._8_8_ = local_13b0._8_8_;
        auVar155._0_8_ = local_13b0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar155);
        local_1390 = auVar1._0_8_;
        local_a0 = local_1390;
        uStack_1388 = auVar1._8_8_;
        uStack_98 = uStack_1388;
        local_b0 = local_13a0;
        uStack_a8 = uStack_1398;
        auVar165._8_8_ = uStack_1398;
        auVar165._0_8_ = local_13a0;
        auVar2 = vcmpps_avx(auVar165,auVar1,1);
        local_13d0._0_8_ = auVar2._0_8_;
        local_400 = local_13d0._0_8_;
        local_13d0._8_8_ = auVar2._8_8_;
        uStack_3f8 = local_13d0._8_8_;
        local_410 = 0x3f8000003f800000;
        uStack_408 = 0x3f8000003f800000;
        auVar143._8_8_ = 0x3f8000003f800000;
        auVar143._0_8_ = 0x3f8000003f800000;
        local_13d0 = vpand_avx(auVar2,auVar143);
        local_fc0 = local_1390;
        uStack_fb8 = uStack_1388;
        local_fd0 = local_13d0._0_8_;
        uStack_fc8 = local_13d0._8_8_;
        _local_13a0 = vsubps_avx(auVar1,local_13d0);
        local_1c70 = 0x3f3180003f318000;
        uStack_1c68 = 0x3f3180003f318000;
        local_1200._0_4_ = local_13a0._0_4_;
        local_1200._4_4_ = local_13a0._4_4_;
        uStack_11f8._0_4_ = local_13a0._8_4_;
        uStack_11f8._4_4_ = local_13a0._12_4_;
        local_1390 = CONCAT44(local_1200._4_4_ * 0.6933594,(float)local_1200 * 0.6933594);
        uStack_1388._0_4_ = (float)uStack_11f8 * 0.6933594;
        uStack_1388._4_4_ = uStack_11f8._4_4_ * 0.6933594;
        local_1220 = local_13a0;
        uStack_1218 = uStack_1398;
        local_1c30 = 0xb95e8083b95e8083;
        uStack_1c28 = 0xb95e8083b95e8083;
        local_fe0 = local_1380._0_8_;
        uStack_fd8 = local_1380._8_8_;
        local_ff0 = local_1390;
        uStack_fe8 = uStack_1388;
        auVar106._8_8_ = uStack_1388;
        auVar106._0_8_ = local_1390;
        auVar2 = vsubps_avx(auVar3,auVar106);
        local_1380._0_8_ = auVar2._0_8_;
        local_1000 = local_1380._0_8_;
        local_1380._8_8_ = auVar2._8_8_;
        uStack_ff8 = local_1380._8_8_;
        local_1010 = CONCAT44(local_1200._4_4_ * -0.00021219444,(float)local_1200 * -0.00021219444);
        uStack_1008 = CONCAT44(uStack_11f8._4_4_ * -0.00021219444,
                               (float)uStack_11f8 * -0.00021219444);
        auVar105._8_8_ = uStack_1008;
        auVar105._0_8_ = local_1010;
        local_1380 = vsubps_avx(auVar2,auVar105);
        local_1250 = local_1380._0_8_;
        uStack_1248 = local_1380._8_8_;
        local_1240._0_4_ = local_1380._0_4_;
        local_1240._4_4_ = local_1380._4_4_;
        uStack_1238._0_4_ = local_1380._8_4_;
        uStack_1238._4_4_ = local_1380._12_4_;
        local_13e0 = (float)local_1240 * (float)local_1240;
        fStack_13dc = local_1240._4_4_ * local_1240._4_4_;
        fStack_13d8 = (float)uStack_1238 * (float)uStack_1238;
        fStack_13d4 = uStack_1238._4_4_ * uStack_1238._4_4_;
        local_1260 = 0x3950696739506967;
        uStack_1258 = 0x3950696739506967;
        local_1270 = local_1380._0_8_;
        uStack_1268 = local_1380._8_8_;
        local_13f0 = CONCAT44(local_1240._4_4_ * 0.00019875691,(float)local_1240 * 0.00019875691);
        uStack_13e8 = CONCAT44(uStack_1238._4_4_ * 0.00019875691,(float)uStack_1238 * 0.00019875691)
        ;
        local_1100 = local_13f0;
        uStack_10f8 = uStack_13e8;
        local_1110 = 0x3ab743ce3ab743ce;
        uStack_1108 = 0x3ab743ce3ab743ce;
        fVar175 = (float)local_1240 * 0.00019875691 + 0.0013981999;
        fVar177 = local_1240._4_4_ * 0.00019875691 + 0.0013981999;
        fVar178 = (float)uStack_1238 * 0.00019875691 + 0.0013981999;
        fVar179 = uStack_1238._4_4_ * 0.00019875691 + 0.0013981999;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1280 = local_13f0;
        uStack_1278 = uStack_13e8;
        local_1290 = local_1380._0_8_;
        uStack_1288 = local_1380._8_8_;
        fVar175 = fVar175 * (float)local_1240;
        fVar177 = fVar177 * local_1240._4_4_;
        fVar178 = fVar178 * (float)uStack_1238;
        fVar179 = fVar179 * uStack_1238._4_4_;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1120 = local_13f0;
        uStack_1118 = uStack_13e8;
        local_1130 = 0x3c0889083c088908;
        uStack_1128 = 0x3c0889083c088908;
        fVar175 = fVar175 + 0.008333452;
        fVar177 = fVar177 + 0.008333452;
        fVar178 = fVar178 + 0.008333452;
        fVar179 = fVar179 + 0.008333452;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_12a0 = local_13f0;
        uStack_1298 = uStack_13e8;
        local_12b0 = local_1380._0_8_;
        uStack_12a8 = local_1380._8_8_;
        fVar175 = fVar175 * (float)local_1240;
        fVar177 = fVar177 * local_1240._4_4_;
        fVar178 = fVar178 * (float)uStack_1238;
        fVar179 = fVar179 * uStack_1238._4_4_;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1140 = local_13f0;
        uStack_1138 = uStack_13e8;
        local_1150 = 0x3d2aa9c13d2aa9c1;
        uStack_1148 = 0x3d2aa9c13d2aa9c1;
        fVar175 = fVar175 + 0.041665796;
        fVar177 = fVar177 + 0.041665796;
        fVar178 = fVar178 + 0.041665796;
        fVar179 = fVar179 + 0.041665796;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_12c0 = local_13f0;
        uStack_12b8 = uStack_13e8;
        local_12d0 = local_1380._0_8_;
        uStack_12c8 = local_1380._8_8_;
        fVar175 = fVar175 * (float)local_1240;
        fVar177 = fVar177 * local_1240._4_4_;
        fVar178 = fVar178 * (float)uStack_1238;
        fVar179 = fVar179 * uStack_1238._4_4_;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1160 = local_13f0;
        uStack_1158 = uStack_13e8;
        local_1170 = 0x3e2aaaaa3e2aaaaa;
        uStack_1168 = 0x3e2aaaaa3e2aaaaa;
        fVar175 = fVar175 + 0.16666666;
        fVar177 = fVar177 + 0.16666666;
        fVar178 = fVar178 + 0.16666666;
        fVar179 = fVar179 + 0.16666666;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_12e0 = local_13f0;
        uStack_12d8 = uStack_13e8;
        local_12f0 = local_1380._0_8_;
        uStack_12e8 = local_1380._8_8_;
        fVar175 = fVar175 * (float)local_1240;
        fVar177 = fVar177 * local_1240._4_4_;
        fVar178 = fVar178 * (float)uStack_1238;
        fVar179 = fVar179 * uStack_1238._4_4_;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1180 = local_13f0;
        uStack_1178 = uStack_13e8;
        fVar175 = fVar175 + 0.5;
        fVar177 = fVar177 + 0.5;
        fVar178 = fVar178 + 0.5;
        fVar179 = fVar179 + 0.5;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1300 = local_13f0;
        uStack_12f8 = uStack_13e8;
        local_1310 = CONCAT44(fStack_13dc,local_13e0);
        uStack_1308 = CONCAT44(fStack_13d4,fStack_13d8);
        fVar175 = fVar175 * local_13e0;
        fVar177 = fVar177 * fStack_13dc;
        fVar178 = fVar178 * fStack_13d8;
        fVar179 = fVar179 * fStack_13d4;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_11a0 = local_13f0;
        uStack_1198 = uStack_13e8;
        local_11b0 = local_1380._0_8_;
        uStack_11a8 = local_1380._8_8_;
        fVar175 = fVar175 + (float)local_1240;
        fVar177 = fVar177 + local_1240._4_4_;
        fVar178 = fVar178 + (float)uStack_1238;
        fVar179 = fVar179 + uStack_1238._4_4_;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_11c0 = local_13f0;
        uStack_11b8 = uStack_13e8;
        local_11d0 = 0x3f8000003f800000;
        uStack_11c8 = 0x3f8000003f800000;
        fVar175 = fVar175 + 1.0;
        fVar177 = fVar177 + 1.0;
        fVar178 = fVar178 + 1.0;
        fVar179 = fVar179 + 1.0;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_130 = local_13a0;
        uStack_128 = uStack_1398;
        local_13b0._4_4_ = (int)local_1200._4_4_;
        local_13b0._0_4_ = (int)(float)local_1200;
        local_13b0._8_4_ = (int)(float)uStack_11f8;
        local_13b0._12_4_ = (int)uStack_11f8._4_4_;
        local_1360 = local_13b0._0_8_;
        uStack_1358 = local_13b0._8_8_;
        local_1c90 = 0x7f0000007f;
        uStack_1c88 = 0x7f0000007f;
        auVar104._8_8_ = local_13b0._8_8_;
        auVar104._0_8_ = local_13b0._0_8_;
        auVar103._8_8_ = 0x7f0000007f;
        auVar103._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar104,auVar103);
        local_13b0._0_8_ = auVar2._0_8_;
        local_1340 = local_13b0._0_8_;
        local_13b0._8_8_ = auVar2._8_8_;
        uStack_1338 = local_13b0._8_8_;
        local_1344 = 0x17;
        local_13b0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_50 = local_13b0._0_8_;
        uStack_48 = local_13b0._8_8_;
        local_1400 = local_13b0._0_8_;
        uStack_13f8 = local_13b0._8_8_;
        local_1320 = local_13f0;
        uStack_1318 = uStack_13e8;
        local_1330._0_4_ = local_13b0._0_4_;
        local_1330._4_4_ = local_13b0._4_4_;
        uStack_1328._0_4_ = local_13b0._8_4_;
        uStack_1328._4_4_ = local_13b0._12_4_;
        fVar175 = fVar175 * (float)local_1330;
        fVar177 = fVar177 * local_1330._4_4_;
        fVar178 = fVar178 * (float)uStack_1328;
        fVar179 = fVar179 * uStack_1328._4_4_;
        local_13f0 = CONCAT44(fVar177,fVar175);
        uStack_13e8 = CONCAT44(fVar179,fVar178);
        local_1740 = local_13f0;
        uStack_1738 = uStack_13e8;
        local_1014 = 0x3f800000;
        local_1030 = 0x3f800000;
        local_1750 = 0x3f8000003f800000;
        uStack_1748 = 0x3f8000003f800000;
        local_1cc0._4_4_ = fVar177 + 1.0;
        local_1cc0._0_4_ = fVar175 + 1.0;
        uStack_1cb8._0_4_ = fVar178 + 1.0;
        uStack_1cb8._4_4_ = fVar179 + 1.0;
        local_560 = local_1cc0;
        uStack_558 = uStack_1cb8;
        local_5d0 = 0;
        local_570 = 0;
        local_590._8_8_ = SUB168(ZEXT816(0),4);
        uStack_568 = local_590._8_8_;
        auVar131._8_8_ = uStack_1cb8;
        auVar131._0_8_ = local_1cc0;
        auVar170._8_8_ = 0;
        auVar170._0_8_ = local_590._8_8_;
        local_1cf0 = vcmpps_avx(auVar131,auVar170 << 0x40,2);
        local_4a0 = local_1cc0;
        uStack_498 = uStack_1cb8;
        local_4b0 = 0x80000000800000;
        uStack_4a8 = 0x80000000800000;
        auVar138._8_8_ = uStack_1cb8;
        auVar138._0_8_ = local_1cc0;
        auVar137._8_8_ = 0x80000000800000;
        auVar137._0_8_ = 0x80000000800000;
        auVar2 = vmaxps_avx(auVar138,auVar137);
        local_1cc0 = auVar2._0_8_;
        local_470 = local_1cc0;
        uStack_1cb8 = auVar2._8_8_;
        uStack_468 = uStack_1cb8;
        local_1ca0 = local_1cc0;
        uStack_1c98 = uStack_1cb8;
        local_1ca4 = 0x17;
        auVar3 = vpsrld_avx(auVar2,ZEXT416(0x17));
        local_380 = local_1cc0;
        uStack_378 = uStack_1cb8;
        local_390 = 0x807fffff807fffff;
        uStack_388 = 0x807fffff807fffff;
        auVar146._8_8_ = 0x807fffff807fffff;
        auVar146._0_8_ = 0x807fffff807fffff;
        auVar2 = vpand_avx(auVar2,auVar146);
        local_1cc0 = auVar2._0_8_;
        local_2e0 = local_1cc0;
        uStack_1cb8 = auVar2._8_8_;
        uStack_2d8 = uStack_1cb8;
        auVar150._8_8_ = 0x3f0000003f000000;
        auVar150._0_8_ = 0x3f0000003f000000;
        auVar1 = vpor_avx(auVar2,auVar150);
        local_1cd0._0_8_ = auVar3._0_8_;
        local_1c80 = local_1cd0._0_8_;
        local_1cd0._8_8_ = auVar3._8_8_;
        uStack_1c78 = local_1cd0._8_8_;
        auVar100._8_8_ = 0x7f0000007f;
        auVar100._0_8_ = 0x7f0000007f;
        local_1cd0 = vpsubd_avx(auVar3,auVar100);
        local_250 = local_1cd0._0_8_;
        uStack_248 = local_1cd0._8_8_;
        auVar2 = vcvtdq2ps_avx(local_1cd0);
        local_1d00 = auVar2._0_8_;
        uVar9 = local_1d00;
        uStack_1cf8 = auVar2._8_8_;
        uVar10 = uStack_1cf8;
        local_1930 = 0x3f8000003f800000;
        uStack_1928 = 0x3f8000003f800000;
        local_1920._0_4_ = auVar2._0_4_;
        local_1920._4_4_ = auVar2._4_4_;
        uStack_1918._0_4_ = auVar2._8_4_;
        uStack_1918._4_4_ = auVar2._12_4_;
        local_1d00._4_4_ = local_1920._4_4_ + 1.0;
        local_1d00._0_4_ = (float)local_1920 + 1.0;
        uStack_1cf8._0_4_ = (float)uStack_1918 + 1.0;
        uStack_1cf8._4_4_ = uStack_1918._4_4_ + 1.0;
        local_1cc0 = auVar1._0_8_;
        local_220 = local_1cc0;
        uStack_1cb8 = auVar1._8_8_;
        uStack_218 = uStack_1cb8;
        local_230 = 0x3f3504f33f3504f3;
        uStack_228 = 0x3f3504f33f3504f3;
        auVar157._8_8_ = 0x3f3504f33f3504f3;
        auVar157._0_8_ = 0x3f3504f33f3504f3;
        local_1d10 = vcmpps_avx(auVar1,auVar157,1);
        local_3a0 = local_1cc0;
        uStack_398 = uStack_1cb8;
        local_3b0 = local_1d10._0_8_;
        uStack_3a8 = local_1d10._8_8_;
        auVar2 = vpand_avx(auVar1,local_1d10);
        local_f00 = local_1cc0;
        uStack_ef8 = uStack_1cb8;
        local_f10 = 0x3f8000003f800000;
        uStack_f08 = 0x3f8000003f800000;
        auVar112._8_8_ = 0x3f8000003f800000;
        auVar112._0_8_ = 0x3f8000003f800000;
        auVar1 = vsubps_avx(auVar1,auVar112);
        local_f20 = local_1d00;
        uStack_f18 = uStack_1cf8;
        local_3c0 = 0x3f8000003f800000;
        uStack_3b8 = 0x3f8000003f800000;
        local_3d0 = local_1d10._0_8_;
        uStack_3c8 = local_1d10._8_8_;
        auVar145._8_8_ = 0x3f8000003f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        local_f30 = vpand_avx(auVar145,local_1d10);
        auVar111._8_8_ = uStack_1cf8;
        auVar111._0_8_ = local_1d00;
        _local_1d00 = vsubps_avx(auVar111,local_f30);
        local_1cc0 = auVar1._0_8_;
        uVar11 = local_1cc0;
        uStack_1cb8 = auVar1._8_8_;
        uVar12 = uStack_1cb8;
        local_1d20 = auVar2._0_8_;
        uVar13 = local_1d20;
        uStack_1d18 = auVar2._8_8_;
        uVar14 = uStack_1d18;
        local_1940._0_4_ = auVar1._0_4_;
        local_1940._4_4_ = auVar1._4_4_;
        uStack_1938._0_4_ = auVar1._8_4_;
        uStack_1938._4_4_ = auVar1._12_4_;
        local_1950._0_4_ = auVar2._0_4_;
        local_1950._4_4_ = auVar2._4_4_;
        uStack_1948._0_4_ = auVar2._8_4_;
        uStack_1948._4_4_ = auVar2._12_4_;
        local_1940._0_4_ = (float)local_1940 + (float)local_1950;
        local_1940._4_4_ = local_1940._4_4_ + local_1950._4_4_;
        uStack_1938._0_4_ = (float)uStack_1938 + (float)uStack_1948;
        uStack_1938._4_4_ = uStack_1938._4_4_ + uStack_1948._4_4_;
        local_1cc0._4_4_ = local_1940._4_4_;
        local_1cc0._0_4_ = (float)local_1940;
        uStack_1cb8._0_4_ = (float)uStack_1938;
        uStack_1cb8._4_4_ = uStack_1938._4_4_;
        local_1ad0 = local_1cc0;
        uStack_1ac8 = uStack_1cb8;
        local_1d30 = (float)local_1940 * (float)local_1940;
        fStack_1d2c = local_1940._4_4_ * local_1940._4_4_;
        fStack_1d28 = (float)uStack_1938 * (float)uStack_1938;
        fStack_1d24 = uStack_1938._4_4_ * uStack_1938._4_4_;
        local_1ae0 = 0x3d9021bb3d9021bb;
        uStack_1ad8 = 0x3d9021bb3d9021bb;
        local_1af0 = local_1cc0;
        uStack_1ae8 = uStack_1cb8;
        local_1d40._4_4_ = local_1940._4_4_ * 0.070376836;
        local_1d40._0_4_ = (float)local_1940 * 0.070376836;
        uStack_1d38._0_4_ = (float)uStack_1938 * 0.070376836;
        uStack_1d38._4_4_ = uStack_1938._4_4_ * 0.070376836;
        local_1960 = local_1d40;
        uStack_1958 = uStack_1d38;
        local_1970 = 0xbdebd1b8bdebd1b8;
        uStack_1968 = 0xbdebd1b8bdebd1b8;
        local_1d40._0_4_ = (float)local_1940 * 0.070376836 + -0.1151461;
        local_1d40._4_4_ = local_1940._4_4_ * 0.070376836 + -0.1151461;
        fVar175 = (float)uStack_1938 * 0.070376836 + -0.1151461;
        fVar177 = uStack_1938._4_4_ * 0.070376836 + -0.1151461;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1b00 = local_1d40;
        uStack_1af8 = uStack_1d38;
        local_1b10 = local_1cc0;
        uStack_1b08 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1980 = local_1d40;
        uStack_1978 = uStack_1d38;
        local_1990 = 0x3def251a3def251a;
        uStack_1988 = 0x3def251a3def251a;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + 0.116769984;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + 0.116769984;
        fVar175 = fVar175 + 0.116769984;
        fVar177 = fVar177 + 0.116769984;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1b20 = local_1d40;
        uStack_1b18 = uStack_1d38;
        local_1b30 = local_1cc0;
        uStack_1b28 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_19a0 = local_1d40;
        uStack_1998 = uStack_1d38;
        local_19b0 = 0xbdfe5d4fbdfe5d4f;
        uStack_19a8 = 0xbdfe5d4fbdfe5d4f;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + -0.12420141;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + -0.12420141;
        fVar175 = fVar175 + -0.12420141;
        fVar177 = fVar177 + -0.12420141;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1b40 = local_1d40;
        uStack_1b38 = uStack_1d38;
        local_1b50 = local_1cc0;
        uStack_1b48 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_19c0 = local_1d40;
        uStack_19b8 = uStack_1d38;
        local_19d0 = 0x3e11e9bf3e11e9bf;
        uStack_19c8 = 0x3e11e9bf3e11e9bf;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + 0.14249323;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + 0.14249323;
        fVar175 = fVar175 + 0.14249323;
        fVar177 = fVar177 + 0.14249323;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1b60 = local_1d40;
        uStack_1b58 = uStack_1d38;
        local_1b70 = local_1cc0;
        uStack_1b68 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_19e0 = local_1d40;
        uStack_19d8 = uStack_1d38;
        local_19f0 = 0xbe2aae50be2aae50;
        uStack_19e8 = 0xbe2aae50be2aae50;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + -0.16668057;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + -0.16668057;
        fVar175 = fVar175 + -0.16668057;
        fVar177 = fVar177 + -0.16668057;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1b80 = local_1d40;
        uStack_1b78 = uStack_1d38;
        local_1b90 = local_1cc0;
        uStack_1b88 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1a00 = local_1d40;
        uStack_19f8 = uStack_1d38;
        local_1a10 = 0x3e4cceac3e4cceac;
        uStack_1a08 = 0x3e4cceac3e4cceac;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + 0.20000714;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + 0.20000714;
        fVar175 = fVar175 + 0.20000714;
        fVar177 = fVar177 + 0.20000714;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1ba0 = local_1d40;
        uStack_1b98 = uStack_1d38;
        local_1bb0 = local_1cc0;
        uStack_1ba8 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1a20 = local_1d40;
        uStack_1a18 = uStack_1d38;
        local_1a30 = 0xbe7ffffcbe7ffffc;
        uStack_1a28 = 0xbe7ffffcbe7ffffc;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + -0.24999994;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + -0.24999994;
        fVar175 = fVar175 + -0.24999994;
        fVar177 = fVar177 + -0.24999994;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1bc0 = local_1d40;
        uStack_1bb8 = uStack_1d38;
        local_1bd0 = local_1cc0;
        uStack_1bc8 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1a40 = local_1d40;
        uStack_1a38 = uStack_1d38;
        local_1a50 = 0x3eaaaaaa3eaaaaaa;
        uStack_1a48 = 0x3eaaaaaa3eaaaaaa;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + 0.3333333;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + 0.3333333;
        fVar175 = fVar175 + 0.3333333;
        fVar177 = fVar177 + 0.3333333;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1be0 = local_1d40;
        uStack_1bd8 = uStack_1d38;
        local_1bf0 = local_1cc0;
        uStack_1be8 = uStack_1cb8;
        local_1d40._0_4_ = (float)local_1d40._0_4_ * (float)local_1940;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * local_1940._4_4_;
        fVar175 = fVar175 * (float)uStack_1938;
        fVar177 = fVar177 * uStack_1938._4_4_;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1c00 = local_1d40;
        uStack_1bf8 = uStack_1d38;
        local_1c10 = CONCAT44(fStack_1d2c,local_1d30);
        uStack_1c08 = CONCAT44(fStack_1d24,fStack_1d28);
        local_1d40._0_4_ = (float)local_1d40._0_4_ * local_1d30;
        local_1d40._4_4_ = (float)local_1d40._4_4_ * fStack_1d2c;
        fVar175 = fVar175 * fStack_1d28;
        fVar177 = fVar177 * fStack_1d24;
        uStack_1d38._0_4_ = fVar175;
        uStack_1d38._4_4_ = fVar177;
        local_1c20._0_4_ = local_1d00._0_4_;
        local_1c20._4_4_ = local_1d00._4_4_;
        uStack_1c18._0_4_ = local_1d00._8_4_;
        uStack_1c18._4_4_ = local_1d00._12_4_;
        local_1d20 = CONCAT44(local_1c20._4_4_ * -0.00021219444,(float)local_1c20 * -0.00021219444);
        uStack_1d18._0_4_ = (float)uStack_1c18 * -0.00021219444;
        uStack_1d18._4_4_ = uStack_1c18._4_4_ * -0.00021219444;
        local_1a60 = local_1d40;
        uStack_1a58 = uStack_1d38;
        local_1a70 = local_1d20;
        uStack_1a68 = uStack_1d18;
        local_1d40._4_4_ = (float)local_1d40._4_4_ + local_1c20._4_4_ * -0.00021219444;
        local_1d40._0_4_ = (float)local_1d40._0_4_ + (float)local_1c20 * -0.00021219444;
        uStack_1d38._0_4_ = fVar175 + (float)uStack_1c18 * -0.00021219444;
        uStack_1d38._4_4_ = fVar177 + uStack_1c18._4_4_ * -0.00021219444;
        local_1c40 = CONCAT44(fStack_1d2c,local_1d30);
        uStack_1c38 = CONCAT44(fStack_1d24,fStack_1d28);
        local_1d20 = CONCAT44(fStack_1d2c * 0.5,local_1d30 * 0.5);
        uStack_1d18._0_4_ = fStack_1d28 * 0.5;
        uStack_1d18._4_4_ = fStack_1d24 * 0.5;
        local_f40 = local_1d40;
        uStack_f38 = uStack_1d38;
        local_f50 = local_1d20;
        uStack_f48 = uStack_1d18;
        auVar110._8_8_ = uStack_1d38;
        auVar110._0_8_ = local_1d40;
        auVar109._8_8_ = uStack_1d18;
        auVar109._0_8_ = local_1d20;
        _local_1d40 = vsubps_avx(auVar110,auVar109);
        local_1c60 = local_1d00;
        uStack_1c58 = uStack_1cf8;
        local_1d20 = CONCAT44(local_1c20._4_4_ * 0.6933594,(float)local_1c20 * 0.6933594);
        uStack_1d18._0_4_ = (float)uStack_1c18 * 0.6933594;
        uStack_1d18._4_4_ = uStack_1c18._4_4_ * 0.6933594;
        local_1a80 = local_1cc0;
        uStack_1a78 = uStack_1cb8;
        local_1a90._0_4_ = local_1d40._0_4_;
        local_1a90._4_4_ = local_1d40._4_4_;
        uStack_1a88._0_4_ = local_1d40._8_4_;
        uStack_1a88._4_4_ = local_1d40._12_4_;
        local_1cc0._4_4_ = local_1940._4_4_ + local_1a90._4_4_;
        local_1cc0._0_4_ = (float)local_1940 + (float)local_1a90;
        uStack_1cb8._0_4_ = (float)uStack_1938 + (float)uStack_1a88;
        uStack_1cb8._4_4_ = uStack_1938._4_4_ + uStack_1a88._4_4_;
        local_1aa0 = local_1cc0;
        uStack_1a98 = uStack_1cb8;
        local_1ab0 = local_1d20;
        uStack_1aa8 = uStack_1d18;
        local_1cc0._4_4_ = local_1940._4_4_ + local_1a90._4_4_ + local_1c20._4_4_ * 0.6933594;
        local_1cc0._0_4_ = (float)local_1940 + (float)local_1a90 + (float)local_1c20 * 0.6933594;
        uStack_1cb8._0_4_ = (float)uStack_1938 + (float)uStack_1a88 + (float)uStack_1c18 * 0.6933594
        ;
        uStack_1cb8._4_4_ = uStack_1938._4_4_ + uStack_1a88._4_4_ + uStack_1c18._4_4_ * 0.6933594;
        local_300 = local_1cc0;
        uStack_2f8 = uStack_1cb8;
        local_310 = local_1cf0._0_8_;
        uStack_308 = local_1cf0._8_8_;
        auVar149._8_8_ = uStack_1cb8;
        auVar149._0_8_ = local_1cc0;
        _local_1cc0 = vpor_avx(auVar149,local_1cf0);
        local_2020 = local_1cc0;
        uStack_2018 = uStack_1cb8;
        local_1094 = 0x3f800000;
        local_10b0 = 0x3f800000;
        local_2030 = 0x3f8000003f800000;
        uStack_2028 = 0x3f8000003f800000;
        local_10b4 = 0x40000000;
        local_10d0 = 0x40000000;
        local_2040 = 0x4000000040000000;
        uStack_2038 = 0x4000000040000000;
        local_1fe0._0_4_ = local_1cc0._0_4_;
        local_1fe0._4_4_ = local_1cc0._4_4_;
        uStack_1fd8._0_4_ = local_1cc0._8_4_;
        uStack_1fd8._4_4_ = local_1cc0._12_4_;
        local_e40 = (float)local_1fe0 * 2.0;
        fStack_e3c = local_1fe0._4_4_ * 2.0;
        fStack_e38 = (float)uStack_1fd8 * 2.0;
        fStack_e34 = uStack_1fd8._4_4_ * 2.0;
        local_ac4 = 0x3f800000;
        local_ae0 = 0x3f800000;
        local_e50 = 0x3f8000003f800000;
        uStack_e48 = 0x3f8000003f800000;
        local_e20._8_8_ = 0x3f8000003f800000;
        local_e20._0_8_ = 0x3f8000003f800000;
        local_a50 = 0;
        uStack_a48 = local_590._8_8_;
        local_a60 = CONCAT44(fStack_e3c,local_e40);
        uStack_a58 = CONCAT44(fStack_e34,fStack_e38);
        auVar171._8_8_ = 0;
        auVar171._0_8_ = local_590._8_8_;
        auVar123._8_8_ = uStack_a58;
        auVar123._0_8_ = local_a60;
        auVar2 = vsubps_avx(auVar171 << 0x40,auVar123);
        uStack_5c8 = local_590._8_8_;
        local_d80 = 0x7f0000007f;
        uStack_d78 = 0x7f0000007f;
        local_d90._0_8_ = auVar2._0_8_;
        local_1c0 = local_d90._0_8_;
        local_d90._8_8_ = auVar2._8_8_;
        uStack_1b8 = local_d90._8_8_;
        auVar160._8_8_ = 0x42b0c0a542b0c0a5;
        auVar160._0_8_ = 0x42b0c0a542b0c0a5;
        auVar2 = vminps_avx(auVar2,auVar160);
        local_d90._0_8_ = auVar2._0_8_;
        local_500 = local_d90._0_8_;
        local_d90._8_8_ = auVar2._8_8_;
        uStack_4f8 = local_d90._8_8_;
        auVar134._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar134._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar3 = vmaxps_avx(auVar2,auVar134);
        local_d90._0_8_ = auVar3._0_8_;
        uVar15 = local_d90._0_8_;
        local_d90._8_8_ = auVar3._8_8_;
        uVar16 = local_d90._8_8_;
        local_bf0._0_4_ = auVar3._0_4_;
        local_bf0._4_4_ = auVar3._4_4_;
        uStack_be8._0_4_ = auVar3._8_4_;
        uStack_be8._4_4_ = auVar3._12_4_;
        local_db0._4_4_ = local_bf0._4_4_ * 1.442695;
        local_db0._0_4_ = (float)local_bf0 * 1.442695;
        uStack_da8._0_4_ = (float)uStack_be8 * 1.442695;
        uStack_da8._4_4_ = uStack_be8._4_4_ * 1.442695;
        local_af0 = local_db0;
        uStack_ae8 = uStack_da8;
        local_db0._0_4_ = (float)local_bf0 * 1.442695 + 0.5;
        local_db0._4_4_ = local_bf0._4_4_ * 1.442695 + 0.5;
        fVar175 = (float)uStack_be8 * 1.442695 + 0.5;
        fVar177 = uStack_be8._4_4_ * 1.442695 + 0.5;
        uStack_da8._0_4_ = fVar175;
        uStack_da8._4_4_ = fVar177;
        local_140 = local_db0;
        uStack_138 = uStack_da8;
        local_dc0._4_4_ = (int)(float)local_db0._4_4_;
        local_dc0._0_4_ = (int)(float)local_db0._0_4_;
        local_dc0._8_4_ = (int)fVar175;
        local_dc0._12_4_ = (int)fVar177;
        local_280 = local_dc0._0_8_;
        uStack_278 = local_dc0._8_8_;
        auVar154._8_8_ = local_dc0._8_8_;
        auVar154._0_8_ = local_dc0._0_8_;
        auVar1 = vcvtdq2ps_avx(auVar154);
        local_da0 = auVar1._0_8_;
        local_c0 = local_da0;
        uStack_d98 = auVar1._8_8_;
        uStack_b8 = uStack_d98;
        local_d0 = local_db0;
        uStack_c8 = uStack_da8;
        auVar164._8_8_ = uStack_da8;
        auVar164._0_8_ = local_db0;
        auVar2 = vcmpps_avx(auVar164,auVar1,1);
        local_de0._0_8_ = auVar2._0_8_;
        local_420 = local_de0._0_8_;
        local_de0._8_8_ = auVar2._8_8_;
        uStack_418 = local_de0._8_8_;
        local_430 = 0x3f8000003f800000;
        uStack_428 = 0x3f8000003f800000;
        auVar142._8_8_ = 0x3f8000003f800000;
        auVar142._0_8_ = 0x3f8000003f800000;
        local_de0 = vpand_avx(auVar2,auVar142);
        local_a70 = local_da0;
        uStack_a68 = uStack_d98;
        local_a80 = local_de0._0_8_;
        uStack_a78 = local_de0._8_8_;
        _local_db0 = vsubps_avx(auVar1,local_de0);
        local_c10._0_4_ = local_db0._0_4_;
        local_c10._4_4_ = local_db0._4_4_;
        uStack_c08._0_4_ = local_db0._8_4_;
        uStack_c08._4_4_ = local_db0._12_4_;
        local_da0 = CONCAT44(local_c10._4_4_ * 0.6933594,(float)local_c10 * 0.6933594);
        uStack_d98._0_4_ = (float)uStack_c08 * 0.6933594;
        uStack_d98._4_4_ = uStack_c08._4_4_ * 0.6933594;
        local_c30 = local_db0;
        uStack_c28 = uStack_da8;
        local_a90 = local_d90._0_8_;
        uStack_a88 = local_d90._8_8_;
        local_aa0 = local_da0;
        uStack_a98 = uStack_d98;
        auVar122._8_8_ = uStack_d98;
        auVar122._0_8_ = local_da0;
        auVar2 = vsubps_avx(auVar3,auVar122);
        local_d90._0_8_ = auVar2._0_8_;
        local_ab0 = local_d90._0_8_;
        local_d90._8_8_ = auVar2._8_8_;
        uStack_aa8 = local_d90._8_8_;
        local_ac0 = CONCAT44(local_c10._4_4_ * -0.00021219444,(float)local_c10 * -0.00021219444);
        uStack_ab8 = CONCAT44(uStack_c08._4_4_ * -0.00021219444,(float)uStack_c08 * -0.00021219444);
        auVar121._8_8_ = uStack_ab8;
        auVar121._0_8_ = local_ac0;
        local_d90 = vsubps_avx(auVar2,auVar121);
        local_c60 = local_d90._0_8_;
        uStack_c58 = local_d90._8_8_;
        local_c50._0_4_ = local_d90._0_4_;
        local_c50._4_4_ = local_d90._4_4_;
        uStack_c48._0_4_ = local_d90._8_4_;
        uStack_c48._4_4_ = local_d90._12_4_;
        local_df0 = (float)local_c50 * (float)local_c50;
        fStack_dec = local_c50._4_4_ * local_c50._4_4_;
        fStack_de8 = (float)uStack_c48 * (float)uStack_c48;
        fStack_de4 = uStack_c48._4_4_ * uStack_c48._4_4_;
        local_c70 = 0x3950696739506967;
        uStack_c68 = 0x3950696739506967;
        local_c80 = local_d90._0_8_;
        uStack_c78 = local_d90._8_8_;
        local_b10 = CONCAT44(local_c50._4_4_ * 0.00019875691,(float)local_c50 * 0.00019875691);
        uStack_b08 = CONCAT44(uStack_c48._4_4_ * 0.00019875691,(float)uStack_c48 * 0.00019875691);
        local_e00 = (float)local_c50 * 0.00019875691 + 0.0013981999;
        fStack_dfc = local_c50._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_df8 = (float)uStack_c48 * 0.00019875691 + 0.0013981999;
        fStack_df4 = uStack_c48._4_4_ * 0.00019875691 + 0.0013981999;
        local_c90 = CONCAT44(fStack_dfc,local_e00);
        uStack_c88 = CONCAT44(fStack_df4,fStack_df8);
        local_ca0 = local_d90._0_8_;
        uStack_c98 = local_d90._8_8_;
        local_e00 = local_e00 * (float)local_c50;
        fStack_dfc = fStack_dfc * local_c50._4_4_;
        fStack_df8 = fStack_df8 * (float)uStack_c48;
        fStack_df4 = fStack_df4 * uStack_c48._4_4_;
        local_b30 = CONCAT44(fStack_dfc,local_e00);
        uStack_b28 = CONCAT44(fStack_df4,fStack_df8);
        local_e00 = local_e00 + 0.008333452;
        fStack_dfc = fStack_dfc + 0.008333452;
        fStack_df8 = fStack_df8 + 0.008333452;
        fStack_df4 = fStack_df4 + 0.008333452;
        local_cb0 = CONCAT44(fStack_dfc,local_e00);
        uStack_ca8 = CONCAT44(fStack_df4,fStack_df8);
        local_cc0 = local_d90._0_8_;
        uStack_cb8 = local_d90._8_8_;
        local_e00 = (float)local_c50 * local_e00;
        fStack_dfc = local_c50._4_4_ * fStack_dfc;
        fStack_df8 = (float)uStack_c48 * fStack_df8;
        fStack_df4 = uStack_c48._4_4_ * fStack_df4;
        local_b50 = CONCAT44(fStack_dfc,local_e00);
        uStack_b48 = CONCAT44(fStack_df4,fStack_df8);
        local_e00 = local_e00 + 0.041665796;
        fStack_dfc = fStack_dfc + 0.041665796;
        fStack_df8 = fStack_df8 + 0.041665796;
        fStack_df4 = fStack_df4 + 0.041665796;
        local_cd0 = CONCAT44(fStack_dfc,local_e00);
        uStack_cc8 = CONCAT44(fStack_df4,fStack_df8);
        local_ce0 = local_d90._0_8_;
        uStack_cd8 = local_d90._8_8_;
        local_e00 = local_e00 * (float)local_c50;
        fStack_dfc = fStack_dfc * local_c50._4_4_;
        fStack_df8 = fStack_df8 * (float)uStack_c48;
        fStack_df4 = fStack_df4 * uStack_c48._4_4_;
        local_b70 = CONCAT44(fStack_dfc,local_e00);
        uStack_b68 = CONCAT44(fStack_df4,fStack_df8);
        local_e00 = local_e00 + 0.16666666;
        fStack_dfc = fStack_dfc + 0.16666666;
        fStack_df8 = fStack_df8 + 0.16666666;
        fStack_df4 = fStack_df4 + 0.16666666;
        local_cf0 = CONCAT44(fStack_dfc,local_e00);
        uStack_ce8 = CONCAT44(fStack_df4,fStack_df8);
        local_d00 = local_d90._0_8_;
        uStack_cf8 = local_d90._8_8_;
        local_e00 = local_e00 * (float)local_c50;
        fStack_dfc = fStack_dfc * local_c50._4_4_;
        fStack_df8 = fStack_df8 * (float)uStack_c48;
        fStack_df4 = fStack_df4 * uStack_c48._4_4_;
        local_b90 = CONCAT44(fStack_dfc,local_e00);
        uStack_b88 = CONCAT44(fStack_df4,fStack_df8);
        local_e00 = local_e00 + 0.5;
        fStack_dfc = fStack_dfc + 0.5;
        fStack_df8 = fStack_df8 + 0.5;
        fStack_df4 = fStack_df4 + 0.5;
        local_d10 = CONCAT44(fStack_dfc,local_e00);
        uStack_d08 = CONCAT44(fStack_df4,fStack_df8);
        local_d20 = CONCAT44(fStack_dec,local_df0);
        uStack_d18 = CONCAT44(fStack_de4,fStack_de8);
        local_e00 = local_e00 * local_df0;
        fStack_dfc = fStack_dfc * fStack_dec;
        fStack_df8 = fStack_df8 * fStack_de8;
        fStack_df4 = fStack_df4 * fStack_de4;
        local_bb0 = CONCAT44(fStack_dfc,local_e00);
        uStack_ba8 = CONCAT44(fStack_df4,fStack_df8);
        local_bc0 = local_d90._0_8_;
        uStack_bb8 = local_d90._8_8_;
        local_e00 = local_e00 + (float)local_c50;
        fStack_dfc = fStack_dfc + local_c50._4_4_;
        fStack_df8 = fStack_df8 + (float)uStack_c48;
        fStack_df4 = fStack_df4 + uStack_c48._4_4_;
        local_bd0 = CONCAT44(fStack_dfc,local_e00);
        uStack_bc8 = CONCAT44(fStack_df4,fStack_df8);
        local_be0 = 0x3f8000003f800000;
        uStack_bd8 = 0x3f8000003f800000;
        local_e00 = local_e00 + 1.0;
        fStack_dfc = fStack_dfc + 1.0;
        fStack_df8 = fStack_df8 + 1.0;
        fStack_df4 = fStack_df4 + 1.0;
        local_150 = local_db0;
        uStack_148 = uStack_da8;
        local_dc0._4_4_ = (int)local_c10._4_4_;
        local_dc0._0_4_ = (int)(float)local_c10;
        local_dc0._8_4_ = (int)(float)uStack_c08;
        local_dc0._12_4_ = (int)uStack_c08._4_4_;
        local_d70 = local_dc0._0_8_;
        uStack_d68 = local_dc0._8_8_;
        auVar120._8_8_ = local_dc0._8_8_;
        auVar120._0_8_ = local_dc0._0_8_;
        auVar119._8_8_ = 0x7f0000007f;
        auVar119._0_8_ = 0x7f0000007f;
        auVar2 = vpaddd_avx(auVar120,auVar119);
        local_dc0._0_8_ = auVar2._0_8_;
        local_d50 = local_dc0._0_8_;
        local_dc0._8_8_ = auVar2._8_8_;
        uStack_d48 = local_dc0._8_8_;
        local_d54 = 0x17;
        local_dc0 = vpslld_avx(auVar2,ZEXT416(0x17));
        local_60 = local_dc0._0_8_;
        uStack_58 = local_dc0._8_8_;
        local_e10 = local_dc0._0_8_;
        uStack_e08 = local_dc0._8_8_;
        local_d30._4_4_ = fStack_dfc;
        local_d30._0_4_ = local_e00;
        local_d30._8_4_ = fStack_df8;
        local_d30._12_4_ = fStack_df4;
        local_d40._0_4_ = local_dc0._0_4_;
        local_d40._4_4_ = local_dc0._4_4_;
        uStack_d38._0_4_ = local_dc0._8_4_;
        uStack_d38._4_4_ = local_dc0._12_4_;
        local_e00 = local_e00 * (float)local_d40;
        fStack_dfc = fStack_dfc * local_d40._4_4_;
        fStack_df8 = fStack_df8 * (float)uStack_d38;
        fStack_df4 = fStack_df4 * uStack_d38._4_4_;
        local_e30 = CONCAT44(fStack_dfc,local_e00);
        uStack_e28 = CONCAT44(fStack_df4,fStack_df8);
        local_610 = local_e00 + 1.0;
        fStack_60c = fStack_dfc + 1.0;
        fStack_608 = fStack_df8 + 1.0;
        fStack_604 = fStack_df4 + 1.0;
        auVar130._4_4_ = fStack_60c;
        auVar130._0_4_ = local_610;
        auVar130._8_4_ = fStack_608;
        auVar130._12_4_ = fStack_604;
        _local_2000 = vdivps_avx(local_e20,auVar130);
        local_e80._0_4_ = (float)local_2000._0_4_ * 2.0;
        local_e80._4_4_ = (float)local_2000._4_4_ * 2.0;
        local_e80._8_4_ = fStack_1ff8 * 2.0;
        local_e80._12_4_ = fStack_1ff4 * 2.0;
        auVar117._8_8_ = 0x3f8000003f800000;
        auVar117._0_8_ = 0x3f8000003f800000;
        _local_20d0 = vsubps_avx(local_e80,auVar117);
        local_20c0._0_4_ = (float)local_6ac0;
        local_20c0._4_4_ = (float)((ulong)local_6ac0 >> 0x20);
        uStack_20b8._0_4_ = (float)in_stack_ffffffffffff9128;
        uStack_20b8._4_4_ = (float)((ulong)in_stack_ffffffffffff9128 >> 0x20);
        local_6d70 = CONCAT44(local_20c0._4_4_ * (float)local_20d0._4_4_,
                              (float)local_20c0 * (float)local_20d0._0_4_);
        uStack_6d68 = CONCAT44(uStack_20b8._4_4_ * fStack_20c4,(float)uStack_20b8 * fStack_20c8);
        local_6a88 = local_6ce0;
        local_6aa0 = local_6d70;
        uStack_6a98 = uStack_6d68;
        auVar32._8_8_ = uStack_6d68;
        auVar32._0_8_ = local_6d70;
        *(undefined1 (*) [16])*local_6ce0 = auVar32;
        local_6ce0 = (undefined1 (*) [32])(*local_6ce0 + 0x10);
        uStack_6ab8 = in_stack_ffffffffffff9128;
        local_20c0 = local_6ac0;
        uStack_20b8 = in_stack_ffffffffffff9128;
        local_2010 = local_2040;
        uStack_2008 = uStack_2038;
        local_1ff0 = local_2040;
        uStack_1fe8 = uStack_2038;
        local_1fe0 = local_1cc0;
        uStack_1fd8 = uStack_1cb8;
        local_1c20 = local_1d00;
        uStack_1c18 = uStack_1cf8;
        local_1ac0 = local_1ad0;
        uStack_1ab8 = uStack_1ac8;
        local_1a90 = local_1d40;
        uStack_1a88 = uStack_1d38;
        local_1950 = uVar13;
        uStack_1948 = uVar14;
        local_1940 = uVar11;
        uStack_1938 = uVar12;
        local_1920 = uVar9;
        uStack_1918 = uVar10;
        local_13c0 = local_1ce0;
        uStack_13b8 = uStack_1cd8;
        local_1370 = local_1c90;
        uStack_1368 = uStack_1c88;
        local_1330 = local_13b0._0_8_;
        uStack_1328 = local_13b0._8_8_;
        local_1240 = local_1250;
        uStack_1238 = uStack_1248;
        local_1230 = local_1c30;
        uStack_1228 = uStack_1c28;
        local_1210 = local_1c70;
        uStack_1208 = uStack_1c68;
        local_1200 = local_13a0;
        uStack_11f8 = uStack_1398;
        local_11e0 = uVar7;
        uStack_11d8 = uVar8;
        local_1190 = local_1c50;
        uStack_1188 = uStack_1c48;
        local_10f0 = local_1c50;
        uStack_10e8 = uStack_1c48;
        uStack_10cc = local_10d0;
        uStack_10c8 = local_10d0;
        uStack_10c4 = local_10d0;
        uStack_10ac = local_10b0;
        uStack_10a8 = local_10b0;
        uStack_10a4 = local_10b0;
        uStack_102c = local_1030;
        uStack_1028 = local_1030;
        uStack_1024 = local_1030;
        local_e90 = local_2030;
        uStack_e88 = uStack_2028;
        local_dd0 = local_1ce0;
        uStack_dc8 = uStack_1cd8;
        local_d40 = local_dc0._0_8_;
        uStack_d38 = local_dc0._8_8_;
        local_c50 = local_c60;
        uStack_c48 = uStack_c58;
        local_c40 = local_1c30;
        uStack_c38 = uStack_1c28;
        local_c20 = local_1c70;
        uStack_c18 = uStack_1c68;
        local_c10 = local_db0;
        uStack_c08 = uStack_da8;
        local_c00 = local_11f0;
        uStack_bf8 = uStack_11e8;
        local_bf0 = uVar15;
        uStack_be8 = uVar16;
        local_ba0 = local_1c50;
        uStack_b98 = uStack_1c48;
        local_b80 = local_1170;
        uStack_b78 = uStack_1168;
        local_b60 = local_1150;
        uStack_b58 = uStack_1148;
        local_b40 = local_1130;
        uStack_b38 = uStack_1128;
        local_b20 = local_1110;
        uStack_b18 = uStack_1108;
        local_b00 = local_1c50;
        uStack_af8 = uStack_1c48;
        uStack_adc = local_ae0;
        uStack_ad8 = local_ae0;
        uStack_ad4 = local_ae0;
        local_600 = local_e20;
        local_5c0 = in_stack_ffffffffffff9130;
        local_5b0 = in_stack_ffffffffffff9130;
        local_590 = in_stack_ffffffffffff9130;
        local_4f0 = local_510;
        uStack_4e8 = uStack_508;
        local_2f0 = local_1c50;
        uStack_2e8 = uStack_1c48;
        local_1b0 = local_1d0;
        uStack_1a8 = uStack_1c8;
        local_1a0 = local_6ac0;
        uStack_198 = in_stack_ffffffffffff9128;
      }
      for (; local_6d2c < local_6bc0; local_6d2c = local_6d2c + 1) {
        fVar175 = *(float *)*local_6ce0;
        dVar176 = std::exp((double)(ulong)*(uint *)*local_6ce0);
        dVar176 = std::log((double)(ulong)(uint)(SUB84(dVar176,0) + 1.0));
        dVar176 = std::tanh(dVar176);
        *(float *)*local_6ce0 = fVar175 * SUB84(dVar176,0);
        local_6ce0 = (undefined1 (*) [32])(*local_6ce0 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}